

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O3

void __thiscall
Spaghetti<TTA>::PerformLabelingMem
          (Spaghetti<TTA> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  Mat1b *pMVar7;
  pointer puVar8;
  pointer puVar9;
  pointer puVar10;
  pointer piVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  undefined4 uVar16;
  uint uVar17;
  ulong uVar18;
  undefined1 (*pauVar19) [16];
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  long *plVar32;
  long lVar33;
  long lVar34;
  long *plVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  int iVar43;
  long lVar44;
  long lVar45;
  ulong uVar46;
  long lVar47;
  long lVar48;
  ulong uVar49;
  long lVar50;
  int iVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  ulong uVar56;
  long lVar57;
  long lVar58;
  double dVar59;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  int local_3d8;
  long local_3c0;
  long local_3b8;
  long *local_3b0;
  ulong local_3a0;
  long local_398;
  long local_390;
  long *local_380;
  long local_378;
  long local_370;
  long *local_368;
  long local_360;
  long local_358;
  long *local_350;
  long local_348;
  long local_340;
  long local_338;
  long local_330;
  long local_328;
  long local_320;
  long local_318;
  long local_310;
  long local_308;
  long *local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  undefined1 local_2d0 [104];
  Mat local_268 [16];
  long local_258;
  long *local_220;
  long local_208;
  ulong local_200;
  undefined1 local_1f8 [104];
  Mat local_190 [16];
  long local_180;
  long *local_148;
  long local_130;
  int local_124;
  Spaghetti<TTA> *local_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_118;
  Size local_110;
  undefined4 local_108;
  Mat *local_100;
  undefined8 local_f8;
  Mat_<int> local_f0;
  Mat local_90 [96];
  
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar5 = *(int *)&pMVar7->field_0x8;
  uVar23 = (ulong)iVar5;
  iVar6 = *(int *)&pMVar7->field_0xc;
  lVar52 = (long)iVar6;
  local_118 = accesses;
  TTA::MemAlloc(((iVar6 - (iVar6 + 1 >> 0x1f)) + 1 >> 1) * ((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1)
                + 1);
  *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  TTA::length_ = 1;
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_1f8,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_110.height = (int)uVar2;
  local_110.width = (int)((ulong)uVar2 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_2d0,&local_110,0);
  uVar46 = lVar52 - 2;
  iVar43 = (int)uVar46;
  local_120 = this;
  if (iVar5 == 1) {
    if (2 < iVar6) {
      iVar31 = -2;
      iVar14 = 0;
LAB_00178390:
      lVar44 = (long)iVar14;
      piVar1 = (int *)(local_180 + lVar44 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(local_1f8._24_8_ + lVar44) == '\0') goto LAB_001783e7;
      piVar1 = (int *)(local_180 + 0xc + (long)iVar31 * 4);
      *piVar1 = *piVar1 + 1;
      cVar3 = *(char *)(local_1f8._24_8_ + 3 + (long)iVar31);
      uVar13 = TTA::MemNewLabel();
      piVar1 = (int *)(local_258 + lVar44 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_2d0._24_8_ + lVar44 * 4) = uVar13;
      iVar31 = iVar14;
      if (cVar3 != '\0') {
        do {
          iVar14 = iVar31 + 2;
          if (iVar43 <= iVar14) {
LAB_001789f0:
            lVar44 = (long)iVar14;
            piVar1 = (int *)(local_180 + lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            if (iVar43 < iVar14) {
              if (*(char *)(local_1f8._24_8_ + lVar44) == '\0') {
                piVar1 = (int *)(local_258 + lVar44 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2d0._24_8_ + lVar44 * 4) = 0;
                goto LAB_00186fec;
              }
            }
            else {
              if (*(char *)(local_1f8._24_8_ + lVar44) == '\0') goto LAB_00178bb8;
              piVar1 = (int *)(local_180 + 0xc + (long)iVar31 * 4);
              *piVar1 = *piVar1 + 1;
            }
            piVar1 = (int *)(local_258 + (long)iVar31 * 4);
            *piVar1 = *piVar1 + 1;
            uVar16 = *(undefined4 *)(local_2d0._24_8_ + (long)iVar31 * 4);
            piVar1 = (int *)(local_258 + lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2d0._24_8_ + lVar44 * 4) = uVar16;
            goto LAB_00186fec;
          }
          lVar42 = (long)iVar31;
          lVar38 = lVar42 << 0x20;
          lVar44 = local_180 + lVar42 * 4;
          lVar53 = local_258 + lVar42 * 4;
          lVar30 = local_2d0._24_8_ + lVar42 * 4;
          lVar41 = 0;
          while( true ) {
            piVar1 = (int *)(lVar44 + 8 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            iVar14 = (int)(lVar42 + 2);
            if (*(char *)(local_1f8._24_8_ + lVar42 + 2 + lVar41) == '\0') break;
            piVar1 = (int *)(lVar44 + 0xc + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(local_1f8._24_8_ + lVar42 + 3 + lVar41) == '\0') {
              piVar1 = (int *)(local_258 + (lVar38 >> 0x1e));
              *piVar1 = *piVar1 + 1;
              uVar16 = *(undefined4 *)(local_2d0._24_8_ + (lVar38 >> 0x1e));
              piVar1 = (int *)(local_258 + lVar42 * 4 + 8 + lVar41 * 4);
              *piVar1 = *piVar1 + 1;
              iVar31 = iVar14 + (int)lVar41;
              *(undefined4 *)(local_2d0._24_8_ + lVar42 * 4 + 8 + lVar41 * 4) = uVar16;
              goto LAB_00178523;
            }
            piVar1 = (int *)(lVar53 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            uVar16 = *(undefined4 *)(lVar30 + lVar41 * 4);
            piVar1 = (int *)(lVar53 + 8 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar30 + 8 + lVar41 * 4) = uVar16;
            lVar38 = lVar38 + 0x200000000;
            lVar58 = lVar42 + 2 + lVar41;
            lVar41 = lVar41 + 2;
            if ((long)(uVar46 & 0xffffffff) <= lVar58 + 2) {
              iVar14 = iVar31 + (int)lVar41 + 2;
              iVar31 = iVar31 + (int)lVar41;
              goto LAB_001789f0;
            }
          }
          iVar14 = iVar14 + (int)lVar41;
LAB_001783e7:
          iVar31 = iVar14;
          lVar44 = (long)iVar31;
          piVar1 = (int *)(local_180 + 4 + lVar44 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_1f8._24_8_ + 1 + lVar44) == '\0') goto LAB_001784c9;
          uVar13 = TTA::MemNewLabel();
          piVar1 = (int *)(local_258 + lVar44 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2d0._24_8_ + lVar44 * 4) = uVar13;
        } while( true );
      }
      goto LAB_00178523;
    }
    iVar14 = 0;
    lVar44 = 1;
    goto LAB_00178989;
  }
  uVar13 = 0;
  if (2 < iVar6) {
    uVar21 = 0;
    lVar44 = local_180;
    lVar53 = local_1f8._24_8_;
    plVar32 = local_148;
    do {
      lVar30 = (long)(int)uVar21;
      piVar1 = (int *)(lVar44 + lVar30 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar53 + lVar30) != '\0') goto LAB_00178714;
      lVar41 = *plVar32;
      piVar1 = (int *)(lVar44 + lVar41 + lVar30 * 4);
      *piVar1 = *piVar1 + 1;
      lVar42 = *(long *)local_1f8._80_8_;
      if (*(char *)(lVar30 + lVar53 + lVar42) != '\0') goto LAB_00178714;
LAB_0017859c:
      lVar30 = (long)(int)uVar21;
      piVar1 = (int *)(lVar44 + 4 + lVar30 * 4);
      *piVar1 = *piVar1 + 1;
      if ((*(char *)(lVar53 + 1 + lVar30) != '\0') ||
         (piVar1 = (int *)(lVar41 + lVar44 + 4 + lVar30 * 4), *piVar1 = *piVar1 + 1,
         *(char *)(lVar30 + 1 + lVar42 + lVar53) != '\0')) {
        uVar13 = TTA::MemNewLabel();
        piVar1 = (int *)(local_258 + lVar30 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2d0._24_8_ + lVar30 * 4) = uVar13;
        lVar30 = local_2d0._24_8_;
        lVar38 = local_258;
LAB_0017860f:
        do {
          lVar58 = (long)(int)uVar21;
          uVar13 = (int)uVar21 + 2;
          uVar21 = (ulong)uVar13;
          if (iVar43 <= (int)uVar13) {
            piVar1 = (int *)(local_180 + 8 + lVar58 * 4);
            *piVar1 = *piVar1 + 1;
            cVar3 = *(char *)(local_1f8._24_8_ + 2 + lVar58);
            if (iVar43 < (int)uVar13) {
              if (cVar3 == '\0') {
                piVar1 = (int *)(local_180 + *local_148 + 8 + lVar58 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar58 + 2 + local_1f8._24_8_ + *(long *)local_1f8._80_8_) == '\0') {
                  piVar1 = (int *)(lVar38 + 8 + lVar58 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar30 + 8 + lVar58 * 4) = 0;
                }
                else {
                  piVar1 = (int *)(lVar38 + lVar58 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = *(undefined4 *)(lVar30 + lVar58 * 4);
                  piVar1 = (int *)(lVar38 + 8 + lVar58 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar30 + 8 + lVar58 * 4) = uVar16;
                }
              }
              else {
                piVar1 = (int *)(lVar38 + lVar58 * 4);
                *piVar1 = *piVar1 + 1;
                uVar16 = *(undefined4 *)(lVar30 + lVar58 * 4);
                piVar1 = (int *)(lVar38 + 8 + lVar58 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar30 + 8 + lVar58 * 4) = uVar16;
              }
            }
            else {
              if (cVar3 == '\0') {
                lVar44 = *local_148;
                piVar1 = (int *)(local_180 + lVar44 + 8 + lVar58 * 4);
                *piVar1 = *piVar1 + 1;
                lVar53 = *(long *)local_1f8._80_8_;
                if (*(char *)(lVar58 + 2 + local_1f8._24_8_ + lVar53) == '\0') goto LAB_00178ccb;
              }
LAB_00178cb2:
              lVar44 = (long)(int)uVar13;
              piVar1 = (int *)(local_180 + 4 + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              piVar1 = (int *)(lVar38 + -8 + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              uVar16 = *(undefined4 *)(lVar30 + -8 + lVar44 * 4);
              piVar1 = (int *)(lVar38 + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar30 + lVar44 * 4) = uVar16;
            }
            goto LAB_00178d02;
          }
          piVar1 = (int *)(local_180 + 8 + lVar58 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_1f8._24_8_ + 2 + lVar58) == '\0') {
            lVar41 = *local_148;
            piVar1 = (int *)(local_180 + lVar41 + 8 + lVar58 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = *(long *)local_1f8._80_8_;
            lVar44 = local_180;
            lVar53 = local_1f8._24_8_;
            plVar32 = local_148;
            if (*(char *)(lVar58 + 2 + local_1f8._24_8_ + lVar42) == '\0') goto LAB_0017859c;
          }
LAB_0017866b:
          lVar53 = (long)(int)uVar21;
          piVar1 = (int *)(local_180 + 4 + lVar53 * 4);
          *piVar1 = *piVar1 + 1;
          lVar44 = (long)((int)uVar21 + -2);
          if (*(char *)(local_1f8._24_8_ + 1 + lVar53) == '\0') {
            piVar1 = (int *)(lVar38 + lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            uVar16 = *(undefined4 *)(lVar30 + lVar44 * 4);
            piVar1 = (int *)(lVar38 + lVar53 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar30 + lVar53 * 4) = uVar16;
            do {
              iVar14 = (int)uVar21;
              uVar13 = iVar14 + 2;
              if (iVar43 <= (int)uVar13) {
LAB_00178a72:
                lVar41 = (long)(int)uVar13;
                piVar1 = (int *)(local_180 + lVar41 * 4);
                *piVar1 = *piVar1 + 1;
                if (iVar43 < (int)uVar13) {
                  if (*(char *)(local_1f8._24_8_ + lVar41) == '\0') {
                    lVar44 = *local_148;
                    piVar1 = (int *)(local_180 + lVar44 + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar53 = *(long *)local_1f8._80_8_;
                    if (*(char *)(lVar41 + local_1f8._24_8_ + lVar53) == '\0') {
                      piVar1 = (int *)(lVar38 + lVar41 * 4);
                      *piVar1 = *piVar1 + 1;
                      *(undefined4 *)(lVar30 + lVar41 * 4) = 0;
                      goto LAB_00178d02;
                    }
                  }
                  else {
                    lVar44 = *local_148;
                    lVar53 = *(long *)local_1f8._80_8_;
                  }
                }
                else {
                  if (*(char *)(local_1f8._24_8_ + lVar41) != '\0') {
                    piVar1 = (int *)(*local_148 + local_180 + 4 + (long)iVar14 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)((long)iVar14 + 1 + local_1f8._24_8_ + *(long *)local_1f8._80_8_)
                        != '\0') goto LAB_00178cb2;
                    goto LAB_00178b35;
                  }
                  lVar44 = *local_148;
                  piVar1 = (int *)(local_180 + lVar44 + lVar41 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar53 = *(long *)local_1f8._80_8_;
                  if (*(char *)(lVar41 + local_1f8._24_8_ + lVar53) == '\0') goto LAB_00178ccb;
                  piVar1 = (int *)(local_180 + 0xc + (long)iVar14 * 4);
                  *piVar1 = *piVar1 + 1;
                }
                lVar42 = (long)iVar14;
                piVar1 = (int *)(local_180 + lVar44 + 4 + lVar42 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar42 + 1 + local_1f8._24_8_ + lVar53) == '\0') goto LAB_00178cdd;
                piVar1 = (int *)(lVar38 + lVar42 * 4);
                *piVar1 = *piVar1 + 1;
                uVar16 = *(undefined4 *)(lVar30 + lVar42 * 4);
                piVar1 = (int *)(lVar38 + lVar41 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar30 + lVar41 * 4) = uVar16;
                goto LAB_00178d02;
              }
              lVar44 = (long)iVar14;
              uVar21 = lVar44 + 2;
              piVar1 = (int *)(local_180 + 8 + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(local_1f8._24_8_ + 2 + lVar44) == '\0') {
                lVar53 = lVar44 * 4;
                lVar26 = lVar44 << 0x20;
                lVar58 = 0;
                do {
                  lVar41 = *local_148;
                  lVar39 = local_180 + lVar41 + lVar53;
                  piVar1 = (int *)(lVar39 + 8 + lVar58 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar42 = *(long *)local_1f8._80_8_;
                  lVar28 = local_1f8._24_8_ + lVar42 + lVar44;
                  iVar31 = (int)lVar58;
                  if (*(char *)(lVar58 + 2 + lVar28) == '\0') {
                    uVar21 = (ulong)(uint)((int)uVar21 + iVar31);
                    lVar44 = local_180;
                    lVar53 = local_1f8._24_8_;
                    plVar32 = local_148;
                    goto LAB_0017859c;
                  }
                  piVar1 = (int *)(local_180 + lVar53 + 0xc + lVar58 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar58 + 3 + local_1f8._24_8_ + lVar44) != '\0') {
                    piVar1 = (int *)(local_180 + lVar41 + (lVar26 + 0x100000000 >> 0x1e));
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(local_1f8._24_8_ + lVar42 + (lVar26 + 0x100000000 >> 0x20)) ==
                        '\0') {
                      uVar13 = TTA::MemNewLabel();
                      piVar1 = (int *)(local_258 + lVar44 * 4 + 8 + lVar58 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar44 = local_2d0._24_8_ + lVar44 * 4;
                      lVar30 = local_2d0._24_8_;
                      lVar38 = local_258;
                    }
                    else {
                      piVar1 = (int *)(lVar38 + (lVar26 >> 0x1e));
                      *piVar1 = *piVar1 + 1;
                      uVar13 = *(uint *)(lVar30 + (lVar26 >> 0x1e));
                      piVar1 = (int *)(lVar38 + lVar44 * 4 + 8 + lVar58 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar44 = lVar30 + lVar44 * 4;
                    }
                    *(uint *)(lVar44 + 8 + lVar58 * 4) = uVar13;
                    uVar21 = uVar21 + lVar58 & 0xffffffff;
                    goto LAB_0017860f;
                  }
                  piVar1 = (int *)(lVar39 + 4 + lVar58 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar58 + 1 + lVar28) == '\0') {
                    uVar13 = TTA::MemNewLabel();
                    piVar1 = (int *)(local_258 + lVar53 + 8 + lVar58 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar30 = local_2d0._24_8_;
                    lVar38 = local_258;
                  }
                  else {
                    piVar1 = (int *)(lVar38 + lVar53 + lVar58 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar13 = *(uint *)(lVar30 + lVar53 + lVar58 * 4);
                    piVar1 = (int *)(lVar38 + lVar53 + 8 + lVar58 * 4);
                    *piVar1 = *piVar1 + 1;
                  }
                  *(uint *)(lVar30 + lVar53 + 8 + lVar58 * 4) = uVar13;
                  if ((long)(uVar46 & 0xffffffff) <= lVar58 + lVar44 + 4) {
                    uVar13 = iVar14 + iVar31 + 4;
                    iVar14 = iVar14 + iVar31 + 2;
                    goto LAB_00178a72;
                  }
                  piVar1 = (int *)(local_180 + lVar53 + 0x10 + lVar58 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar41 = lVar58 + 2;
                  lVar26 = lVar26 + 0x200000000;
                  lVar42 = lVar58 + 4;
                  lVar58 = lVar41;
                } while (*(char *)(lVar42 + local_1f8._24_8_ + lVar44) == '\0');
                uVar21 = lVar41 + lVar44 + 2;
                lVar44 = lVar44 + lVar41;
              }
              lVar41 = (lVar44 << 0x20) + 0x100000000;
              piVar1 = (int *)((lVar41 >> 0x1e) + *local_148 + local_180);
              *piVar1 = *piVar1 + 1;
              uVar21 = uVar21 & 0xffffffff;
              lVar44 = local_180;
              lVar53 = local_1f8._24_8_;
              if (*(char *)((lVar41 >> 0x20) + *(long *)local_1f8._80_8_ + local_1f8._24_8_) != '\0'
                 ) goto LAB_0017866b;
LAB_00178714:
              lVar30 = (long)(int)uVar21;
              piVar1 = (int *)(lVar44 + 4 + lVar30 * 4);
              *piVar1 = *piVar1 + 1;
              cVar3 = *(char *)(lVar53 + 1 + lVar30);
              uVar13 = TTA::MemNewLabel();
              piVar1 = (int *)(local_258 + lVar30 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2d0._24_8_ + lVar30 * 4) = uVar13;
              lVar30 = local_2d0._24_8_;
              lVar38 = local_258;
              if (cVar3 != '\0') goto LAB_0017860f;
            } while( true );
          }
          piVar1 = (int *)(lVar38 + lVar44 * 4);
          *piVar1 = *piVar1 + 1;
          uVar16 = *(undefined4 *)(lVar30 + lVar44 * 4);
          piVar1 = (int *)(lVar38 + lVar53 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar30 + lVar53 * 4) = uVar16;
        } while( true );
      }
      piVar1 = (int *)(local_258 + lVar30 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2d0._24_8_ + lVar30 * 4) = 0;
      uVar13 = (int)uVar21 + 2;
      uVar21 = (ulong)uVar13;
    } while ((int)uVar13 < iVar43);
  }
  lVar41 = (long)(int)uVar13;
  piVar1 = (int *)(local_180 + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  if (iVar43 < (int)uVar13) {
    if ((*(char *)(local_1f8._24_8_ + lVar41) == '\0') &&
       (piVar1 = (int *)(local_180 + *local_148 + lVar41 * 4), *piVar1 = *piVar1 + 1,
       *(char *)(lVar41 + local_1f8._24_8_ + *(long *)local_1f8._80_8_) == '\0')) {
      piVar1 = (int *)(local_258 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2d0._24_8_ + lVar41 * 4) = 0;
      goto LAB_00178d02;
    }
  }
  else {
    if (*(char *)(local_1f8._24_8_ + lVar41) == '\0') {
      lVar44 = *local_148;
      piVar1 = (int *)(local_180 + lVar44 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      lVar53 = *(long *)local_1f8._80_8_;
      if (*(char *)(lVar41 + local_1f8._24_8_ + lVar53) == '\0') {
LAB_00178ccb:
        lVar41 = (long)(int)uVar13;
        piVar1 = (int *)(local_180 + 4 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(local_1f8._24_8_ + 1 + lVar41) == '\0') {
          piVar1 = (int *)(local_180 + lVar44 + 4 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar41 + 1 + local_1f8._24_8_ + lVar53) == '\0') {
            piVar1 = (int *)(local_258 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2d0._24_8_ + lVar41 * 4) = 0;
          }
          else {
            uVar13 = TTA::MemNewLabel();
            piVar1 = (int *)(local_258 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2d0._24_8_ + lVar41 * 4) = uVar13;
          }
          goto LAB_00178d02;
        }
        goto LAB_00178cdd;
      }
    }
LAB_00178b35:
    lVar41 = (long)(int)uVar13;
    piVar1 = (int *)(local_180 + 4 + lVar41 * 4);
    *piVar1 = *piVar1 + 1;
  }
LAB_00178cdd:
  uVar13 = TTA::MemNewLabel();
  piVar1 = (int *)(local_258 + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  *(uint *)(local_2d0._24_8_ + lVar41 * 4) = uVar13;
LAB_00178d02:
  local_124 = iVar5 - (((uint)(uVar23 >> 0x1f) & 1) + iVar5 & 0xfffffffe);
  uVar13 = iVar5 - local_124;
  if (2 < (int)uVar13) {
    uVar21 = 2;
    lVar44 = 1;
    local_310 = 3;
    lVar53 = 0;
    do {
      local_3c0 = *local_148;
      piVar1 = (int *)(local_180 + local_3c0 * uVar21);
      *piVar1 = *piVar1 + 1;
      local_3b0 = *(long **)local_1f8._80_8_;
      cVar3 = *(char *)(local_1f8._24_8_ + (long)local_3b0 * uVar21);
      if (2 < iVar6) {
        local_380 = (long *)local_1f8._24_8_;
        uVar40 = 0;
        lVar30 = local_180;
        uVar56 = 0;
        if (cVar3 == '\0') goto LAB_0017929c;
LAB_00178e76:
        uVar40 = (ulong)(int)uVar56;
        lVar41 = local_3c0 * (uVar21 - 1) + local_180;
        piVar1 = (int *)(lVar41 + 4 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        lVar30 = (uVar21 - 1) * (long)local_3b0 + local_1f8._24_8_;
        uVar49 = uVar56;
        if (*(char *)(uVar40 + 1 + lVar30) == '\0') {
          piVar1 = (int *)(local_3c0 * uVar21 + local_180 + 4 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(uVar40 + 1 + (long)local_3b0 * uVar21 + local_1f8._24_8_) != '\0') {
            uVar49 = uVar56 & 0xffffffff;
            lVar30 = local_180;
            local_380 = (long *)local_1f8._24_8_;
            goto LAB_00179488;
          }
          uVar40 = (ulong)(int)uVar56;
          piVar1 = (int *)(lVar41 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar30 + uVar40) != '\0') {
            local_350 = local_220;
            local_370 = *local_220;
            piVar1 = (int *)(local_370 * (uVar21 - 2) + local_258 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            local_300 = (long *)local_2d0._80_8_;
            plVar32 = *(long **)local_2d0._80_8_;
            uVar15 = *(uint *)((uVar21 - 2) * (long)plVar32 + local_2d0._24_8_ + uVar40 * 4);
            piVar1 = (int *)(local_370 * uVar21 + local_258 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            local_378 = local_2d0._24_8_;
            local_338 = local_2d0._24_8_;
            local_318 = local_258;
            local_330 = local_2d0._24_8_;
            local_308 = local_258;
            local_390 = local_2d0._24_8_;
            local_3a0 = local_258;
            local_398 = local_2d0._24_8_;
            local_360 = local_258;
            local_340 = local_2d0._24_8_;
            local_2d8 = local_258;
            local_208 = local_2d0._24_8_;
            local_2e8 = local_258;
            local_348 = local_258;
            local_328 = local_258;
            lVar41 = local_2d0._24_8_;
            local_358 = local_370;
            local_320 = (long)plVar32;
            local_2f8 = local_370;
            local_2e0 = (long)plVar32;
            goto LAB_0017cadd;
          }
          uVar15 = TTA::MemNewLabel();
          local_370 = *local_220;
          piVar1 = (int *)(local_370 * uVar21 + local_258 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          plVar32 = *(long **)local_2d0._80_8_;
          *(uint *)((long)plVar32 * uVar21 + local_2d0._24_8_ + uVar40 * 4) = uVar15;
LAB_0017a2c3:
          local_340 = local_2d0._24_8_;
          local_2d8 = local_258;
          local_208 = local_2d0._24_8_;
          local_2e8 = local_258;
          local_378 = local_2d0._24_8_;
          local_348 = local_258;
          local_328 = local_258;
          lVar41 = local_2d0._24_8_;
          local_338 = local_2d0._24_8_;
          local_3a0 = local_258;
          local_398 = local_2d0._24_8_;
          local_390 = local_2d0._24_8_;
          local_360 = local_258;
          local_358 = local_370;
          local_350 = local_220;
          local_330 = local_2d0._24_8_;
          local_320 = (long)plVar32;
          local_318 = local_258;
          local_308 = local_258;
          local_300 = (long *)local_2d0._80_8_;
          local_2f8 = local_370;
          local_2e0 = (long)plVar32;
          goto LAB_0017a31c;
        }
LAB_0017fcbc:
        lVar30 = *local_220;
        piVar1 = (int *)(lVar30 * (uVar21 - 2) + local_258 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        plVar32 = *(long **)local_2d0._80_8_;
        uVar15 = *(uint *)((uVar21 - 2) * (long)plVar32 + local_2d0._24_8_ + uVar40 * 4);
        piVar1 = (int *)(lVar30 * uVar21 + local_258 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        local_340 = local_2d0._24_8_;
LAB_0017fd0e:
        *(uint *)((long)plVar32 * uVar21 + local_340 + uVar40 * 4) = uVar15;
        local_320._0_4_ = (int)uVar49;
        uVar15 = (int)local_320 + 2;
        local_380 = (long *)local_1f8._24_8_;
        if ((int)uVar15 < iVar43) {
          local_3c0 = *local_148;
          lVar58 = local_180 + local_3c0 * uVar21;
          local_3b0 = *(long **)local_1f8._80_8_;
          lVar37 = (long)(int)local_320;
          lVar54 = local_3c0 * (uVar21 - 1);
          lVar45 = (long)local_3b0 * (uVar21 - 1);
          lVar47 = lVar37 << 0x20;
          lVar26 = local_3c0 * uVar21 + lVar37 * 4;
          lVar39 = local_1f8._24_8_ + (long)local_3b0 * uVar21;
          lVar36 = (long)local_3b0 * uVar21 + lVar37;
          lVar24 = (long)local_3b0 * local_310 + lVar37;
          lVar28 = local_3c0 * local_310 + lVar37 * 4;
          lVar33 = local_3c0 * lVar44 + lVar37 * 4;
          lVar20 = (long)local_3b0 * lVar44 + lVar37;
          lVar55 = local_2d0._24_8_ + lVar37 * 4 + 8;
          lVar29 = local_258 + 8 + lVar37 * 4;
          lVar42 = uVar21 - 2;
          lVar38 = lVar37 + 2;
          lVar22 = local_180 + lVar54;
          lVar25 = local_1f8._24_8_ + lVar45;
          lVar34 = local_180 + 0xc + lVar26;
          lVar50 = local_1f8._24_8_ + 3 + lVar36;
          lVar57 = local_180 + 8 + lVar33;
          lVar27 = 0;
          do {
            piVar1 = (int *)(lVar34 + -4 + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            lVar48 = lVar47 >> 0x1e;
            local_338 = local_2d0._24_8_;
            local_378 = local_2d0._24_8_;
            local_3a0 = local_258;
            lVar30 = local_180;
            local_300 = (long *)local_2d0._80_8_;
            lVar41 = local_2d0._24_8_;
            local_398 = local_2d0._24_8_;
            local_350 = local_220;
            local_208 = lVar45;
            if (*(char *)(lVar50 + -1 + lVar27) == '\0') {
              piVar1 = (int *)(lVar28 + local_180 + 8 + lVar27 * 4);
              *piVar1 = *piVar1 + 1;
              uVar40 = lVar38 + lVar27;
              if (*(char *)(lVar27 + 2 + lVar24 + local_1f8._24_8_) != '\0') {
                lVar42 = local_3c0 * (uVar21 | 1) + local_180;
                lVar38 = (uVar21 | 1) * (long)local_3b0 + local_1f8._24_8_;
                lVar26 = lVar47 + 0x300000000 >> 0x20;
                piVar1 = (int *)(lVar58 + (lVar47 + 0x300000000 >> 0x1e));
                *piVar1 = *piVar1 + 1;
                lVar28 = lVar47 + 0x100000000 >> 0x20;
                if (*(char *)(lVar39 + lVar26) == '\0') {
                  piVar1 = (int *)(lVar42 + lVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  if ((*(char *)(lVar38 + lVar28) == '\0') &&
                     (piVar1 = (int *)(lVar58 + lVar28 * 4), *piVar1 = *piVar1 + 1,
                     *(char *)(lVar39 + lVar28) == '\0')) {
                    uVar15 = TTA::MemNewLabel();
                    local_2f8 = *local_220;
                    piVar1 = (int *)(local_2f8 * uVar21 + local_258 + lVar37 * 4 + 8 + lVar27 * 4);
                    *piVar1 = *piVar1 + 1;
                    plVar32 = *(long **)local_2d0._80_8_;
                    *(uint *)((long)plVar32 * uVar21 + local_2d0._24_8_ + lVar37 * 4 + 8 +
                             lVar27 * 4) = uVar15;
                  }
                  else {
                    local_2f8 = *local_220;
                    lVar30 = local_2f8 * uVar21 + local_258;
                    piVar1 = (int *)(lVar48 + lVar30);
                    *piVar1 = *piVar1 + 1;
                    plVar32 = *(long **)local_2d0._80_8_;
                    lVar41 = (long)plVar32 * uVar21 + local_2d0._24_8_;
                    uVar16 = *(undefined4 *)(lVar48 + lVar41);
                    piVar1 = (int *)(lVar30 + lVar37 * 4 + 8 + lVar27 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar41 + lVar37 * 4 + 8 + lVar27 * 4) = uVar16;
                  }
                  local_348 = local_258;
                  local_328 = local_258;
                  local_320 = (long)plVar32;
                  lVar41 = local_2d0._24_8_;
                  local_338 = local_2d0._24_8_;
                  local_3a0 = local_258;
                  local_398 = local_2d0._24_8_;
                  local_390 = local_2d0._24_8_;
                  local_378 = local_2d0._24_8_;
                  local_370 = local_2f8;
                  local_360 = local_258;
                  local_358 = local_2f8;
                  local_350 = local_220;
                  local_340 = local_2d0._24_8_;
                  local_330 = local_2d0._24_8_;
                  local_318 = local_258;
                  local_308 = local_258;
                  local_300 = (long *)local_2d0._80_8_;
                  local_2e8 = local_258;
                  local_2e0 = (long)plVar32;
                  local_2d8 = local_258;
                  local_208 = local_2d0._24_8_;
                  goto LAB_0017a9e7;
                }
                piVar1 = (int *)(lVar58 + lVar28 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar39 + lVar28) != '\0') goto LAB_001808f0;
                piVar1 = (int *)(lVar42 + lVar28 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar38 + lVar28) == '\0') goto LAB_0017940d;
                piVar1 = (int *)(lVar22 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar26 + lVar25) != '\0') goto LAB_00180c18;
                piVar1 = (int *)(lVar22 + (lVar47 + 0x400000000 >> 0x1e));
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar25 + (lVar47 + 0x400000000 >> 0x20)) != '\0') goto LAB_00180111;
                piVar1 = (int *)(local_180 + lVar33 + 8 + lVar27 * 4);
                *piVar1 = *piVar1 + 1;
                local_358 = *local_220;
                local_348 = local_258;
                if (*(char *)(lVar27 + 2 + local_1f8._24_8_ + lVar20) == '\0') {
                  lVar30 = local_358 * uVar21 + local_258;
                  piVar1 = (int *)(lVar48 + lVar30);
                  *piVar1 = *piVar1 + 1;
                  local_320 = *(long *)local_2d0._80_8_;
                  lVar42 = local_320 * uVar21 + local_2d0._24_8_;
                  uVar16 = *(undefined4 *)(lVar48 + lVar42);
                  piVar1 = (int *)(lVar30 + lVar37 * 4 + 8 + lVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar42 + lVar37 * 4 + 8 + lVar27 * 4) = uVar16;
                  uVar49 = uVar40;
                  local_390 = local_2d0._24_8_;
                  local_360 = local_258;
                  local_340 = local_2d0._24_8_;
                  local_330 = local_2d0._24_8_;
                  local_318 = local_258;
                  local_308 = local_258;
                  local_2f8 = local_358;
                  local_2e8 = local_258;
                  local_2e0 = local_320;
                  local_2d8 = local_258;
                  goto LAB_0017d0c9;
                }
                piVar1 = (int *)(local_358 * lVar53 + local_258 + lVar37 * 4 + 8 + lVar27 * 4);
                *piVar1 = *piVar1 + 1;
                plVar32 = *(long **)local_2d0._80_8_;
                uVar15 = *(uint *)((long)plVar32 * lVar53 + local_2d0._24_8_ + lVar37 * 4 + 8 +
                                  lVar27 * 4);
                piVar1 = (int *)(local_358 * uVar21 + local_258 + lVar37 * 4 + 8 + lVar27 * 4);
                *piVar1 = *piVar1 + 1;
                local_318 = local_258;
                local_330 = local_2d0._24_8_;
                local_308 = local_258;
                local_390 = local_2d0._24_8_;
                local_360 = local_258;
                local_340 = local_2d0._24_8_;
                local_2d8 = local_258;
                uVar49 = uVar40 & 0xffffffff;
                uVar56 = uVar40;
                goto LAB_0017b471;
              }
LAB_0018170e:
              uVar40 = uVar40 & 0xffffffff;
              lVar30 = local_180;
              local_380 = (long *)local_1f8._24_8_;
              goto LAB_001793e5;
            }
            piVar1 = (int *)(lVar34 + -8 + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            iVar14 = (int)lVar38;
            if ((*(char *)(lVar50 + -2 + lVar27) != '\0') ||
               (piVar1 = (int *)(local_180 + lVar28 + 4 + lVar27 * 4), *piVar1 = *piVar1 + 1,
               *(char *)(local_1f8._24_8_ + lVar24 + 1 + lVar27) != '\0')) {
              uVar49 = (ulong)(uint)(iVar14 + (int)lVar27);
              goto LAB_0017fc70;
            }
            piVar1 = (int *)(lVar57 + 4 + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(local_1f8._24_8_ + lVar20 + 3 + lVar27) == '\0') {
              piVar1 = (int *)(lVar26 + local_180 + 0xc + lVar27 * 4);
              *piVar1 = *piVar1 + 1;
              uVar56 = lVar38 + lVar27;
              local_360 = local_3a0;
              local_330 = local_398;
              local_318 = local_3a0;
              local_308 = local_3a0;
              local_2e8 = local_3a0;
              local_2d8 = local_3a0;
              if (*(char *)(lVar27 + 3 + lVar36 + local_1f8._24_8_) == '\0') {
                piVar1 = (int *)(local_180 + lVar33 + 8 + lVar27 * 4);
                *piVar1 = *piVar1 + 1;
                local_370 = *local_220;
                local_348 = local_258;
                local_358 = local_370;
                local_2f8 = local_370;
                if (*(char *)(lVar27 + 2 + local_1f8._24_8_ + lVar20) == '\0') {
                  piVar1 = (int *)(local_370 * lVar42 + local_258 + lVar48);
                  *piVar1 = *piVar1 + 1;
                  plVar32 = *(long **)local_2d0._80_8_;
                  uVar16 = *(undefined4 *)(lVar48 + lVar42 * (long)plVar32 + local_2d0._24_8_);
                  piVar1 = (int *)(local_370 * uVar21 + local_258 + lVar37 * 4 + 8 + lVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)
                   ((long)plVar32 * uVar21 + local_2d0._24_8_ + lVar37 * 4 + 8 + lVar27 * 4) =
                       uVar16;
                  uVar56 = uVar56 & 0xffffffff;
                  local_328 = local_258;
                  local_390 = local_398;
                  local_378 = local_398;
                  local_348 = local_3a0;
                  local_340 = local_398;
                  local_320 = (long)plVar32;
                  local_2e0 = (long)plVar32;
                  local_208 = local_398;
                  goto LAB_0017a31c;
                }
                piVar1 = (int *)(local_370 * lVar53 + local_258 + lVar37 * 4 + 8 + lVar27 * 4);
                *piVar1 = *piVar1 + 1;
                plVar32 = *(long **)local_2d0._80_8_;
                uVar15 = *(uint *)((long)plVar32 * lVar53 + local_2d0._24_8_ + lVar37 * 4 + 8 +
                                  lVar27 * 4);
                piVar1 = (int *)(local_370 * uVar21 + local_258 + lVar37 * 4 + 8 + lVar27 * 4);
                *piVar1 = *piVar1 + 1;
                local_318 = local_258;
                local_330 = local_2d0._24_8_;
                local_308 = local_258;
                local_390 = local_2d0._24_8_;
                local_360 = local_258;
                local_340 = local_2d0._24_8_;
                local_2d8 = local_258;
                local_208 = local_2d0._24_8_;
                local_2e8 = local_258;
                local_328 = local_258;
                uVar40 = uVar56;
                local_320 = (long)plVar32;
                local_2e0 = (long)plVar32;
                goto LAB_0017cadd;
              }
              piVar1 = (int *)(lVar22 + (lVar47 + 0x400000000 >> 0x1e));
              *piVar1 = *piVar1 + 1;
              cVar3 = *(char *)(lVar25 + (lVar47 + 0x400000000 >> 0x20));
              piVar1 = (int *)(lVar33 + local_180 + 8 + lVar27 * 4);
              *piVar1 = *piVar1 + 1;
              cVar4 = *(char *)(lVar27 + 2 + lVar20 + local_1f8._24_8_);
              if (cVar3 == '\0') {
                local_358 = *local_220;
                local_348 = local_3a0;
                if (cVar4 == '\0') {
                  piVar1 = (int *)(local_358 * lVar42 + local_258 + lVar48);
                  *piVar1 = *piVar1 + 1;
                  local_320 = *(long *)local_2d0._80_8_;
                  uVar16 = *(undefined4 *)(lVar48 + lVar42 * local_320 + local_2d0._24_8_);
                  piVar1 = (int *)(local_358 * uVar21 + local_258 + lVar37 * 4 + 8 + lVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)
                   (local_320 * uVar21 + local_2d0._24_8_ + lVar37 * 4 + 8 + lVar27 * 4) = uVar16;
                  uVar49 = uVar56 & 0xffffffff;
                  local_390 = local_398;
                  local_378 = local_398;
                  local_340 = local_398;
                  local_338 = local_398;
                  local_2f8 = local_358;
                  local_2e0 = local_320;
                  goto LAB_0017d0c9;
                }
                piVar1 = (int *)(local_358 * lVar53 + local_258 + lVar37 * 4 + 8 + lVar27 * 4);
                *piVar1 = *piVar1 + 1;
                plVar32 = *(long **)local_2d0._80_8_;
                uVar15 = *(uint *)((long)plVar32 * lVar53 + local_2d0._24_8_ + lVar37 * 4 + 8 +
                                  lVar27 * 4);
                piVar1 = (int *)(local_358 * uVar21 + local_258 + lVar37 * 4 + 8 + lVar27 * 4);
                *piVar1 = *piVar1 + 1;
                local_330 = local_2d0._24_8_;
                local_308 = local_258;
                local_390 = local_2d0._24_8_;
                local_360 = local_258;
                local_340 = local_2d0._24_8_;
                local_2d8 = local_258;
                uVar49 = uVar56 & 0xffffffff;
                goto LAB_0017b471;
              }
              uVar49 = uVar56;
              if (cVar4 == '\0') {
                lVar42 = lVar47 + 0x300000000 >> 0x20;
                uVar49 = uVar56 & 0xffffffff;
                goto LAB_00181e7e;
              }
LAB_001809d8:
              uVar49 = uVar49 & 0xffffffff;
              lVar30 = local_180;
              local_380 = (long *)local_1f8._24_8_;
LAB_001794d1:
              lVar41 = uVar21 - 2;
              uVar56 = (ulong)(int)uVar49;
              piVar1 = (int *)(local_3c0 * lVar41 + lVar30 + 4 + uVar56 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(uVar56 + 1 + (long)local_3b0 * lVar41 + (long)local_380) == '\0') {
                lVar42 = *local_220 * lVar41 + local_258;
                uVar56 = (ulong)(int)uVar49;
                piVar1 = (int *)(lVar42 + uVar56 * 4);
                *piVar1 = *piVar1 + 1;
                lVar30 = lVar41 * *(long *)local_2d0._80_8_ + local_2d0._24_8_;
                uVar15 = *(uint *)(lVar30 + uVar56 * 4);
                piVar1 = (int *)(lVar42 + 8 + uVar56 * 4);
                *piVar1 = *piVar1 + 1;
                uVar17 = *(uint *)(lVar30 + 8 + uVar56 * 4);
                goto LAB_00179735;
              }
              local_358 = *local_220;
              piVar1 = (int *)(local_358 * lVar41 + local_258 + 8 + uVar56 * 4);
              *piVar1 = *piVar1 + 1;
              plVar32 = *(long **)local_2d0._80_8_;
              uVar15 = *(uint *)(lVar41 * (long)plVar32 + local_2d0._24_8_ + 8 + uVar56 * 4);
LAB_00179551:
              piVar1 = (int *)(local_358 * uVar21 + local_258 + uVar56 * 4);
              *piVar1 = *piVar1 + 1;
              local_320 = (long)plVar32;
              local_300 = (long *)local_2d0._80_8_;
              lVar30 = local_258;
              lVar41 = local_2d0._24_8_;
              local_3a0 = local_258;
              local_398 = local_2d0._24_8_;
              local_390 = local_2d0._24_8_;
              local_378 = local_2d0._24_8_;
              local_360 = local_258;
              local_350 = local_220;
              local_348 = local_258;
              local_340 = local_2d0._24_8_;
              local_338 = local_2d0._24_8_;
              local_330 = local_2d0._24_8_;
              local_318 = local_258;
              local_308 = local_258;
LAB_0017dcb5:
              *(uint *)((long)plVar32 * uVar21 + lVar41 + uVar56 * 4) = uVar15;
              uVar15 = (int)uVar49 + 2;
              if ((int)uVar15 < iVar43) {
                lVar41 = uVar21 - 1;
                lVar58 = (long)(int)uVar49;
                lVar38 = lVar58 << 0x20;
                lVar42 = lVar58 * 4;
                lVar26 = 0;
                plVar32 = (long *)local_320;
                local_200 = uVar49;
                while( true ) {
                  local_3c0 = *local_148;
                  lVar33 = local_3c0 * uVar21;
                  piVar1 = (int *)(local_180 + lVar33 + lVar42 + 8 + lVar26 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_3b0 = *(long **)local_1f8._80_8_;
                  lVar28 = (long)local_3b0 * uVar21;
                  iVar31 = (int)lVar26;
                  lVar39 = lVar38 >> 0x1e;
                  iVar14 = (int)(lVar58 + 2);
                  if (*(char *)(lVar26 + 2 + local_1f8._24_8_ + lVar28 + lVar58) == '\0') {
                    lVar30 = local_180 + lVar42;
                    piVar1 = (int *)(local_310 * local_3c0 + lVar30 + 8 + lVar26 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar22 = local_1f8._24_8_ + lVar58;
                    if (*(char *)(lVar26 + 2 + local_310 * (long)local_3b0 + lVar22) == '\0') {
                      piVar1 = (int *)(local_180 + lVar33 + (lVar38 + 0x300000000 >> 0x1e));
                      *piVar1 = *piVar1 + 1;
                      uVar49 = lVar58 + 2 + lVar26;
                      lVar42 = lVar38 + 0x300000000 >> 0x20;
                      lVar30 = local_180;
                      local_380 = (long *)local_1f8._24_8_;
                      if (*(char *)(local_1f8._24_8_ + lVar28 + lVar42) == '\0') goto LAB_001798b6;
                      uVar40 = lVar26 + lVar58 + 2;
                      lVar30 = local_3c0 * lVar41 + local_180;
                      piVar1 = (int *)(lVar30 + lVar42 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar41 = lVar41 * (long)local_3b0 + local_1f8._24_8_;
                      if (*(char *)(lVar42 + lVar41) != '\0') {
                        lVar41 = *local_350;
                        piVar1 = (int *)(lVar41 * lVar53 + local_308 + lVar58 * 4 + 8 + lVar26 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar30 = *local_300;
                        uVar15 = *(uint *)(lVar30 * lVar53 + local_330 + lVar58 * 4 + 8 + lVar26 * 4
                                          );
                        piVar1 = (int *)(lVar41 * uVar21 + local_308 + lVar58 * 4 + 8 + lVar26 * 4);
                        *piVar1 = *piVar1 + 1;
                        local_340 = local_330;
                        uVar49 = uVar49 & 0xffffffff;
                        goto LAB_0017d84e;
                      }
                      piVar1 = (int *)(lVar30 + (lVar38 + 0x400000000 >> 0x1e));
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar41 + (lVar38 + 0x400000000 >> 0x20)) == '\0') {
                        piVar1 = (int *)(local_308 + *local_350 * lVar53 + lVar58 * 4 + 8 +
                                        lVar26 * 4);
                        *piVar1 = *piVar1 + 1;
                        uVar15 = *(uint *)(local_330 + *local_300 * lVar53 + lVar58 * 4 + 8 +
                                          lVar26 * 4);
                        local_3a0 = local_318;
                        piVar1 = (int *)(*local_350 * uVar21 + local_318 + lVar58 * 4 + 8 +
                                        lVar26 * 4);
                        *piVar1 = *piVar1 + 1;
                        plVar32 = (long *)*local_300;
                        local_398 = local_338;
                        uVar49 = uVar49 & 0xffffffff;
                        lVar41 = local_338;
                        uVar56 = uVar40;
                        local_390 = local_398;
                        local_360 = local_3a0;
                        local_340 = local_398;
                        local_330 = local_398;
                        local_308 = local_3a0;
                        local_2d8 = local_3a0;
                        goto LAB_0017b471;
                      }
                      goto LAB_001809d8;
                    }
                    piVar1 = (int *)(lVar33 + lVar30 + 0xc + lVar26 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar26 + 3 + lVar28 + lVar22) == '\0') {
                      piVar1 = (int *)(lVar39 + local_3a0 + *local_350 * uVar21);
                      *piVar1 = *piVar1 + 1;
                      uVar16 = *(undefined4 *)(lVar39 + local_390 + *local_300 * uVar21);
                      local_370 = *local_350;
                      piVar1 = (int *)(local_370 * uVar21 + local_308 + lVar58 * 4 + 8 + lVar26 * 4)
                      ;
                      *piVar1 = *piVar1 + 1;
                      plVar32 = (long *)*local_300;
                      *(undefined4 *)
                       ((long)plVar32 * uVar21 + local_330 + lVar58 * 4 + 8 + lVar26 * 4) = uVar16;
                      local_390 = local_330;
                      local_3a0 = local_308;
                      local_398 = local_330;
                      local_360 = local_308;
                      local_340 = local_330;
                      local_2d8 = local_308;
                      uVar40 = (ulong)(uint)(iVar14 + iVar31);
                      local_328 = local_308;
                      local_320 = (long)plVar32;
                      lVar41 = local_330;
                      local_338 = local_338;
                      local_358 = local_370;
                      local_2f8 = local_370;
                      local_2e8 = local_2d8;
                      local_2e0 = (long)plVar32;
                      local_208 = local_340;
                      goto LAB_0017a9e7;
                    }
                    piVar1 = (int *)(lVar30 + lVar44 * local_3c0 + 0xc + lVar26 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar26 + 3 + lVar22 + lVar44 * (long)local_3b0) != '\0') {
                      lVar41 = *local_350;
                      piVar1 = (int *)(lVar41 * lVar53 + local_360 + lVar58 * 4 + 8 + lVar26 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar30 = *local_300;
                      uVar15 = *(uint *)(lVar30 * lVar53 + local_398 + lVar58 * 4 + 8 + lVar26 * 4);
                      piVar1 = (int *)(lVar41 * uVar21 + local_360 + lVar58 * 4 + 8 + lVar26 * 4);
                      *piVar1 = *piVar1 + 1;
                      local_340 = local_398;
                      uVar49 = (ulong)(uint)(iVar14 + iVar31);
                      uVar40 = lVar58 + lVar26 + 2;
                      goto LAB_0017d84e;
                    }
                  }
                  else {
                    piVar1 = (int *)(lVar44 * local_3c0 + local_180 + lVar42 + 0xc + lVar26 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar26 + 3 + lVar44 * (long)local_3b0 + local_1f8._24_8_ + lVar58)
                        != '\0') {
                      uVar49 = (ulong)(uint)(iVar14 + iVar31);
                      piVar1 = (int *)(lVar53 * local_358 + lVar30 + lVar58 * 4 + 8 + lVar26 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar15 = *(uint *)(lVar53 * (long)plVar32 + local_340 + lVar58 * 4 + 8 +
                                        lVar26 * 4);
                      piVar1 = (int *)(local_358 * uVar21 + lVar30 + lVar58 * 4 + 8 + lVar26 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar40 = lVar58 + lVar26 + 2;
                      goto LAB_0017fd0e;
                    }
                    piVar1 = (int *)(local_180 + lVar42 + lVar33 + 0xc + lVar26 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar26 + 3 + local_1f8._24_8_ + lVar58 + lVar28) == '\0') {
                      piVar1 = (int *)(lVar39 + lVar30 + local_358 * uVar21);
                      *piVar1 = *piVar1 + 1;
                      uVar16 = *(undefined4 *)(lVar39 + local_340 + (long)plVar32 * uVar21);
                      local_358 = *local_350;
                      piVar1 = (int *)(local_358 * uVar21 + local_360 + lVar58 * 4 + 8 + lVar26 * 4)
                      ;
                      *piVar1 = *piVar1 + 1;
                      local_320 = *local_300;
                      *(undefined4 *)(local_320 * uVar21 + local_398 + lVar58 * 4 + 8 + lVar26 * 4)
                           = uVar16;
                      local_340 = local_398;
                      local_2d8 = local_360;
                      local_2e8 = local_360;
                      uVar49 = (ulong)(uint)(iVar14 + iVar31);
                      lVar41 = local_398;
                      local_2f8 = local_358;
                      local_2e0 = local_320;
                      goto LAB_001803c9;
                    }
                  }
                  piVar1 = (int *)(local_3c0 * lVar41 + local_180 + lVar42 + 0x10 + lVar26 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar26 + 4 + (long)local_3b0 * lVar41 + local_1f8._24_8_ + lVar58)
                      == '\0') break;
                  piVar1 = (int *)(local_180 + lVar42 + local_3c0 * lVar53 + 0xc + lVar26 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar26 + 3 + local_1f8._24_8_ + lVar58 + (long)local_3b0 * lVar53)
                      == '\0') {
                    lVar30 = *local_350;
                    piVar1 = (int *)(lVar53 * lVar30 + local_3a0 + lVar42 + 0x10 + lVar26 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar39 = *local_300;
                    uVar15 = *(uint *)(lVar53 * lVar39 + local_390 + lVar42 + 0x10 + lVar26 * 4);
                    piVar1 = (int *)(lVar30 * uVar21 + local_3a0 + lVar42 + lVar26 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar39 * uVar21 + local_390 + lVar42 +
                                                           lVar26 * 4));
                    local_350 = local_220;
                    local_358 = *local_220;
                    piVar1 = (int *)(uVar21 * local_358 + local_258 + lVar42 + 8 + lVar26 * 4);
                    *piVar1 = *piVar1 + 1;
                    local_378 = local_2d0._24_8_;
                    local_338 = local_2d0._24_8_;
                    local_318 = local_258;
                    local_330 = local_2d0._24_8_;
                    local_308 = local_258;
                    local_348 = local_258;
                    local_390 = local_2d0._24_8_;
                    local_3a0 = local_258;
                    local_300 = (long *)local_2d0._80_8_;
                  }
                  else {
                    piVar1 = (int *)(local_360 + lVar42 + *local_350 * lVar53 + 0x10 + lVar26 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar15 = *(uint *)(local_398 + lVar42 + *local_300 * lVar53 + 0x10 + lVar26 * 4)
                    ;
                    local_358 = *local_350;
                    piVar1 = (int *)(uVar21 * local_358 + local_3a0 + lVar42 + 8 + lVar26 * 4);
                    *piVar1 = *piVar1 + 1;
                  }
                  plVar32 = (long *)*local_300;
                  *(uint *)(uVar21 * (long)plVar32 + local_390 + lVar42 + 8 + lVar26 * 4) = uVar15;
                  lVar38 = lVar38 + 0x200000000;
                  lVar39 = lVar26 + lVar58;
                  lVar26 = lVar26 + 2;
                  local_340 = local_390;
                  lVar30 = local_3a0;
                  local_398 = local_390;
                  local_360 = local_3a0;
                  if ((long)uVar46 <= lVar39 + 4) {
                    uVar49 = (ulong)(uint)((int)local_200 + (int)lVar26);
                    uVar15 = iVar14 + (int)lVar26;
                    goto LAB_0017e0bc;
                  }
                }
                lVar30 = local_3a0 + *local_350 * uVar21;
                piVar1 = (int *)(lVar39 + lVar30);
                *piVar1 = *piVar1 + 1;
                local_390 = local_390 + *local_300 * uVar21;
                uVar16 = *(undefined4 *)(lVar39 + local_390);
                piVar1 = (int *)(lVar58 * 4 + lVar30 + 8 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_390 + lVar58 * 4 + 8 + lVar26 * 4) = uVar16;
                local_200 = (ulong)(uint)(iVar14 + iVar31);
LAB_0017e88d:
                iVar14 = (int)local_200;
                uVar15 = iVar14 + 2;
                uVar56 = local_200;
                if ((int)uVar15 < iVar43) {
                  local_3c0 = *local_148;
                  local_3b0 = *(long **)local_1f8._80_8_;
                  lVar29 = (long)iVar14;
                  lVar28 = local_3c0 * (uVar21 - 1);
                  lVar42 = local_180 + lVar28;
                  lVar57 = (uVar21 - 1) * (long)local_3b0;
                  lVar38 = local_1f8._24_8_ + lVar57;
                  lVar50 = lVar29 << 0x20;
                  lVar58 = local_180 + local_3c0 * uVar21 + lVar29 * 4;
                  lVar20 = lVar58 + 0xc;
                  lVar26 = local_1f8._24_8_ + (long)local_3b0 * uVar21 + lVar29;
                  lVar25 = lVar26 + 3;
                  lVar33 = (long)local_3b0 * lVar44 + lVar29 + local_1f8._24_8_ + 3;
                  lVar34 = local_180 + local_3c0 * lVar44 + lVar29 * 4 + 0xc;
                  lVar39 = local_1f8._24_8_ + lVar29;
                  local_348 = local_258;
                  local_350 = local_220;
                  local_378 = local_2d0._24_8_;
                  lVar30 = lVar29 + 2;
                  lVar22 = 0;
                  do {
                    piVar1 = (int *)(lVar58 + 8 + lVar22 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar24 = lVar50 >> 0x1e;
                    iVar31 = (int)lVar22;
                    lVar45 = lVar50 >> 0x20;
                    iVar51 = (int)lVar30;
                    local_338 = local_2d0._24_8_;
                    lVar41 = local_2d0._24_8_;
                    if (*(char *)(lVar26 + 2 + lVar22) == '\0') {
                      piVar1 = (int *)(local_3c0 * local_310 + lVar29 * 4 + local_180 + 8 +
                                      lVar22 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(local_1f8._24_8_ + (long)local_3b0 * local_310 + lVar29 + 2 +
                                   lVar22) == '\0') {
                        uVar49 = (ulong)(uint)(iVar51 + iVar31);
                        local_398 = local_2d0._24_8_;
                        local_3a0 = local_258;
                        local_300 = (long *)local_2d0._80_8_;
                        local_340 = local_2d0._24_8_;
                        local_390 = local_398;
                        local_360 = local_3a0;
                        local_338 = local_398;
                        local_330 = local_398;
                        local_318 = local_3a0;
                        local_308 = local_3a0;
                        local_2d8 = local_3a0;
                        goto LAB_0017d7bb;
                      }
                      piVar1 = (int *)(lVar20 + lVar22 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar25 + lVar22) == '\0') {
                        local_370 = *local_220;
                        lVar30 = local_370 * uVar21 + local_258;
                        piVar1 = (int *)(lVar24 + lVar30);
                        *piVar1 = *piVar1 + 1;
                        local_300 = (long *)local_2d0._80_8_;
                        plVar32 = *(long **)local_2d0._80_8_;
                        lVar42 = (long)plVar32 * uVar21 + local_2d0._24_8_;
                        uVar16 = *(undefined4 *)(lVar24 + lVar42);
                        piVar1 = (int *)(lVar30 + lVar29 * 4 + 8 + lVar22 * 4);
                        *piVar1 = *piVar1 + 1;
                        *(undefined4 *)(lVar42 + lVar29 * 4 + 8 + lVar22 * 4) = uVar16;
                        local_318 = local_258;
                        local_330 = local_2d0._24_8_;
                        local_308 = local_258;
                        local_390 = local_2d0._24_8_;
                        local_3a0 = local_258;
                        local_398 = local_2d0._24_8_;
                        local_360 = local_258;
                        uVar40 = (ulong)(uint)(iVar51 + iVar31);
                        local_340 = local_2d0._24_8_;
                        local_2d8 = local_258;
                        local_208 = local_2d0._24_8_;
                        local_2e8 = local_258;
                        local_328 = local_258;
                        local_320 = (long)plVar32;
                        local_358 = local_370;
                        local_2f8 = local_370;
                        local_2e0 = (long)plVar32;
                        goto LAB_0017a9e7;
                      }
                      piVar1 = (int *)(lVar34 + lVar22 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar33 + lVar22) != '\0') {
                        piVar1 = (int *)(local_3c0 * lVar53 + lVar29 * 4 + local_180 + 8 +
                                        lVar22 * 4);
                        *piVar1 = *piVar1 + 1;
                        uVar49 = lVar30 + lVar22;
                        uVar40 = lVar29 + 2 + lVar22;
                        if (*(char *)(lVar22 + 2 + lVar39 + (long)local_3b0 * lVar53) == '\0') {
                          lVar30 = *local_220;
                          piVar1 = (int *)(lVar30 * lVar53 + local_258 + lVar29 * 4 + 8 + lVar22 * 4
                                          );
                          *piVar1 = *piVar1 + 1;
                          lVar41 = *(long *)local_2d0._80_8_;
                          uVar15 = *(uint *)(lVar41 * lVar53 + local_2d0._24_8_ + lVar29 * 4 + 8 +
                                            lVar22 * 4);
                          piVar1 = (int *)(lVar24 + lVar30 * uVar21 + local_258);
                          *piVar1 = *piVar1 + 1;
                          uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar24 + lVar41 * uVar21 +
                                                                           local_2d0._24_8_));
                          piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar29 * 4 + 8 +
                                          lVar22 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar30 = *(long *)local_2d0._80_8_;
                          local_340 = local_2d0._24_8_;
                          goto LAB_0017d84e;
                        }
                        *(int *)(lVar42 + lVar24) = *(int *)(lVar42 + lVar24) + 1;
                        if (*(char *)(lVar38 + lVar45) == '\0') {
                          lVar30 = *local_220;
                          piVar1 = (int *)(lVar30 * lVar53 + local_258 + lVar29 * 4 + 8 + lVar22 * 4
                                          );
                          *piVar1 = *piVar1 + 1;
                          lVar41 = *(long *)local_2d0._80_8_;
                          uVar15 = *(uint *)(lVar41 * lVar53 + local_2d0._24_8_ + lVar29 * 4 + 8 +
                                            lVar22 * 4);
                          piVar1 = (int *)(lVar30 * uVar21 + local_258 + lVar45 * 4);
                          *piVar1 = *piVar1 + 1;
                          uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar41 * uVar21 + local_2d0._24_8_
                                                                 + lVar45 * 4));
                          piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar29 * 4 + 8 +
                                          lVar22 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar30 = *(long *)local_2d0._80_8_;
                          local_340 = local_2d0._24_8_;
                          goto LAB_0017d84e;
                        }
                        local_3c0 = local_3c0 * (uVar21 - 2);
                        lVar30 = (long)local_3b0 * (uVar21 - 2);
                        goto LAB_0017f564;
                      }
                    }
                    else {
                      piVar1 = (int *)(lVar34 + lVar22 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar33 + lVar22) != '\0') {
                        piVar1 = (int *)(local_3c0 * lVar53 + lVar29 * 4 + local_180 + 8 +
                                        lVar22 * 4);
                        *piVar1 = *piVar1 + 1;
                        uVar49 = lVar30 + lVar22;
                        uVar40 = lVar29 + 2 + lVar22;
                        if (*(char *)(lVar22 + 2 + lVar39 + (long)local_3b0 * lVar53) == '\0') {
                          lVar30 = *local_220;
                          piVar1 = (int *)(lVar30 * lVar53 + local_258 + lVar29 * 4 + 8 + lVar22 * 4
                                          );
                          *piVar1 = *piVar1 + 1;
                          lVar41 = *(long *)local_2d0._80_8_;
                          uVar15 = *(uint *)(lVar41 * lVar53 + local_2d0._24_8_ + lVar29 * 4 + 8 +
                                            lVar22 * 4);
                          piVar1 = (int *)(lVar24 + lVar30 * uVar21 + local_258);
                          *piVar1 = *piVar1 + 1;
                          uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar24 + lVar41 * uVar21 +
                                                                           local_2d0._24_8_));
                          piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar29 * 4 + 8 +
                                          lVar22 * 4);
                          *piVar1 = *piVar1 + 1;
                          plVar32 = *(long **)local_2d0._80_8_;
                          local_340 = local_2d0._24_8_;
                        }
                        else {
                          *(int *)(lVar42 + lVar24) = *(int *)(lVar42 + lVar24) + 1;
                          if (*(char *)(lVar38 + lVar45) == '\0') {
                            lVar30 = *local_220;
                            piVar1 = (int *)(lVar30 * lVar53 + local_258 + lVar29 * 4 + 8 +
                                            lVar22 * 4);
                            *piVar1 = *piVar1 + 1;
                            lVar41 = *(long *)local_2d0._80_8_;
                            uVar15 = *(uint *)(lVar41 * lVar53 + local_2d0._24_8_ + lVar29 * 4 + 8 +
                                              lVar22 * 4);
                            piVar1 = (int *)(lVar30 * uVar21 + local_258 + lVar45 * 4);
                            *piVar1 = *piVar1 + 1;
                            uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar41 * uVar21 +
                                                                    local_2d0._24_8_ + lVar45 * 4));
                            piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar29 * 4 + 8 +
                                            lVar22 * 4);
                            *piVar1 = *piVar1 + 1;
                            plVar32 = *(long **)local_2d0._80_8_;
                            local_340 = local_2d0._24_8_;
                          }
                          else {
                            local_3c0 = local_3c0 * (uVar21 - 2);
                            lVar30 = (long)local_3b0 * (uVar21 - 2);
LAB_0017b555:
                            uVar40 = (ulong)(int)uVar49;
                            piVar1 = (int *)(local_3c0 + local_180 + -4 + uVar40 * 4);
                            *piVar1 = *piVar1 + 1;
                            cVar3 = *(char *)((uVar40 - 1) + lVar30 + local_1f8._24_8_);
                            lVar30 = *local_220;
                            piVar1 = (int *)(lVar30 * (uVar21 - 2) + local_258 + uVar40 * 4);
                            *piVar1 = *piVar1 + 1;
                            plVar32 = *(long **)local_2d0._80_8_;
                            uVar15 = *(uint *)((uVar21 - 2) * (long)plVar32 + local_2d0._24_8_ +
                                              uVar40 * 4);
                            if (cVar3 == '\0') {
                              piVar1 = (int *)(local_258 + lVar30 * uVar21 + -8 + uVar40 * 4);
                              *piVar1 = *piVar1 + 1;
                              uVar15 = TTA::MemMerge(uVar15,*(uint *)(local_2d0._24_8_ +
                                                                      (long)plVar32 * uVar21 + -8 +
                                                                     uVar40 * 4));
                              piVar1 = (int *)(*local_220 * uVar21 + local_258 + uVar40 * 4);
                              *piVar1 = *piVar1 + 1;
                              plVar32 = *(long **)local_2d0._80_8_;
                              local_340 = local_2d0._24_8_;
                            }
                            else {
                              piVar1 = (int *)(local_258 + lVar30 * uVar21 + uVar40 * 4);
                              *piVar1 = *piVar1 + 1;
                              local_340 = local_2d0._24_8_;
                            }
                          }
                        }
                        goto LAB_0017fd0e;
                      }
                      piVar1 = (int *)(lVar20 + lVar22 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar25 + lVar22) == '\0') goto LAB_0017f0ee;
                    }
                    piVar1 = (int *)(local_180 + lVar29 * 4 + lVar28 + 0x10 + lVar22 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar22 + 4 + lVar57 + lVar39) != '\0') {
                      lVar41 = local_3c0 * (uVar21 - 2);
                      piVar1 = (int *)((lVar50 + 0x300000000 >> 0x1e) + local_180 + lVar41);
                      *piVar1 = *piVar1 + 1;
                      uVar49 = lVar30 + lVar22;
                      lVar58 = (long)local_3b0 * (uVar21 - 2);
                      uVar56 = lVar29 + 2 + lVar22;
                      if (*(char *)((lVar50 + 0x300000000 >> 0x20) + local_1f8._24_8_ + lVar58) ==
                          '\0') {
                        lVar30 = *local_220;
                        piVar1 = (int *)(lVar30 * lVar53 + local_258 + lVar29 * 4 + 0x10 +
                                        lVar22 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar41 = *(long *)local_2d0._80_8_;
                        uVar15 = *(uint *)(lVar41 * lVar53 + local_2d0._24_8_ + lVar29 * 4 + 0x10 +
                                          lVar22 * 4);
                        piVar1 = (int *)(lVar24 + lVar30 * uVar21 + local_258);
                        *piVar1 = *piVar1 + 1;
                        uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar24 + lVar41 * uVar21 +
                                                                         local_2d0._24_8_));
                        local_358 = *local_220;
                        piVar1 = (int *)(local_358 * uVar21 + local_258 + lVar29 * 4 + 8 +
                                        lVar22 * 4);
                        *piVar1 = *piVar1 + 1;
                        plVar32 = *(long **)local_2d0._80_8_;
                        uVar49 = uVar49 & 0xffffffff;
                        local_320 = (long)plVar32;
                        local_300 = (long *)local_2d0._80_8_;
                        lVar30 = local_258;
                        lVar41 = local_2d0._24_8_;
                        local_3a0 = local_258;
                        local_398 = local_2d0._24_8_;
                        local_390 = local_2d0._24_8_;
                        local_378 = local_2d0._24_8_;
                        local_360 = local_258;
                        local_350 = local_220;
                        local_348 = local_258;
                        local_340 = local_2d0._24_8_;
                        local_338 = local_2d0._24_8_;
                        local_330 = local_2d0._24_8_;
                        local_318 = local_258;
                        local_308 = local_258;
                        goto LAB_0017dcb5;
                      }
                      piVar1 = (int *)(local_3c0 * lVar53 + lVar29 * 4 + local_180 + 8 + lVar22 * 4)
                      ;
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar22 + 2 + lVar39 + (long)local_3b0 * lVar53) == '\0') {
                        lVar30 = *local_220;
                        piVar1 = (int *)(lVar30 * lVar53 + local_258 + lVar29 * 4 + 0x10 +
                                        lVar22 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar41 = *(long *)local_2d0._80_8_;
                        uVar15 = *(uint *)(lVar41 * lVar53 + local_2d0._24_8_ + lVar29 * 4 + 0x10 +
                                          lVar22 * 4);
                        piVar1 = (int *)(lVar24 + lVar30 * uVar21 + local_258);
                        *piVar1 = *piVar1 + 1;
                        uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar24 + lVar41 * uVar21 +
                                                                         local_2d0._24_8_));
                        local_358 = *local_220;
                        piVar1 = (int *)(local_358 * uVar21 + local_258 + lVar29 * 4 + 8 +
                                        lVar22 * 4);
                        *piVar1 = *piVar1 + 1;
                        plVar32 = *(long **)local_2d0._80_8_;
                        local_320 = (long)plVar32;
                        local_300 = (long *)local_2d0._80_8_;
                        lVar30 = local_258;
                        lVar41 = local_2d0._24_8_;
                        local_3a0 = local_258;
                        local_398 = local_2d0._24_8_;
                        local_390 = local_2d0._24_8_;
                        local_378 = local_2d0._24_8_;
                        local_360 = local_258;
                        local_350 = local_220;
                        local_348 = local_258;
                        local_340 = local_2d0._24_8_;
                        local_338 = local_2d0._24_8_;
                        local_330 = local_2d0._24_8_;
                        local_318 = local_258;
                        local_308 = local_258;
                        goto LAB_0017dcb5;
                      }
                      *(int *)(lVar42 + lVar24) = *(int *)(lVar42 + lVar24) + 1;
                      if (*(char *)(lVar38 + lVar45) != '\0') goto LAB_0017ef18;
                      lVar30 = *local_220;
                      piVar1 = (int *)(lVar30 * lVar53 + local_258 + lVar29 * 4 + 0x10 + lVar22 * 4)
                      ;
                      *piVar1 = *piVar1 + 1;
                      lVar41 = *(long *)local_2d0._80_8_;
                      uVar15 = *(uint *)(lVar41 * lVar53 + local_2d0._24_8_ + lVar29 * 4 + 0x10 +
                                        lVar22 * 4);
                      piVar1 = (int *)(lVar30 * uVar21 + local_258 + lVar45 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar41 * uVar21 + local_2d0._24_8_ +
                                                             lVar45 * 4));
                      local_358 = *local_220;
                      piVar1 = (int *)(local_358 * uVar21 + local_258 + lVar29 * 4 + 8 + lVar22 * 4)
                      ;
                      *piVar1 = *piVar1 + 1;
                      plVar32 = *(long **)local_2d0._80_8_;
                      local_320 = (long)plVar32;
                      local_300 = (long *)local_2d0._80_8_;
                      lVar30 = local_258;
                      lVar41 = local_2d0._24_8_;
                      local_3a0 = local_258;
                      local_398 = local_2d0._24_8_;
                      local_390 = local_2d0._24_8_;
                      local_378 = local_2d0._24_8_;
                      local_360 = local_258;
                      local_350 = local_220;
                      local_348 = local_258;
                      local_340 = local_2d0._24_8_;
                      local_338 = local_2d0._24_8_;
                      local_330 = local_2d0._24_8_;
                      local_318 = local_258;
                      local_308 = local_258;
                      goto LAB_0017dcb5;
                    }
                    lVar41 = *local_220 * uVar21 + local_258 + lVar29 * 4 + 8;
                    piVar1 = (int *)(lVar41 + -8 + lVar22 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar45 = *(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + 8 + lVar29 * 4;
                    uVar16 = *(undefined4 *)(lVar45 + -8 + lVar22 * 4);
                    piVar1 = (int *)(lVar41 + lVar22 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar45 + lVar22 * 4) = uVar16;
                    lVar50 = lVar50 + 0x200000000;
                    lVar41 = lVar29 + lVar22;
                    lVar22 = lVar22 + 2;
                    if ((long)uVar46 <= lVar41 + 4) {
                      uVar15 = iVar51 + (int)lVar22;
                      uVar56 = (ulong)(uint)(iVar14 + (int)lVar22);
                      break;
                    }
                  } while( true );
                }
                uVar40 = (ulong)uVar15;
                if (iVar43 < (int)uVar15) goto LAB_0017eb12;
                local_3c0 = *local_148;
                lVar30 = local_3c0 * uVar21;
                lVar42 = (long)(int)uVar15;
                piVar1 = (int *)(local_180 + lVar30 + lVar42 * 4);
                *piVar1 = *piVar1 + 1;
                local_3b0 = *(long **)local_1f8._80_8_;
                lVar38 = (long)local_3b0 * uVar21;
                local_200._0_4_ = (int)uVar56;
                local_200 = uVar56;
                if (*(char *)(lVar42 + local_1f8._24_8_ + lVar38) == '\0') {
                  piVar1 = (int *)(local_3c0 * (uVar21 | 1) + local_180 + lVar42 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar42 + (uVar21 | 1) * (long)local_3b0 + local_1f8._24_8_) == '\0')
                  {
LAB_0017f38c:
                    local_200 = uVar56;
                    uVar15 = (uint)uVar40;
                    lVar41 = (long)(int)uVar15;
                    piVar1 = (int *)(lVar30 + local_180 + 4 + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    plVar35 = (long *)local_180;
                    local_380 = (long *)local_1f8._24_8_;
                    if (*(char *)(lVar41 + 1 + lVar38 + local_1f8._24_8_) == '\0')
                    goto LAB_0017f423;
                    piVar1 = (int *)(local_180 + local_3c0 * (uVar21 - 1) + 4 + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar41 + 1 + local_1f8._24_8_ + (long)local_3b0 * (uVar21 - 1)) ==
                        '\0') goto LAB_0017f448;
                    lVar30 = *local_220;
                    piVar1 = (int *)(lVar30 * (uVar21 - 2) + local_258 + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar42 = *(long *)local_2d0._80_8_;
                    uVar16 = *(undefined4 *)((uVar21 - 2) * lVar42 + local_2d0._24_8_ + lVar41 * 4);
                    piVar1 = (int *)(lVar30 * uVar21 + local_258 + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar42 * uVar21 + local_2d0._24_8_ + lVar41 * 4) = uVar16;
                    goto LAB_0017eda8;
                  }
                  lVar58 = (long)(int)local_200;
                  piVar1 = (int *)(local_180 + lVar30 + 0xc + lVar58 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(local_1f8._24_8_ + lVar38 + 3 + lVar58) == '\0') {
                    lVar30 = *local_220 * uVar21 + local_258;
                    piVar1 = (int *)(lVar30 + lVar58 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar41 = *(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_;
                    uVar16 = *(undefined4 *)(lVar41 + lVar58 * 4);
                    piVar1 = (int *)(lVar30 + lVar42 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar41 + lVar42 * 4) = uVar16;
                    goto LAB_0017eda8;
                  }
                  lVar58 = lVar58 + 3;
                }
                else {
                  lVar58 = (long)((int)local_200 + 3);
                }
                lVar41 = local_3c0 * (uVar21 - 1);
                piVar1 = (int *)(local_180 + lVar41 + lVar58 * 4);
                *piVar1 = *piVar1 + 1;
                lVar30 = (uVar21 - 1) * (long)local_3b0;
                if (*(char *)(lVar58 + local_1f8._24_8_ + lVar30) == '\0') {
                  lVar30 = *local_220 * uVar21 + local_258;
                  piVar1 = (int *)(lVar30 + (long)(int)local_200 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar41 = *(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_;
                  uVar16 = *(undefined4 *)(lVar41 + (long)(int)local_200 * 4);
                  piVar1 = (int *)(lVar30 + lVar42 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar41 + lVar42 * 4) = uVar16;
                  goto LAB_0017eda8;
                }
                lVar38 = uVar21 - 2;
                piVar1 = (int *)(local_3c0 * lVar38 + local_180 + lVar42 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar42 + (long)local_3b0 * lVar38 + local_1f8._24_8_) == '\0') {
                  lVar30 = *local_220;
                  piVar1 = (int *)(lVar30 * lVar38 + local_258 + lVar42 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar41 = *(long *)local_2d0._80_8_;
                  uVar15 = *(uint *)(lVar38 * lVar41 + local_2d0._24_8_ + lVar42 * 4);
                  lVar38 = (long)(int)local_200;
                  piVar1 = (int *)(lVar30 * uVar21 + local_258 + lVar38 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar41 * uVar21 + local_2d0._24_8_ +
                                                         lVar38 * 4));
                  piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar42 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + lVar42 * 4) =
                       uVar15;
                  goto LAB_0017eda8;
                }
LAB_00180f0f:
                local_200 = uVar56;
                lVar42 = (long)(int)uVar40;
                piVar1 = (int *)(lVar41 + local_180 + -8 + lVar42 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar42 + -2 + lVar30 + local_1f8._24_8_) == '\0') {
                  lVar30 = *local_220;
                  piVar1 = (int *)(lVar30 * (uVar21 - 2) + local_258 + lVar42 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar41 = *(long *)local_2d0._80_8_;
                  uVar15 = *(uint *)((uVar21 - 2) * lVar41 + local_2d0._24_8_ + lVar42 * 4);
                  piVar1 = (int *)(lVar30 * uVar21 + local_258 + -8 + lVar42 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar17 = *(uint *)(lVar41 * uVar21 + local_2d0._24_8_ + -8 + lVar42 * 4);
                  goto LAB_001811c3;
                }
LAB_00180f2c:
                lVar30 = uVar21 - 2;
                lVar42 = (long)(int)uVar40;
                piVar1 = (int *)(local_3c0 * lVar30 + local_180 + -4 + lVar42 * 4);
                *piVar1 = *piVar1 + 1;
                cVar3 = *(char *)(lVar42 + -1 + (long)local_3b0 * lVar30 + local_1f8._24_8_);
                lVar41 = *local_220;
                piVar1 = (int *)(lVar41 * lVar30 + local_258 + lVar42 * 4);
                *piVar1 = *piVar1 + 1;
                lVar38 = *(long *)local_2d0._80_8_;
                uVar15 = *(uint *)(lVar30 * lVar38 + local_2d0._24_8_ + lVar42 * 4);
                lVar30 = local_258 + lVar41 * uVar21;
                if (cVar3 == '\0') {
                  piVar1 = (int *)(lVar30 + -8 + lVar42 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar30 = local_2d0._24_8_ + lVar38 * uVar21;
                  goto LAB_001811bf;
                }
                piVar1 = (int *)(lVar30 + lVar42 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(local_2d0._24_8_ + lVar38 * uVar21 + lVar42 * 4) = uVar15;
                goto LAB_0017eda8;
              }
LAB_0017e0bc:
              iVar14 = (int)uVar49;
              if (iVar43 < (int)uVar15) {
LAB_0017eb12:
                local_3c0 = *local_148;
                uVar40 = (ulong)(int)uVar15;
                piVar1 = (int *)(local_3c0 * uVar21 + local_180 + uVar40 * 4);
                *piVar1 = *piVar1 + 1;
                local_3b0 = *(long **)local_1f8._80_8_;
                if (*(char *)(uVar40 + (long)local_3b0 * uVar21 + local_1f8._24_8_) == '\0') {
                  local_320._0_4_ = uVar15 - 2;
LAB_0017eba1:
                  piVar1 = (int *)(local_3c0 * (uVar21 | 1) + local_180 + uVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar30 = *local_220 * uVar21 + local_258;
                  if (*(char *)(uVar40 + (long)local_3b0 * (uVar21 | 1) + local_1f8._24_8_) == '\0')
                  {
                    piVar1 = (int *)(lVar30 + uVar40 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)
                     (*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + uVar40 * 4) = 0;
                  }
                  else {
                    piVar1 = (int *)(lVar30 + (long)(int)local_320 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar41 = *(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_;
                    uVar16 = *(undefined4 *)(lVar41 + (long)(int)local_320 * 4);
                    piVar1 = (int *)(lVar30 + uVar40 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar41 + uVar40 * 4) = uVar16;
                  }
                }
                else {
                  lVar30 = *local_220 * uVar21 + local_258;
                  piVar1 = (int *)(lVar30 + -8 + uVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar41 = *(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_;
                  uVar16 = *(undefined4 *)(lVar41 + -8 + uVar40 * 4);
                  piVar1 = (int *)(lVar30 + uVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar41 + uVar40 * 4) = uVar16;
                }
                goto LAB_0017eda8;
              }
              local_3c0 = *local_148;
              lVar41 = local_3c0 * uVar21 + local_180;
              lVar30 = (long)(int)uVar15;
              piVar1 = (int *)(lVar41 + lVar30 * 4);
              *piVar1 = *piVar1 + 1;
              local_3b0 = *(long **)local_1f8._80_8_;
              lVar42 = (long)local_3b0 * uVar21 + local_1f8._24_8_;
              if (*(char *)(lVar30 + lVar42) == '\0') {
                piVar1 = (int *)(local_3c0 * (uVar21 | 1) + local_180 + lVar30 * 4);
                *piVar1 = *piVar1 + 1;
                cVar3 = *(char *)(lVar30 + (uVar21 | 1) * (long)local_3b0 + local_1f8._24_8_);
                lVar38 = (long)iVar14;
                piVar1 = (int *)(lVar41 + 0xc + lVar38 * 4);
                *piVar1 = *piVar1 + 1;
                cVar4 = *(char *)(lVar42 + 3 + lVar38);
                if (cVar3 == '\0') {
                  if (cVar4 == '\0') {
                    lVar30 = (long)(int)(uVar15 + 1);
                    plVar35 = (long *)local_180;
                    local_380 = (long *)local_1f8._24_8_;
                    goto LAB_0017f426;
                  }
                  lVar41 = *local_350;
                  piVar1 = (int *)(lVar41 * (uVar21 - 2) + local_3a0 + lVar30 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar42 = *local_300;
                  uVar16 = *(undefined4 *)((uVar21 - 2) * lVar42 + local_390 + lVar30 * 4);
                  piVar1 = (int *)(lVar41 * uVar21 + local_3a0 + lVar30 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_390 = lVar42 * uVar21 + local_390;
                }
                else {
                  if (cVar4 != '\0') {
                    lVar38 = lVar38 + 3;
                    goto LAB_0017e146;
                  }
                  lVar41 = local_3a0 + *local_350 * uVar21;
                  piVar1 = (int *)(lVar41 + lVar38 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_390 = local_390 + *local_300 * uVar21;
                  uVar16 = *(undefined4 *)(local_390 + lVar38 * 4);
                  piVar1 = (int *)(lVar41 + lVar30 * 4);
                  *piVar1 = *piVar1 + 1;
                }
              }
              else {
                lVar38 = (long)(iVar14 + 3);
LAB_0017e146:
                piVar1 = (int *)(local_180 + local_3c0 * (uVar21 - 1) + lVar38 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar38 + local_1f8._24_8_ + (long)local_3b0 * (uVar21 - 1)) == '\0') {
                  lVar41 = local_3a0 + *local_350 * uVar21;
                  piVar1 = (int *)(lVar41 + (long)iVar14 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_390 = local_390 + *local_300 * uVar21;
                  uVar16 = *(undefined4 *)(local_390 + (long)iVar14 * 4);
                  piVar1 = (int *)(lVar41 + lVar30 * 4);
                  *piVar1 = *piVar1 + 1;
                }
                else {
                  lVar41 = *local_350;
                  piVar1 = (int *)(lVar41 * (uVar21 - 2) + local_3a0 + lVar30 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar42 = *local_300;
                  uVar16 = *(undefined4 *)((uVar21 - 2) * lVar42 + local_390 + lVar30 * 4);
                  piVar1 = (int *)(lVar41 * uVar21 + local_3a0 + lVar30 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_390 = lVar42 * uVar21 + local_390;
                }
              }
              *(undefined4 *)(local_390 + lVar30 * 4) = uVar16;
              goto LAB_0017eda8;
            }
            piVar1 = (int *)(lVar57 + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(local_1f8._24_8_ + lVar20 + 2 + lVar27) == '\0') goto LAB_001809e7;
            lVar30 = *local_220;
            piVar1 = (int *)(lVar53 * lVar30 + lVar29 + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            lVar41 = *(long *)local_2d0._80_8_;
            uVar16 = *(undefined4 *)(lVar53 * lVar41 + lVar55 + lVar27 * 4);
            piVar1 = (int *)(lVar30 * uVar21 + lVar29 + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar41 * uVar21 + lVar55 + lVar27 * 4) = uVar16;
            lVar47 = lVar47 + 0x200000000;
            lVar30 = lVar38 + lVar27;
            lVar27 = lVar27 + 2;
            if ((long)uVar46 <= lVar30 + 2) {
              local_320._0_4_ = (int)local_320 + (int)lVar27;
              uVar15 = iVar14 + (int)lVar27;
              break;
            }
          } while( true );
        }
        uVar49 = (ulong)uVar15;
        local_3c0 = *local_148;
        lVar30 = local_3c0 * uVar21 + local_180;
        uVar40 = (ulong)(int)uVar15;
        piVar1 = (int *)(lVar30 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        local_3b0 = *(long **)local_1f8._80_8_;
        lVar41 = (long)local_3b0 * uVar21 + local_1f8._24_8_;
        if (iVar43 < (int)uVar15) {
          if (*(char *)(uVar40 + lVar41) == '\0') {
            lVar42 = local_3c0 * (uVar21 | 1);
            piVar1 = (int *)(local_180 + lVar42 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            lVar38 = (long)local_3b0 * (uVar21 | 1);
            if (*(char *)(uVar40 + local_1f8._24_8_ + lVar38) == '\0') {
              piVar1 = (int *)(*local_220 * uVar21 + local_258 + uVar40 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + uVar40 * 4) =
                   0;
            }
            else {
LAB_001807b1:
              lVar58 = (long)(int)local_320;
              piVar1 = (int *)(local_180 + lVar42 + 4 + lVar58 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar58 + 1 + local_1f8._24_8_ + lVar38) == '\0') {
                piVar1 = (int *)(lVar30 + 4 + lVar58 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar58 + 1 + lVar41) == '\0') {
                  uVar17 = TTA::MemNewLabel();
                  piVar1 = (int *)(*local_220 * uVar21 + local_258 + (long)(int)uVar15 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ +
                           (long)(int)uVar15 * 4) = uVar17;
                }
                else {
                  lVar30 = *local_220 * uVar21 + local_258;
                  piVar1 = (int *)(lVar30 + lVar58 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar41 = *(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_;
                  uVar16 = *(undefined4 *)(lVar41 + lVar58 * 4);
                  piVar1 = (int *)(lVar30 + (long)(int)uVar15 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar41 + (long)(int)uVar15 * 4) = uVar16;
                }
              }
              else {
                lVar30 = *local_220 * uVar21 + local_258;
                piVar1 = (int *)(lVar30 + lVar58 * 4);
                *piVar1 = *piVar1 + 1;
                lVar41 = *(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_;
                uVar16 = *(undefined4 *)(lVar41 + lVar58 * 4);
                piVar1 = (int *)(lVar30 + (long)(int)uVar15 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar41 + (long)(int)uVar15 * 4) = uVar16;
              }
            }
          }
          else {
            lVar42 = (long)(int)local_320;
            piVar1 = (int *)(lVar30 + 4 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            if ((*(char *)(lVar41 + 1 + lVar42) == '\0') &&
               (piVar1 = (int *)(local_3c0 * (uVar21 | 1) + local_180 + 4 + lVar42 * 4),
               *piVar1 = *piVar1 + 1,
               *(char *)(lVar42 + 1 + (uVar21 | 1) * (long)local_3b0 + local_1f8._24_8_) == '\0')) {
              lVar41 = local_3c0 * (uVar21 - 1);
              lVar30 = (long)local_3b0 * (uVar21 - 1);
LAB_00181787:
              piVar1 = (int *)(local_180 + lVar41 + uVar40 * 4);
              *piVar1 = *piVar1 + 1;
              lVar41 = uVar21 - 2;
              lVar42 = *local_220;
              lVar38 = lVar42 * lVar41 + local_258;
              if (*(char *)(uVar40 + local_1f8._24_8_ + lVar30) == '\0') {
                piVar1 = (int *)(lVar38 + (long)(int)local_320 * 4);
                *piVar1 = *piVar1 + 1;
                lVar30 = *(long *)local_2d0._80_8_;
                uVar16 = *(undefined4 *)
                          (lVar41 * lVar30 + local_2d0._24_8_ + (long)(int)local_320 * 4);
                piVar1 = (int *)(local_258 + lVar42 * uVar21 + uVar40 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar30 * uVar21 + local_2d0._24_8_ + uVar40 * 4) = uVar16;
              }
              else {
                piVar1 = (int *)(lVar38 + uVar40 * 4);
                *piVar1 = *piVar1 + 1;
                lVar30 = *(long *)local_2d0._80_8_;
                uVar16 = *(undefined4 *)(lVar41 * lVar30 + local_2d0._24_8_ + uVar40 * 4);
                piVar1 = (int *)(local_258 + lVar42 * uVar21 + uVar40 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar30 * uVar21 + local_2d0._24_8_ + uVar40 * 4) = uVar16;
              }
            }
            else {
              lVar30 = *local_220 * uVar21 + local_258;
              piVar1 = (int *)(lVar30 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              lVar41 = *(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_;
              uVar16 = *(undefined4 *)(lVar41 + lVar42 * 4);
              piVar1 = (int *)(lVar30 + uVar40 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar41 + uVar40 * 4) = uVar16;
            }
          }
          goto LAB_0017eda8;
        }
        if (*(char *)(uVar40 + lVar41) == '\0') {
          lVar42 = local_3c0 * (uVar21 | 1);
          piVar1 = (int *)(local_180 + lVar42 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar38 = (uVar21 | 1) * (long)local_3b0;
          plVar35 = (long *)local_180;
          if (*(char *)(uVar40 + local_1f8._24_8_ + lVar38) == '\0') goto LAB_00179058;
          local_368 = (long *)local_180;
          lVar58 = (long)(int)local_320;
          piVar1 = (int *)(lVar30 + 0xc + lVar58 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar41 + 3 + lVar58) == '\0') goto LAB_001807b1;
          piVar1 = (int *)(lVar30 + 4 + lVar58 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar41 + 1 + lVar58) != '\0') goto LAB_00180c81;
          piVar1 = (int *)(local_180 + lVar42 + 4 + lVar58 * 4);
          *piVar1 = *piVar1 + 1;
          plVar35 = local_368;
          if (*(char *)(local_1f8._24_8_ + lVar38 + 1 + lVar58) == '\0') goto LAB_00178dbd;
          lVar41 = local_3c0 * (uVar21 - 1);
          piVar1 = (int *)(local_180 + lVar41 + 0xc + lVar58 * 4);
          *piVar1 = *piVar1 + 1;
          lVar30 = (uVar21 - 1) * (long)local_3b0;
          if (*(char *)(lVar58 + 3 + local_1f8._24_8_ + lVar30) == '\0') {
            piVar1 = (int *)(local_180 + lVar41 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(local_1f8._24_8_ + lVar30 + uVar40) == '\0') {
              lVar30 = *local_220 * uVar21 + local_258;
              piVar1 = (int *)(lVar30 + lVar58 * 4);
              *piVar1 = *piVar1 + 1;
              lVar41 = *(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_;
              uVar16 = *(undefined4 *)(lVar41 + lVar58 * 4);
              piVar1 = (int *)(lVar30 + uVar40 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar41 + uVar40 * 4) = uVar16;
            }
            else {
              lVar30 = *local_220;
              piVar1 = (int *)(lVar30 * (uVar21 - 2) + local_258 + uVar40 * 4);
              *piVar1 = *piVar1 + 1;
              lVar41 = *(long *)local_2d0._80_8_;
              uVar16 = *(undefined4 *)((uVar21 - 2) * lVar41 + local_2d0._24_8_ + uVar40 * 4);
              piVar1 = (int *)(lVar30 * uVar21 + local_258 + uVar40 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar41 * uVar21 + local_2d0._24_8_ + uVar40 * 4) = uVar16;
            }
            goto LAB_0017eda8;
          }
        }
        else {
          lVar42 = (long)(int)local_320;
          piVar1 = (int *)(lVar30 + 4 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          local_368 = (long *)local_180;
          if ((*(char *)(lVar41 + 1 + lVar42) == '\0') &&
             (piVar1 = (int *)(local_3c0 * (uVar21 | 1) + local_180 + 4 + lVar42 * 4),
             *piVar1 = *piVar1 + 1,
             *(char *)(lVar42 + 1 + (uVar21 | 1) * (long)local_3b0 + local_1f8._24_8_) == '\0')) {
            lVar41 = local_3c0 * (uVar21 - 1);
            piVar1 = (int *)(local_180 + lVar41 + 0xc + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            lVar30 = (uVar21 - 1) * (long)local_3b0;
            if (*(char *)(lVar42 + 3 + local_1f8._24_8_ + lVar30) == '\0') goto LAB_00181787;
            piVar1 = (int *)(local_180 + lVar41 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(local_1f8._24_8_ + lVar30 + uVar40) == '\0') {
LAB_00182957:
              lVar30 = uVar21 - 2;
              piVar1 = (int *)(local_3c0 * lVar30 + (long)local_368 + uVar40 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(uVar40 + (long)local_3b0 * lVar30 + (long)local_380) == '\0') {
                lVar41 = *local_220 * lVar30 + local_258;
                piVar1 = (int *)(lVar41 + -8 + (long)(int)uVar15 * 4);
                *piVar1 = *piVar1 + 1;
                lVar30 = lVar30 * *(long *)local_2d0._80_8_ + local_2d0._24_8_;
                uVar15 = *(uint *)(lVar30 + -8 + (long)(int)uVar15 * 4);
                piVar1 = (int *)(lVar41 + uVar40 * 4);
                *piVar1 = *piVar1 + 1;
                uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar30 + uVar40 * 4));
                piVar1 = (int *)(*local_220 * uVar21 + local_258 + uVar40 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + uVar40 * 4) =
                     uVar15;
                goto LAB_0017eda8;
              }
            }
            lVar30 = *local_220;
            piVar1 = (int *)(lVar30 * (uVar21 - 2) + local_258 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            lVar41 = *(long *)local_2d0._80_8_;
            uVar16 = *(undefined4 *)((uVar21 - 2) * lVar41 + local_2d0._24_8_ + uVar40 * 4);
            piVar1 = (int *)(lVar30 * uVar21 + local_258 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar41 * uVar21 + local_2d0._24_8_ + uVar40 * 4) = uVar16;
            goto LAB_0017eda8;
          }
LAB_00180c81:
          lVar42 = (long)(int)uVar15;
          lVar41 = local_3c0 * (uVar21 - 1);
          piVar1 = (int *)(local_180 + lVar41 + 4 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar30 = (uVar21 - 1) * (long)local_3b0;
          if (*(char *)(lVar42 + 1 + local_1f8._24_8_ + lVar30) == '\0') {
            lVar30 = *local_220 * uVar21 + local_258;
            piVar1 = (int *)(lVar30 + -8 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            lVar41 = *(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_;
            uVar16 = *(undefined4 *)(lVar41 + -8 + lVar42 * 4);
            piVar1 = (int *)(lVar30 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar41 + lVar42 * 4) = uVar16;
            goto LAB_0017eda8;
          }
        }
LAB_00180cb9:
        lVar42 = (long)(int)uVar15;
        piVar1 = (int *)(lVar41 + local_180 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar41 = uVar21 - 2;
        if (*(char *)(lVar42 + lVar30 + local_1f8._24_8_) == '\0') {
          piVar1 = (int *)(local_180 + local_3c0 * lVar41 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          cVar3 = *(char *)(lVar42 + local_1f8._24_8_ + (long)local_3b0 * lVar41);
          lVar30 = *local_220;
          piVar1 = (int *)(lVar30 * lVar41 + local_258 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar38 = *(long *)local_2d0._80_8_;
          uVar15 = *(uint *)(lVar41 * lVar38 + local_2d0._24_8_ + lVar42 * 4);
          if (cVar3 == '\0') {
            piVar1 = (int *)(local_258 + lVar30 * uVar21 + -8 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            lVar30 = local_2d0._24_8_ + lVar38 * uVar21;
LAB_001811bf:
            uVar17 = *(uint *)(lVar30 + -8 + lVar42 * 4);
LAB_001811c3:
            uVar15 = TTA::MemMerge(uVar15,uVar17);
            piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + lVar42 * 4) = uVar15;
          }
          else {
            piVar1 = (int *)(local_258 + lVar30 * uVar21 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2d0._24_8_ + lVar38 * uVar21 + lVar42 * 4) = uVar15;
          }
        }
        else {
          lVar30 = *local_220;
          piVar1 = (int *)(lVar30 * lVar41 + local_258 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar38 = *(long *)local_2d0._80_8_;
          uVar16 = *(undefined4 *)(lVar41 * lVar38 + local_2d0._24_8_ + lVar42 * 4);
          piVar1 = (int *)(lVar30 * uVar21 + local_258 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar38 * uVar21 + local_2d0._24_8_ + lVar42 * 4) = uVar16;
        }
        goto LAB_0017eda8;
      }
      local_380 = (long *)local_1f8._24_8_;
      if (iVar6 == 2) {
        local_368 = (long *)local_180;
        uVar15 = 0;
        plVar35 = local_368;
        if (cVar3 == '\0') {
          lVar58 = local_3c0 * (uVar21 | 1);
          lVar42 = (uVar21 | 1) * (long)local_3b0;
          uVar40 = 0;
LAB_00178fac:
          uVar15 = (uint)uVar40;
          lVar41 = (long)(int)uVar15;
          piVar1 = (int *)(lVar58 + (long)local_368 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar41 + lVar42 + (long)local_380) == '\0') {
            plVar35 = local_368;
            uVar49 = uVar40 & 0xffffffff;
LAB_00179058:
            uVar15 = (uint)uVar49;
            lVar41 = (long)(int)uVar15;
            piVar1 = (int *)(local_3c0 * uVar21 + (long)plVar35 + 4 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar41 + 1 + (long)local_3b0 * uVar21 + (long)local_380) == '\0') {
LAB_0017f423:
              lVar30 = lVar41 + 1;
LAB_0017f426:
              piVar1 = (int *)(local_3c0 * (uVar21 | 1) + (long)plVar35 + lVar30 * 4);
              *piVar1 = *piVar1 + 1;
              lVar41 = (long)(int)uVar15;
              if (*(char *)(lVar30 + (uVar21 | 1) * (long)local_3b0 + (long)local_380) == '\0') {
                piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar41 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + lVar41 * 4)
                     = 0;
                goto LAB_0017eda8;
              }
              goto LAB_0017f448;
            }
          }
          else {
            piVar1 = (int *)(local_3c0 * uVar21 + (long)local_368 + 4 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            plVar35 = local_368;
            if (*(char *)(lVar41 + 1 + (long)local_3b0 * uVar21 + (long)local_380) == '\0') {
LAB_0017f448:
              uVar15 = TTA::MemNewLabel();
              piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar41 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + lVar41 * 4) = uVar15
              ;
              goto LAB_0017eda8;
            }
          }
        }
LAB_00178dbd:
        local_368 = plVar35;
        lVar30 = (long)(int)uVar15;
        piVar1 = (int *)(local_3c0 * (uVar21 - 1) + (long)local_368 + 4 + lVar30 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar30 + 1 + (uVar21 - 1) * (long)local_3b0 + (long)local_380) == '\0') {
LAB_00178ec3:
          lVar42 = (long)(int)uVar15;
          piVar1 = (int *)(local_3c0 * (uVar21 - 1) + (long)local_368 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + (long)local_3b0 * (uVar21 - 1) + (long)local_380) == '\0') {
            uVar15 = TTA::MemNewLabel();
LAB_00178f47:
            piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + lVar42 * 4) = uVar15;
          }
          else {
            lVar30 = *local_220;
            piVar1 = (int *)(lVar30 * (uVar21 - 2) + local_258 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            lVar41 = *(long *)local_2d0._80_8_;
            uVar16 = *(undefined4 *)((uVar21 - 2) * lVar41 + local_2d0._24_8_ + lVar42 * 4);
            piVar1 = (int *)(lVar30 * uVar21 + local_258 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar41 * uVar21 + local_2d0._24_8_ + lVar42 * 4) = uVar16;
          }
        }
        else {
          lVar41 = *local_220;
          piVar1 = (int *)(lVar41 * (uVar21 - 2) + local_258 + lVar30 * 4);
          *piVar1 = *piVar1 + 1;
          lVar42 = *(long *)local_2d0._80_8_;
          uVar16 = *(undefined4 *)((uVar21 - 2) * lVar42 + local_2d0._24_8_ + lVar30 * 4);
          piVar1 = (int *)(lVar41 * uVar21 + local_258 + lVar30 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar42 * uVar21 + local_2d0._24_8_ + lVar30 * 4) = uVar16;
        }
      }
      else {
        if (cVar3 != '\0') {
          uVar15 = 0;
          local_368 = (long *)local_180;
          goto LAB_00178ec3;
        }
        local_368 = (long *)local_180;
        lVar58 = local_3c0 * (uVar21 | 1);
        lVar42 = (long)local_3b0 * (uVar21 | 1);
        uVar40 = 0;
LAB_00179023:
        lVar38 = (long)(int)uVar40;
        piVar1 = (int *)(lVar58 + (long)local_368 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar38 + lVar42 + (long)local_380) == '\0') {
          piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + lVar38 * 4) = 0;
        }
        else {
          uVar15 = TTA::MemNewLabel();
LAB_0017adc6:
          piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + lVar38 * 4) = uVar15;
        }
      }
LAB_0017eda8:
      uVar21 = uVar21 + 2;
      lVar44 = lVar44 + 2;
      lVar53 = lVar53 + 2;
      local_310 = local_310 + 2;
    } while (uVar21 < uVar13);
  }
  if (local_124 != 1) goto LAB_00186fec;
  lVar44 = uVar23 - 1;
  local_3d8 = (int)lVar44;
  uVar13 = 0;
  if (2 < iVar6) {
    lVar30 = (long)(iVar5 + -2);
    lVar53 = (long)(iVar5 + -3);
    uVar46 = uVar46 & 0xffffffff;
    uVar15 = 0xfffffffe;
    local_3a0 = 0;
    do {
      local_3b8 = *local_148;
      lVar58 = local_3b8 * lVar44 + local_180;
      uVar13 = (uint)local_3a0;
      uVar21 = (ulong)(int)uVar13;
      piVar1 = (int *)(lVar58 + uVar21 * 4);
      *piVar1 = *piVar1 + 1;
      local_368 = (long *)local_1f8._80_8_;
      lVar41 = *(long *)local_1f8._80_8_;
      lVar26 = lVar41 * lVar44 + local_1f8._24_8_;
      lVar42 = local_180;
      local_390 = local_180;
      lVar38 = local_1f8._24_8_;
      local_358 = local_1f8._24_8_;
      if (*(char *)(uVar21 + lVar26) == '\0') goto LAB_001835f6;
      lVar39 = (long)(int)uVar15;
      lVar33 = local_3b8 * lVar30;
      piVar1 = (int *)(lVar33 + local_180 + 0xc + lVar39 * 4);
      *piVar1 = *piVar1 + 1;
      lVar28 = lVar41 * lVar30;
      if (*(char *)(lVar39 + 3 + local_1f8._24_8_ + lVar28) != '\0') {
        local_310 = *local_220;
        piVar1 = (int *)(local_310 * lVar53 + local_258 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
        lVar58 = *(long *)local_2d0._80_8_;
        uVar13 = *(uint *)(lVar58 * lVar53 + local_2d0._24_8_ + uVar21 * 4);
        piVar1 = (int *)(local_310 * lVar44 + local_258 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
        local_2f0 = local_258;
        local_328 = local_2d0._24_8_;
        plVar32 = (long *)local_2d0._24_8_;
        goto LAB_00185688;
      }
      piVar1 = (int *)(lVar58 + 0xc + lVar39 * 4);
      *piVar1 = *piVar1 + 1;
      local_358 = local_1f8._24_8_;
      if (*(char *)(lVar26 + 3 + lVar39) != '\0') {
LAB_00183711:
        uVar21 = (ulong)(int)(uint)local_3a0;
        piVar1 = (int *)(lVar33 + lVar42 + 8 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
        cVar3 = *(char *)(uVar21 + 2 + lVar28 + lVar38);
        piVar1 = (int *)(lVar33 + lVar42 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
        cVar4 = *(char *)(uVar21 + lVar28 + lVar38);
        local_338 = local_258;
        local_328 = local_2d0._24_8_;
        local_378 = local_2d0._24_8_;
        local_348 = local_258;
        local_370 = local_2d0._24_8_;
        if (cVar3 != '\0') {
          if (cVar4 != '\0') goto LAB_00183745;
          local_310 = *local_220;
          piVar1 = (int *)(local_310 * lVar53 + local_258 + 8 + uVar21 * 4);
          *piVar1 = *piVar1 + 1;
          lVar58 = *(long *)local_2d0._80_8_;
          uVar13 = *(uint *)(lVar58 * lVar53 + local_2d0._24_8_ + 8 + uVar21 * 4);
          piVar1 = (int *)(local_310 * lVar44 + local_258 + uVar21 * 4);
          *piVar1 = *piVar1 + 1;
          local_360 = local_258;
          local_320 = local_258;
          local_3b0 = local_220;
          local_398 = local_2d0._24_8_;
          local_380 = (long *)local_2d0._80_8_;
          goto LAB_001847b3;
        }
        if (cVar4 == '\0') {
          uVar13 = TTA::MemNewLabel();
          local_3b0 = local_220;
          local_310 = *local_220;
          piVar1 = (int *)(local_310 * lVar44 + local_258 + uVar21 * 4);
          *piVar1 = *piVar1 + 1;
          local_380 = (long *)local_2d0._80_8_;
          lVar58 = *(long *)local_2d0._80_8_;
          local_398 = local_2d0._24_8_;
          local_2f0 = local_258;
          local_360 = local_258;
          local_370 = local_2d0._24_8_;
          goto LAB_00184289;
        }
        local_3b0 = local_220;
        local_310 = *local_220;
        piVar1 = (int *)(local_310 * lVar53 + local_258 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
        local_380 = (long *)local_2d0._80_8_;
        lVar58 = *(long *)local_2d0._80_8_;
        local_398 = local_2d0._24_8_;
        local_360 = local_258;
        local_2f0 = local_258;
        local_300 = (long *)local_2d0._24_8_;
LAB_00183867:
        lVar26 = lVar58 * lVar53;
        uVar16 = *(undefined4 *)((long)local_300 + lVar26 + uVar21 * 4);
        lVar42 = local_310 * lVar44 + local_2f0;
        piVar1 = (int *)(lVar42 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
        lVar58 = lVar58 * lVar44 + local_328;
        *(undefined4 *)(lVar58 + uVar21 * 4) = uVar16;
        lVar38 = (long)(int)(uint)local_3a0;
        uVar21 = lVar38 + 2;
        uVar15 = (uint)uVar21;
        if ((int)uVar15 < iVar43) {
          lVar39 = local_3b8 * lVar44 + local_390;
          piVar1 = (int *)(lVar39 + 8 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          lVar28 = lVar41 * lVar44 + local_358;
          if (*(char *)(lVar38 + 2 + lVar28) == '\0') {
            local_3a0 = uVar21 & 0xffffffff;
            local_390 = local_390;
            local_358 = local_358;
            local_320 = local_2f0;
            goto LAB_0018455f;
          }
          lVar33 = local_3b8 * lVar30 + local_390;
          piVar1 = (int *)(lVar33 + 0xc + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          lVar22 = lVar41 * lVar30 + local_358;
          if (*(char *)(lVar38 + 3 + lVar22) != '\0') {
            piVar1 = (int *)(local_390 + local_3b8 * lVar53 + 8 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar38 + 2 + local_358 + lVar41 * lVar53) == '\0') {
              piVar1 = (int *)(local_2f0 + local_310 * lVar53 + 8 + lVar38 * 4);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)(local_328 + lVar26 + 8 + lVar38 * 4);
              piVar1 = (int *)(lVar42 + lVar38 * 4);
              *piVar1 = *piVar1 + 1;
              uVar13 = TTA::MemMerge(uVar13,*(uint *)(lVar58 + lVar38 * 4));
              local_310 = *local_220;
              piVar1 = (int *)(local_310 * lVar44 + local_258 + 8 + lVar38 * 4);
              *piVar1 = *piVar1 + 1;
              lVar58 = *(long *)local_2d0._80_8_;
              local_2f0 = local_258;
              local_328 = local_2d0._24_8_;
              goto LAB_001843c9;
            }
            local_3a0 = uVar21 & 0xffffffff;
LAB_00185002:
            uVar21 = (ulong)(int)local_3a0;
            piVar1 = (int *)(*local_148 * lVar53 + local_180 + -4 + uVar21 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)((uVar21 - 1) + *(long *)local_1f8._80_8_ * lVar53 + local_1f8._24_8_) ==
                '\0') {
              lVar41 = *local_220 * lVar53 + local_258;
              uVar21 = (ulong)(int)local_3a0;
              piVar1 = (int *)(lVar41 + -8 + uVar21 * 4);
              *piVar1 = *piVar1 + 1;
              lVar42 = *(long *)local_2d0._80_8_ * lVar53 + local_2d0._24_8_;
              uVar13 = *(uint *)(lVar42 + -8 + uVar21 * 4);
              piVar1 = (int *)(lVar41 + uVar21 * 4);
              *piVar1 = *piVar1 + 1;
              uVar15 = *(uint *)(lVar42 + uVar21 * 4);
              goto LAB_00185d69;
            }
            local_310 = *local_220;
            piVar1 = (int *)(local_310 * lVar53 + local_258 + uVar21 * 4);
            *piVar1 = *piVar1 + 1;
            local_380 = (long *)local_2d0._80_8_;
            local_2f0 = local_258;
            local_328 = local_2d0._24_8_;
            goto LAB_00185c58;
          }
          piVar1 = (int *)(lVar39 + 0xc + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar28 + 3 + lVar38) != '\0') {
            piVar1 = (int *)(lVar33 + 0x10 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar22 + 4 + lVar38) == '\0') {
              piVar1 = (int *)(lVar42 + lVar38 * 4);
              *piVar1 = *piVar1 + 1;
              uVar16 = *(undefined4 *)(lVar58 + lVar38 * 4);
              piVar1 = (int *)(lVar42 + 8 + lVar38 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar58 + 8 + lVar38 * 4) = uVar16;
              local_2f0 = local_348;
              lVar42 = local_390;
              local_358 = local_358;
              goto LAB_00184d33;
            }
            local_390 = local_390 + local_3b8 * lVar53;
            piVar1 = (int *)(local_390 + 0xc + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            lVar39 = lVar41 * lVar53;
            if (*(char *)(lVar38 + 3 + local_358 + lVar39) == '\0') {
              piVar1 = (int *)(local_2f0 + local_310 * lVar53 + 0x10 + lVar38 * 4);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)(local_328 + lVar26 + 0x10 + lVar38 * 4);
              piVar1 = (int *)(lVar42 + lVar38 * 4);
              *piVar1 = *piVar1 + 1;
              uVar13 = TTA::MemMerge(uVar13,*(uint *)(lVar58 + lVar38 * 4));
              local_310 = *local_220;
              piVar1 = (int *)(local_310 * lVar44 + local_258 + 8 + lVar38 * 4);
              *piVar1 = *piVar1 + 1;
              lVar58 = *(long *)local_2d0._80_8_;
              local_360 = local_258;
              local_348 = local_258;
              local_3b0 = local_220;
              local_398 = local_2d0._24_8_;
              local_380 = (long *)local_2d0._80_8_;
              local_370 = local_2d0._24_8_;
              goto LAB_001844e9;
            }
            piVar1 = (int *)(local_390 + 8 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(local_358 + lVar39 + 2 + lVar38) == '\0') {
              piVar1 = (int *)(local_2f0 + local_310 * lVar53 + 0x10 + lVar38 * 4);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)(local_328 + lVar26 + 0x10 + lVar38 * 4);
              piVar1 = (int *)(lVar42 + lVar38 * 4);
              *piVar1 = *piVar1 + 1;
              uVar13 = TTA::MemMerge(uVar13,*(uint *)(lVar58 + lVar38 * 4));
              local_310 = *local_220;
              piVar1 = (int *)(local_310 * lVar44 + local_258 + 8 + lVar38 * 4);
              *piVar1 = *piVar1 + 1;
              lVar58 = *(long *)local_2d0._80_8_;
              local_3a0 = uVar21 & 0xffffffff;
              local_338 = local_258;
              local_348 = local_258;
              local_360 = local_258;
              local_320 = local_258;
              local_328 = local_2d0._24_8_;
              local_3b0 = local_220;
              local_398 = local_2d0._24_8_;
              local_380 = (long *)local_2d0._80_8_;
              local_378 = local_2d0._24_8_;
              local_370 = local_2d0._24_8_;
              goto LAB_001847b3;
            }
            local_3a0 = uVar21 & 0xffffffff;
LAB_001851e8:
            iVar14 = (int)local_3a0;
            uVar21 = (ulong)iVar14;
            piVar1 = (int *)(*local_148 * lVar53 + local_180 + -4 + uVar21 * 4);
            *piVar1 = *piVar1 + 1;
            lVar41 = (long)(iVar14 + 2);
            if (*(char *)((uVar21 - 1) + lVar39 + local_358) != '\0') {
              piVar1 = (int *)(local_2f0 + *local_3b0 * lVar53 + lVar41 * 4);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)(local_328 + *local_380 * lVar53 + lVar41 * 4);
              local_310 = *local_3b0;
              piVar1 = (int *)(local_310 * lVar44 + local_348 + uVar21 * 4);
              *piVar1 = *piVar1 + 1;
              lVar58 = *local_380;
              local_360 = local_360;
              local_320 = local_348;
              local_328 = local_370;
              goto LAB_001847b3;
            }
            lVar42 = *local_3b0;
            piVar1 = (int *)(lVar42 * lVar53 + local_348 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            lVar38 = *local_380;
            uVar13 = *(uint *)(lVar38 * lVar53 + local_370 + lVar41 * 4);
            uVar40 = (ulong)iVar14;
            piVar1 = (int *)(lVar42 * lVar44 + local_348 + -8 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            uVar13 = TTA::MemMerge(uVar13,*(uint *)(lVar38 * lVar44 + local_370 + -8 + uVar40 * 4));
            local_310 = *local_220;
LAB_00183b01:
            piVar1 = (int *)(local_310 * lVar44 + local_258 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            lVar58 = *(long *)local_2d0._80_8_;
            do {
              local_398 = local_2d0._24_8_;
              local_378 = local_2d0._24_8_;
              local_370 = local_2d0._24_8_;
              local_338 = local_258;
              local_348 = local_258;
              local_360 = local_258;
              local_320 = local_258;
              uVar21 = uVar40;
              local_328 = local_2d0._24_8_;
              local_3b0 = local_220;
              local_380 = (long *)local_2d0._80_8_;
LAB_001847b3:
              *(uint *)(lVar58 * lVar44 + local_328 + uVar21 * 4) = uVar13;
              iVar14 = (int)local_3a0;
              uVar13 = iVar14 + 2;
              local_300 = (long *)local_328;
              if (iVar43 <= (int)uVar13) {
LAB_00186597:
                uVar21 = (ulong)uVar13;
                local_2f0 = local_348;
                if (iVar43 < (int)uVar13) {
LAB_001865c2:
                  uVar13 = (uint)uVar21;
                  lVar38 = local_1f8._24_8_;
                  local_368 = (long *)local_1f8._80_8_;
                  goto LAB_001865c5;
                }
                lVar41 = *local_148;
                lVar28 = lVar41 * lVar44 + local_180;
                lVar38 = (long)(int)uVar13;
                piVar1 = (int *)(lVar28 + lVar38 * 4);
                *piVar1 = *piVar1 + 1;
                lVar42 = *(long *)local_1f8._80_8_;
                lVar39 = lVar42 * lVar44 + local_1f8._24_8_;
                lVar26 = (long)iVar14;
                if (*(char *)(lVar38 + lVar39) == '\0') {
                  piVar1 = (int *)(lVar28 + 0xc + lVar26 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar39 + 3 + lVar26) == '\0') {
                    piVar1 = (int *)(local_320 + local_310 * lVar44 + lVar38 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)((long)local_300 + lVar58 * lVar44 + lVar38 * 4) = 0;
                    goto LAB_00186fec;
                  }
                }
                else {
                  piVar1 = (int *)(local_180 + lVar41 * lVar30 + 0xc + lVar26 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar26 + 3 + local_1f8._24_8_ + lVar42 * lVar30) == '\0') {
                    local_320 = local_320 + local_310 * lVar44;
                    piVar1 = (int *)(local_320 + lVar26 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar44 = (long)local_300 + lVar58 * lVar44;
                    uVar16 = *(undefined4 *)(lVar44 + lVar26 * 4);
                    piVar1 = (int *)(local_320 + lVar38 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar44 + lVar38 * 4) = uVar16;
                    goto LAB_00186fec;
                  }
                }
                piVar1 = (int *)(local_310 * lVar53 + local_320 + lVar38 * 4);
                *piVar1 = *piVar1 + 1;
                uVar16 = *(undefined4 *)(lVar53 * lVar58 + (long)local_300 + lVar38 * 4);
                piVar1 = (int *)(local_310 * lVar44 + local_320 + lVar38 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar58 * lVar44 + (long)local_300 + lVar38 * 4) = uVar16;
                goto LAB_00186fec;
              }
              lVar26 = (long)iVar14;
              lVar28 = lVar26 << 0x20;
              lVar42 = lVar26 * 4;
              lVar39 = 0;
              local_2f0 = local_320;
              while( true ) {
                local_390 = local_180;
                local_3b8 = *local_148;
                lVar22 = local_3b8 * lVar44 + local_180;
                lVar38 = lVar22 + lVar42;
                piVar1 = (int *)(lVar38 + 8 + lVar39 * 4);
                *piVar1 = *piVar1 + 1;
                local_368 = (long *)local_1f8._80_8_;
                lVar41 = *(long *)local_1f8._80_8_;
                lVar25 = lVar41 * lVar44 + local_1f8._24_8_;
                lVar33 = lVar26 + lVar25;
                local_358 = local_1f8._24_8_;
                if (*(char *)(lVar39 + 2 + lVar33) == '\0') break;
                lVar22 = local_3b8 * lVar30 + local_180 + lVar42;
                piVar1 = (int *)(lVar22 + 0xc + lVar39 * 4);
                *piVar1 = *piVar1 + 1;
                lVar25 = lVar41 * lVar30 + local_1f8._24_8_ + lVar26;
                iVar51 = (int)lVar39;
                iVar31 = (int)(lVar26 + 2);
                if (*(char *)(lVar39 + 3 + lVar25) != '\0') {
                  piVar1 = (int *)(local_310 * lVar53 + local_320 + lVar26 * 4 + 8 + lVar39 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar13 = *(uint *)(lVar58 * lVar53 + (long)local_300 + lVar26 * 4 + 8 + lVar39 * 4
                                    );
                  piVar1 = (int *)(local_310 * lVar44 + local_320 + lVar26 * 4 + 8 + lVar39 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_3a0 = (ulong)(uint)(iVar31 + iVar51);
                  uVar21 = lVar26 + lVar39 + 2;
                  local_2f0 = local_2f0;
                  local_328 = local_328;
                  plVar32 = local_300;
                  goto LAB_00185688;
                }
                piVar1 = (int *)(lVar38 + 0xc + lVar39 * 4);
                *piVar1 = *piVar1 + 1;
                lVar38 = lVar28 >> 0x1e;
                if (*(char *)(lVar39 + 3 + lVar33) == '\0') {
                  local_320 = local_320 + local_310 * lVar44;
                  piVar1 = (int *)(lVar38 + local_320);
                  *piVar1 = *piVar1 + 1;
                  lVar41 = (long)local_300 + lVar58 * lVar44;
                  uVar16 = *(undefined4 *)(lVar38 + lVar41);
                  piVar1 = (int *)(local_320 + lVar26 * 4 + 8 + lVar39 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar41 + lVar26 * 4 + 8 + lVar39 * 4) = uVar16;
                  uVar15 = iVar31 + iVar51;
                  goto LAB_001850e3;
                }
                piVar1 = (int *)(lVar22 + 0x10 + lVar39 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar39 + 4 + lVar25) == '\0') goto LAB_00184bc8;
                piVar1 = (int *)(local_180 + lVar42 + local_3b8 * lVar53 + 0xc + lVar39 * 4);
                *piVar1 = *piVar1 + 1;
                cVar3 = *(char *)(lVar39 + 3 + local_1f8._24_8_ + lVar26 + lVar41 * lVar53);
                piVar1 = (int *)(local_310 * lVar53 + local_320 + lVar42 + 0x10 + lVar39 * 4);
                *piVar1 = *piVar1 + 1;
                lVar38 = local_310 * lVar44 + local_320;
                lVar41 = lVar58 * lVar44 + (long)local_300;
                uVar13 = *(uint *)(lVar58 * lVar53 + (long)local_300 + lVar42 + 0x10 + lVar39 * 4);
                if (cVar3 == '\0') {
                  piVar1 = (int *)(lVar38 + lVar42 + lVar39 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar13 = TTA::MemMerge(uVar13,*(uint *)(lVar41 + lVar42 + lVar39 * 4));
                  local_3b0 = local_220;
                  local_310 = *local_220;
                  piVar1 = (int *)(local_310 * lVar44 + local_258 + lVar42 + 8 + lVar39 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_380 = (long *)local_2d0._80_8_;
                  lVar58 = *(long *)local_2d0._80_8_;
                  lVar41 = lVar58 * lVar44 + local_2d0._24_8_;
                  local_378 = local_2d0._24_8_;
                  local_338 = local_258;
                  local_370 = local_2d0._24_8_;
                  local_348 = local_258;
                  local_328 = local_2d0._24_8_;
                  local_2f0 = local_258;
                  local_398 = local_2d0._24_8_;
                  local_300 = (long *)local_2d0._24_8_;
                  local_360 = local_258;
                  local_320 = local_258;
                }
                else {
                  piVar1 = (int *)(lVar38 + lVar42 + 8 + lVar39 * 4);
                  *piVar1 = *piVar1 + 1;
                }
                *(uint *)(lVar41 + lVar42 + 8 + lVar39 * 4) = uVar13;
                lVar28 = lVar28 + 0x200000000;
                lVar41 = lVar26 + lVar39;
                lVar39 = lVar39 + 2;
                if ((long)uVar46 <= lVar41 + 4) {
                  uVar13 = iVar14 + (int)lVar39 + 2;
                  iVar14 = iVar14 + (int)lVar39;
                  goto LAB_00186597;
                }
              }
              local_3a0 = lVar26 + 2 + lVar39;
              piVar1 = (int *)(lVar22 + (lVar28 + 0x300000000 >> 0x1e));
              *piVar1 = *piVar1 + 1;
              lVar33 = lVar28 + 0x300000000 >> 0x20;
              uVar21 = lVar26 + 2 + lVar39;
              lVar42 = local_180;
              lVar38 = local_1f8._24_8_;
              if (*(char *)(lVar25 + lVar33) == '\0') {
                local_310 = *local_3b0;
                piVar1 = (int *)(local_310 * lVar44 + local_338 + lVar26 * 4 + 8 + lVar39 * 4);
                *piVar1 = *piVar1 + 1;
                local_2f0 = local_338;
                local_328 = local_378;
                goto LAB_00183dd5;
              }
              lVar22 = local_3b8 * lVar30 + local_180;
              piVar1 = (int *)(lVar22 + lVar33 * 4);
              *piVar1 = *piVar1 + 1;
              lVar25 = lVar41 * lVar30 + local_1f8._24_8_;
              if (*(char *)(lVar33 + lVar25) != '\0') {
                piVar1 = (int *)(local_310 * lVar53 + local_320 + lVar26 * 4 + 8 + lVar39 * 4);
                *piVar1 = *piVar1 + 1;
                local_3a0 = local_3a0 & 0xffffffff;
                lVar26 = local_1f8._24_8_;
                goto LAB_0018460a;
              }
              piVar1 = (int *)(lVar22 + (lVar28 + 0x400000000 >> 0x1e));
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar25 + (lVar28 + 0x400000000 >> 0x20)) == '\0') {
                piVar1 = (int *)(local_320 + local_310 * lVar53 + lVar26 * 4 + 8 + lVar39 * 4);
                *piVar1 = *piVar1 + 1;
                goto LAB_00183867;
              }
              local_3a0 = local_3a0 & 0xffffffff;
LAB_00183745:
              uVar40 = (ulong)(int)local_3a0;
              piVar1 = (int *)(*local_148 * lVar53 + local_180 + 4 + uVar40 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(uVar40 + 1 + lVar41 * lVar53 + local_358) == '\0') goto LAB_00183a86;
              local_310 = *local_220;
              piVar1 = (int *)(local_310 * lVar53 + local_258 + 8 + uVar40 * 4);
              *piVar1 = *piVar1 + 1;
              lVar58 = *(long *)local_2d0._80_8_;
              uVar13 = *(uint *)(lVar58 * lVar53 + local_2d0._24_8_ + 8 + uVar40 * 4);
              piVar1 = (int *)(local_310 * lVar44 + local_258 + uVar40 * 4);
              *piVar1 = *piVar1 + 1;
            } while( true );
          }
          local_348 = local_348 + *local_3b0 * lVar44;
          piVar1 = (int *)(local_348 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          local_370 = local_370 + *local_380 * lVar44;
          uVar16 = *(undefined4 *)(local_370 + lVar38 * 4);
          piVar1 = (int *)(local_348 + 8 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_370 + 8 + lVar38 * 4) = uVar16;
          goto LAB_001850e3;
        }
        if (iVar43 < (int)uVar15) {
          local_2f0 = local_348;
LAB_00186555:
          uVar13 = (uint)uVar21;
          lVar38 = local_358;
LAB_001865c5:
          lVar53 = (long)(int)uVar13;
          piVar1 = (int *)(*local_148 * lVar44 + local_180 + lVar53 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar53 + *local_368 * lVar44 + lVar38) == '\0') {
            piVar1 = (int *)(local_2f0 + *local_3b0 * lVar44 + lVar53 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_370 + lVar44 * *local_380 + lVar53 * 4) = 0;
          }
          else {
            local_2f0 = local_2f0 + *local_3b0 * lVar44;
            piVar1 = (int *)(local_2f0 + -8 + lVar53 * 4);
            *piVar1 = *piVar1 + 1;
            local_370 = local_370 + lVar44 * *local_380;
            uVar16 = *(undefined4 *)(local_370 + -8 + lVar53 * 4);
            piVar1 = (int *)(local_2f0 + lVar53 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_370 + lVar53 * 4) = uVar16;
          }
          goto LAB_00186fec;
        }
        piVar1 = (int *)(local_3b8 * lVar44 + local_390 + 8 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        local_398 = local_370;
        if (*(char *)(lVar38 + 2 + lVar41 * lVar44 + local_358) == '\0') {
          lVar42 = lVar41 * lVar44;
LAB_001869e5:
          lVar38 = (long)(int)uVar21;
          piVar1 = (int *)(*local_148 * lVar44 + local_180 + 4 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar38 + 1 + lVar42 + local_358) == '\0') {
            piVar1 = (int *)(local_348 + *local_3b0 * lVar44 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_398 + lVar44 * *local_380 + lVar38 * 4) = 0;
            goto LAB_00186fec;
          }
          piVar1 = (int *)(lVar30 * *local_148 + local_180 + 4 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar38 + 1 + local_358 + lVar41 * lVar30) != '\0') {
LAB_00186a45:
            lVar30 = *local_3b0;
            piVar1 = (int *)(lVar30 * lVar53 + local_348 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            lVar41 = *local_380;
            uVar16 = *(undefined4 *)(lVar53 * lVar41 + local_398 + lVar38 * 4);
            piVar1 = (int *)(lVar30 * lVar44 + local_348 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar41 * lVar44 + local_398 + lVar38 * 4) = uVar16;
            goto LAB_00186fec;
          }
          uVar13 = TTA::MemNewLabel();
        }
        else {
          piVar1 = (int *)(local_3b8 * lVar30 + local_390 + 0xc + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar38 + 3 + lVar30 * lVar41 + local_358) == '\0') {
            piVar1 = (int *)(lVar42 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            uVar16 = *(undefined4 *)(lVar58 + lVar38 * 4);
            piVar1 = (int *)(lVar42 + 8 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar58 + 8 + lVar38 * 4) = uVar16;
            goto LAB_00186fec;
          }
          piVar1 = (int *)(local_390 + local_3b8 * lVar53 + 8 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar38 + 2 + local_358 + lVar41 * lVar53) == '\0') {
            piVar1 = (int *)(local_2f0 + local_310 * lVar53 + 8 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            uVar13 = *(uint *)(local_328 + lVar26 + 8 + lVar38 * 4);
            piVar1 = (int *)(lVar42 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            uVar13 = TTA::MemMerge(uVar13,*(uint *)(lVar58 + lVar38 * 4));
            piVar1 = (int *)(*local_220 * lVar44 + local_258 + 8 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(lVar44 * *(long *)local_2d0._80_8_ + local_2d0._24_8_ + 8 + lVar38 * 4) =
                 uVar13;
            goto LAB_00186fec;
          }
          lVar41 = lVar41 * lVar53;
LAB_00186748:
          lVar38 = (long)(int)uVar21;
          piVar1 = (int *)(*local_148 * lVar53 + local_180 + -4 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar38 + -1 + lVar41 + local_358) != '\0') goto LAB_00186a45;
          local_348 = local_348 + *local_3b0 * lVar53;
          piVar1 = (int *)(local_348 + -8 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          local_398 = local_398 + lVar53 * *local_380;
          uVar13 = *(uint *)(local_398 + -8 + lVar38 * 4);
          piVar1 = (int *)(local_348 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          uVar13 = TTA::MemMerge(uVar13,*(uint *)(local_398 + lVar38 * 4));
        }
        lVar53 = *local_220;
        goto LAB_00186bc5;
      }
      piVar1 = (int *)(lVar33 + local_180 + uVar21 * 4);
      *piVar1 = *piVar1 + 1;
      uVar15 = uVar13;
      if (*(char *)(local_1f8._24_8_ + lVar28 + uVar21) == '\0') {
        uVar13 = TTA::MemNewLabel();
        piVar1 = (int *)(*local_220 * lVar44 + local_258 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)local_2d0._80_8_ * lVar44 + local_2d0._24_8_ + uVar21 * 4) = uVar13;
      }
      else {
        lVar41 = *local_220;
        piVar1 = (int *)(lVar41 * lVar53 + local_258 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = *(long *)local_2d0._80_8_;
        uVar16 = *(undefined4 *)(lVar42 * lVar53 + local_2d0._24_8_ + uVar21 * 4);
        piVar1 = (int *)(lVar41 * lVar44 + local_258 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar42 * lVar44 + local_2d0._24_8_ + uVar21 * 4) = uVar16;
      }
LAB_001850e3:
      uVar13 = uVar15 + 2;
      local_3a0 = (ulong)uVar13;
    } while ((int)uVar13 < iVar43);
  }
  local_3a0._0_4_ = uVar13;
  local_3b8 = *local_148;
  lVar44 = (long)local_3d8;
  local_390 = local_180;
  lVar38 = (long)(int)(uint)local_3a0;
  piVar1 = (int *)(local_3b8 * lVar44 + local_180 + lVar38 * 4);
  *piVar1 = *piVar1 + 1;
  lVar41 = *(long *)local_1f8._80_8_;
  cVar3 = *(char *)(lVar38 + lVar41 * lVar44 + local_1f8._24_8_);
  local_358 = local_1f8._24_8_;
  if (iVar43 < (int)(uint)local_3a0) {
    if (cVar3 == '\0') {
      piVar1 = (int *)(*local_220 * lVar44 + local_258 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar44 * *(long *)local_2d0._80_8_ + local_2d0._24_8_ + lVar38 * 4) = 0;
      goto LAB_00186fec;
    }
    local_3b8 = local_3b8 * (uVar23 - 2);
    lVar41 = lVar41 * (uVar23 - 2);
LAB_00186b36:
    piVar1 = (int *)(local_3b8 + local_390 + lVar38 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar38 + lVar41 + local_358) == '\0') {
      uVar13 = TTA::MemNewLabel();
      lVar44 = (long)local_3d8;
      lVar53 = *local_220;
LAB_00186bc5:
      piVar1 = (int *)(lVar53 * lVar44 + local_258 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(lVar44 * *(long *)local_2d0._80_8_ + local_2d0._24_8_ + lVar38 * 4) = uVar13;
      goto LAB_00186fec;
    }
    lVar53 = uVar23 - 3;
    lVar44 = *local_220;
  }
  else {
    if (cVar3 == '\0') {
LAB_00186ac6:
      lVar53 = (long)(int)(uint)local_3a0;
      piVar1 = (int *)(local_3b8 * lVar44 + local_390 + 4 + lVar53 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar53 + 1 + lVar41 * lVar44 + local_358) == '\0') {
        piVar1 = (int *)(*local_220 * lVar44 + local_258 + lVar53 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar44 * *(long *)local_2d0._80_8_ + local_2d0._24_8_ + lVar53 * 4) = 0;
        goto LAB_00186fec;
      }
      lVar53 = lVar53 + 1;
    }
    else {
      lVar53 = (long)(int)((uint)local_3a0 + 1);
    }
    local_3b8 = local_3b8 * (uVar23 - 2);
    piVar1 = (int *)(local_390 + local_3b8 + lVar53 * 4);
    *piVar1 = *piVar1 + 1;
    lVar41 = lVar41 * (uVar23 - 2);
    lVar38 = (long)(int)(uint)local_3a0;
    if (*(char *)(lVar53 + local_358 + lVar41) == '\0') goto LAB_00186b36;
    lVar44 = *local_220;
    lVar53 = (long)(iVar5 + -3);
  }
  piVar1 = (int *)(lVar44 * lVar53 + local_258 + lVar38 * 4);
  *piVar1 = *piVar1 + 1;
  lVar30 = *(long *)local_2d0._80_8_;
  uVar16 = *(undefined4 *)(lVar53 * lVar30 + local_2d0._24_8_ + lVar38 * 4);
  piVar1 = (int *)(lVar44 * local_3d8 + local_258 + lVar38 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar30 * local_3d8 + local_2d0._24_8_ + lVar38 * 4) = uVar16;
  goto LAB_00186fec;
LAB_0017f0ee:
  local_358 = *local_220;
  lVar30 = local_358 * uVar21 + local_258;
  piVar1 = (int *)(lVar24 + lVar30);
  *piVar1 = *piVar1 + 1;
  local_300 = (long *)local_2d0._80_8_;
  local_320 = *(long *)local_2d0._80_8_;
  lVar42 = local_320 * uVar21 + local_2d0._24_8_;
  uVar16 = *(undefined4 *)(lVar24 + lVar42);
  piVar1 = (int *)(lVar30 + lVar29 * 4 + 8 + lVar22 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar42 + lVar29 * 4 + 8 + lVar22 * 4) = uVar16;
  local_318 = local_258;
  local_330 = local_2d0._24_8_;
  local_308 = local_258;
  local_390 = local_2d0._24_8_;
  local_3a0 = local_258;
  local_398 = local_2d0._24_8_;
  local_360 = local_258;
  uVar49 = (ulong)(uint)(iVar51 + iVar31);
  local_340 = local_2d0._24_8_;
  local_2d8 = local_258;
  local_2e8 = local_258;
  local_2f8 = local_358;
  local_2e0 = local_320;
LAB_001803c9:
  do {
    lVar42 = (long)(int)uVar49;
    uVar40 = lVar42 + 2;
    uVar15 = (uint)uVar40;
    local_380 = (long *)local_1f8._24_8_;
    if (iVar43 <= (int)uVar15) {
      local_3c0 = *local_148;
      lVar30 = local_3c0 * uVar21 + local_180;
      piVar1 = (int *)(lVar30 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      local_3b0 = *(long **)local_1f8._80_8_;
      lVar41 = (long)local_3b0 * uVar21 + local_1f8._24_8_;
      cVar3 = *(char *)(lVar42 + 2 + lVar41);
      local_368 = (long *)local_180;
      if (iVar43 < (int)uVar15) {
        uVar56 = uVar40;
        if (cVar3 == '\0') {
LAB_0018121e:
          iVar14 = (int)uVar56;
          lVar38 = local_3c0 * (uVar21 | 1);
          piVar1 = (int *)(local_180 + lVar38 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar58 = (uVar21 | 1) * (long)local_3b0;
          if (*(char *)(uVar40 + local_1f8._24_8_ + lVar58) == '\0') {
            piVar1 = (int *)(*local_220 * uVar21 + local_258 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + uVar40 * 4) = 0;
          }
          else {
LAB_0018124c:
            lVar30 = (long)iVar14;
            piVar1 = (int *)(lVar38 + local_180 + -4 + lVar30 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar30 + -1 + lVar58 + local_1f8._24_8_) == '\0') {
              uVar15 = TTA::MemNewLabel();
              piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar30 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + lVar30 * 4) = uVar15
              ;
            }
            else {
              lVar41 = *local_220 * uVar21 + local_258;
              piVar1 = (int *)(lVar41 + -8 + lVar30 * 4);
              *piVar1 = *piVar1 + 1;
              lVar42 = *(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_;
              uVar16 = *(undefined4 *)(lVar42 + -8 + lVar30 * 4);
              piVar1 = (int *)(lVar41 + lVar30 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar42 + lVar30 * 4) = uVar16;
            }
          }
          goto LAB_0017eda8;
        }
        piVar1 = (int *)(local_3c0 * (uVar21 | 1) + local_180 + 4 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar42 + 1 + (uVar21 | 1) * (long)local_3b0 + local_1f8._24_8_) == '\0') {
LAB_00181808:
          uVar15 = (uint)uVar40;
          local_368 = (long *)local_180;
          local_380 = (long *)local_1f8._24_8_;
          goto LAB_00178ec3;
        }
        lVar41 = local_3c0 * (uVar21 - 1);
        lVar30 = (uVar21 - 1) * (long)local_3b0;
      }
      else {
        uVar56 = uVar21 | 1;
        lVar38 = local_3c0 * uVar56;
        if (cVar3 == '\0') {
          piVar1 = (int *)(local_180 + lVar38 + 8 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar58 = uVar56 * (long)local_3b0;
          plVar35 = (long *)local_180;
          uVar49 = uVar40;
          if (*(char *)(lVar42 + 2 + local_1f8._24_8_ + lVar58) == '\0') goto LAB_00179058;
          piVar1 = (int *)(lVar30 + 0xc + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar41 + 3 + lVar42) == '\0') {
LAB_0018135e:
            iVar14 = (int)uVar40;
            goto LAB_0018124c;
          }
        }
        piVar1 = (int *)(lVar38 + local_180 + 4 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        plVar35 = local_368;
        if (*(char *)(lVar42 + 1 + uVar56 * (long)local_3b0 + local_1f8._24_8_) == '\0')
        goto LAB_00178dbd;
        lVar41 = local_3c0 * (uVar21 - 1);
        piVar1 = (int *)(local_180 + lVar41 + 0xc + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar30 = (uVar21 - 1) * (long)local_3b0;
        if (*(char *)(lVar42 + 3 + local_1f8._24_8_ + lVar30) != '\0') {
          piVar1 = (int *)(local_180 + lVar41 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_1f8._24_8_ + lVar30 + lVar42) == '\0') {
            lVar30 = *local_220;
            piVar1 = (int *)(lVar30 * (uVar21 - 2) + local_258 + 8 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            lVar41 = *(long *)local_2d0._80_8_;
            uVar15 = *(uint *)((uVar21 - 2) * lVar41 + local_2d0._24_8_ + 8 + lVar42 * 4);
            piVar1 = (int *)(lVar30 * uVar21 + local_258 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar41 * uVar21 + local_2d0._24_8_ + lVar42 * 4)
                                  );
            piVar1 = (int *)(*local_220 * uVar21 + local_258 + 8 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + 8 + lVar42 * 4) =
                 uVar15;
            goto LAB_0017eda8;
          }
LAB_001806ff:
          lVar30 = uVar21 - 2;
          uVar15 = (uint)uVar40;
          lVar41 = (long)(int)uVar15;
          piVar1 = (int *)(local_3c0 * lVar30 + local_180 + -4 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar41 + -1 + (long)local_3b0 * lVar30 + local_1f8._24_8_) == '\0') {
            lVar42 = *local_220;
            piVar1 = (int *)(lVar42 * lVar30 + local_258 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            lVar38 = *(long *)local_2d0._80_8_;
            uVar15 = *(uint *)(lVar30 * lVar38 + local_2d0._24_8_ + lVar41 * 4);
            piVar1 = (int *)(lVar42 * uVar21 + local_258 + -8 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar38 * uVar21 + local_2d0._24_8_ + -8 +
                                                   lVar41 * 4));
            piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + lVar41 * 4) = uVar15;
            goto LAB_0017eda8;
          }
          lVar41 = local_3c0 * (uVar21 - 1);
          lVar30 = (uVar21 - 1) * (long)local_3b0;
          goto LAB_00180cb9;
        }
      }
      piVar1 = (int *)(local_180 + lVar41 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      uVar56 = local_200;
      if (*(char *)(lVar42 + 2 + local_1f8._24_8_ + lVar30) != '\0') goto LAB_00180f0f;
      lVar30 = *local_220 * uVar21 + local_258;
      piVar1 = (int *)(lVar30 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar41 = *(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_;
      uVar16 = *(undefined4 *)(lVar41 + lVar42 * 4);
      piVar1 = (int *)(lVar30 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar41 + 8 + lVar42 * 4) = uVar16;
      goto LAB_0017eda8;
    }
    local_3c0 = *local_148;
    lVar30 = local_3c0 * uVar21 + local_180;
    piVar1 = (int *)(lVar30 + 8 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    local_3b0 = *(long **)local_1f8._80_8_;
    lVar38 = (long)local_3b0 * uVar21 + local_1f8._24_8_;
    uVar18 = uVar21 | 1;
    uVar49 = uVar40;
    uVar56 = uVar40;
    local_208 = lVar41;
    if (*(char *)(lVar42 + 2 + lVar38) == '\0') {
      lVar26 = local_3c0 * uVar18 + local_180;
      piVar1 = (int *)(lVar26 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar58 = uVar18 * (long)local_3b0 + local_1f8._24_8_;
      if (*(char *)(lVar42 + 2 + lVar58) == '\0') goto LAB_0018170e;
      piVar1 = (int *)(lVar30 + 0xc + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar38 + 3 + lVar42) == '\0') {
        local_370 = local_2f8;
        uVar40 = uVar40 & 0xffffffff;
        local_328 = local_2e8;
        plVar32 = (long *)local_2e0;
        goto LAB_0017a89b;
      }
      piVar1 = (int *)(lVar26 + 4 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar58 + 1 + lVar42) == '\0') {
        uVar40 = uVar40 & 0xffffffff;
        lVar30 = local_180;
        goto LAB_0017940d;
      }
      lVar39 = local_3c0 * (uVar21 - 1);
      piVar1 = (int *)(local_180 + lVar39 + 0xc + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar26 = (uVar21 - 1) * (long)local_3b0;
      if (*(char *)(lVar42 + 3 + local_1f8._24_8_ + lVar26) != '\0') {
        piVar1 = (int *)(local_180 + lVar39 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(local_1f8._24_8_ + lVar26 + lVar42) != '\0') goto LAB_00180bd3;
        lVar30 = *local_220;
        piVar1 = (int *)(lVar30 * (uVar21 - 2) + local_258 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar41 = *(long *)local_2d0._80_8_;
        uVar15 = *(uint *)((uVar21 - 2) * lVar41 + local_2d0._24_8_ + 8 + lVar42 * 4);
        piVar1 = (int *)(lVar30 * uVar21 + local_258 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar41 * uVar21 + local_2d0._24_8_ + lVar42 * 4));
        piVar1 = (int *)(*local_220 * uVar21 + local_258 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar30 = *(long *)local_2d0._80_8_;
        uVar49 = uVar40 & 0xffffffff;
        local_340 = local_2d0._24_8_;
        goto LAB_0017d84e;
      }
    }
    else {
      piVar1 = (int *)(local_3c0 * uVar18 + local_180 + 4 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar42 + 1 + uVar18 * (long)local_3b0 + local_1f8._24_8_) == '\0')
      goto LAB_00178e76;
      lVar39 = local_3c0 * (uVar21 - 1);
      lVar41 = local_180 + lVar39;
      piVar1 = (int *)(lVar41 + 0xc + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar26 = (uVar21 - 1) * (long)local_3b0;
      lVar58 = local_1f8._24_8_ + lVar26;
      if (*(char *)(lVar42 + 3 + lVar58) != '\0') {
        piVar1 = (int *)(lVar41 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar58 + lVar42) == '\0') {
          lVar30 = *local_220;
          piVar1 = (int *)(lVar30 * (uVar21 - 2) + local_258 + 8 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar41 = *(long *)local_2d0._80_8_;
          uVar15 = *(uint *)((uVar21 - 2) * lVar41 + local_2d0._24_8_ + 8 + lVar42 * 4);
          piVar1 = (int *)(lVar30 * uVar21 + local_258 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar41 * uVar21 + local_2d0._24_8_ + lVar42 * 4));
          piVar1 = (int *)(*local_220 * uVar21 + local_258 + 8 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          plVar32 = *(long **)local_2d0._80_8_;
          uVar49 = uVar40 & 0xffffffff;
          local_340 = local_2d0._24_8_;
          goto LAB_0017fd0e;
        }
LAB_001804b2:
        lVar30 = uVar21 - 2;
        uVar40 = (ulong)(int)uVar49;
        piVar1 = (int *)(local_3c0 * lVar30 + local_180 + -4 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)((uVar40 - 1) + (long)local_3b0 * lVar30 + local_1f8._24_8_) == '\0') {
          lVar41 = *local_220;
          piVar1 = (int *)(lVar41 * lVar30 + local_258 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar42 = *(long *)local_2d0._80_8_;
          uVar15 = *(uint *)(lVar30 * lVar42 + local_2d0._24_8_ + uVar40 * 4);
          piVar1 = (int *)(lVar41 * uVar21 + local_258 + -8 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          uVar17 = *(uint *)(lVar42 * uVar21 + local_2d0._24_8_ + -8 + uVar40 * 4);
        }
        else {
          lVar54 = local_3c0 * (uVar21 - 1);
          lVar45 = (uVar21 - 1) * (long)local_3b0;
LAB_0017fc99:
          uVar40 = (ulong)(int)uVar49;
          piVar1 = (int *)(lVar54 + local_180 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar30 = uVar21 - 2;
          if (*(char *)(uVar40 + lVar45 + local_1f8._24_8_) != '\0') goto LAB_0017fcbc;
          piVar1 = (int *)(local_180 + local_3c0 * lVar30 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          cVar3 = *(char *)(uVar40 + local_1f8._24_8_ + (long)local_3b0 * lVar30);
          lVar41 = *local_220;
          piVar1 = (int *)(lVar41 * lVar30 + local_258 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          plVar32 = *(long **)local_2d0._80_8_;
          uVar15 = *(uint *)(lVar30 * (long)plVar32 + local_2d0._24_8_ + uVar40 * 4);
          lVar30 = local_258 + lVar41 * uVar21;
          if (cVar3 != '\0') {
            piVar1 = (int *)(lVar30 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            local_340 = local_2d0._24_8_;
            goto LAB_0017fd0e;
          }
          piVar1 = (int *)(lVar30 + -8 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          uVar17 = *(uint *)(local_2d0._24_8_ + (long)plVar32 * uVar21 + -8 + uVar40 * 4);
        }
        uVar15 = TTA::MemMerge(uVar15,uVar17);
        piVar1 = (int *)(*local_220 * uVar21 + local_258 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        plVar32 = *(long **)local_2d0._80_8_;
        local_340 = local_2d0._24_8_;
        goto LAB_0017fd0e;
      }
      piVar1 = (int *)(lVar30 + 0xc + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar38 + 3 + lVar42) == '\0') {
        piVar1 = (int *)(lVar41 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar58 + 2 + lVar42) != '\0') {
          piVar1 = (int *)(lVar41 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar58 + lVar42) != '\0') goto LAB_001822ba;
          lVar30 = *local_220;
          piVar1 = (int *)(lVar30 * (uVar21 - 2) + local_258 + 8 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar41 = *(long *)local_2d0._80_8_;
          uVar15 = *(uint *)((uVar21 - 2) * lVar41 + local_2d0._24_8_ + 8 + lVar42 * 4);
          piVar1 = (int *)(lVar30 * uVar21 + local_258 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar41 * uVar21 + local_2d0._24_8_ + lVar42 * 4));
          local_350 = local_220;
          local_370 = *local_220;
          piVar1 = (int *)(local_370 * uVar21 + local_258 + 8 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          local_300 = (long *)local_2d0._80_8_;
          plVar32 = *(long **)local_2d0._80_8_;
          local_338 = local_2d0._24_8_;
          local_318 = local_258;
          local_330 = local_2d0._24_8_;
          local_308 = local_258;
          local_390 = local_2d0._24_8_;
          local_3a0 = local_258;
          local_398 = local_2d0._24_8_;
          local_360 = local_258;
          local_340 = local_2d0._24_8_;
          local_2d8 = local_258;
          local_378 = local_2d0._24_8_;
          local_208 = local_2d0._24_8_;
          local_2e8 = local_258;
          local_348 = local_258;
          local_328 = local_258;
          uVar56 = uVar40 & 0xffffffff;
          lVar41 = local_2d0._24_8_;
          local_358 = local_370;
          local_320 = (long)plVar32;
          local_2f8 = local_370;
          local_2e0 = (long)plVar32;
          goto LAB_0017cadd;
        }
        local_370 = *local_220;
        lVar30 = local_370 * uVar21 + local_258;
        piVar1 = (int *)(lVar30 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        plVar32 = *(long **)local_2d0._80_8_;
        lVar41 = (long)plVar32 * uVar21 + local_2d0._24_8_;
        uVar16 = *(undefined4 *)(lVar41 + lVar42 * 4);
        piVar1 = (int *)(lVar30 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar41 + 8 + lVar42 * 4) = uVar16;
        goto LAB_0017c5a8;
      }
    }
    lVar39 = lVar39 + local_180;
    piVar1 = (int *)(lVar39 + 0x10 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    lVar26 = lVar26 + local_1f8._24_8_;
    if (*(char *)(lVar42 + 4 + lVar26) != '\0') {
      lVar30 = uVar21 - 2;
      lVar41 = local_3c0 * lVar30;
      piVar1 = (int *)(local_180 + lVar41 + 0xc + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar38 = (long)local_3b0 * lVar30;
      if (*(char *)(lVar42 + 3 + local_1f8._24_8_ + lVar38) == '\0') {
        piVar1 = (int *)(lVar39 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar26 + 2 + lVar42) == '\0') goto LAB_00182853;
        piVar1 = (int *)(lVar39 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar26 + lVar42) != '\0') {
LAB_001827d6:
          lVar30 = uVar21 - 2;
          iVar14 = (int)uVar49;
          lVar42 = (long)iVar14;
          piVar1 = (int *)(lVar41 + local_180 + -4 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + -1 + lVar38 + local_1f8._24_8_) == '\0') {
            lVar41 = *local_220 * lVar30 + local_258;
            lVar42 = (long)iVar14;
            piVar1 = (int *)(lVar41 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            lVar30 = lVar30 * *(long *)local_2d0._80_8_ + local_2d0._24_8_;
            uVar15 = *(uint *)(lVar30 + lVar42 * 4);
            piVar1 = (int *)(lVar41 + 8 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar30 + 8 + lVar42 * 4));
            piVar1 = (int *)(*local_220 * uVar21 + local_258 + -8 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            uVar17 = *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + -8 +
                              lVar42 * 4);
          }
          else {
            lVar41 = *local_220;
            piVar1 = (int *)(lVar41 * lVar30 + local_258 + 8 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            lVar38 = *(long *)local_2d0._80_8_;
            uVar15 = *(uint *)(lVar30 * lVar38 + local_2d0._24_8_ + 8 + lVar42 * 4);
            piVar1 = (int *)(lVar41 * uVar21 + local_258 + -8 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            uVar17 = *(uint *)(lVar38 * uVar21 + local_2d0._24_8_ + -8 + lVar42 * 4);
          }
          uVar15 = TTA::MemMerge(uVar15,uVar17);
          local_358 = *local_220;
          piVar1 = (int *)(local_358 * uVar21 + local_258 + (long)iVar14 * 4);
          *piVar1 = *piVar1 + 1;
          plVar32 = *(long **)local_2d0._80_8_;
          local_320 = (long)plVar32;
          local_300 = (long *)local_2d0._80_8_;
          lVar30 = local_258;
          lVar41 = local_2d0._24_8_;
          uVar56 = (long)iVar14;
          local_3a0 = local_258;
          local_398 = local_2d0._24_8_;
          local_390 = local_2d0._24_8_;
          local_378 = local_2d0._24_8_;
          local_360 = local_258;
          local_350 = local_220;
          local_348 = local_258;
          local_340 = local_2d0._24_8_;
          local_338 = local_2d0._24_8_;
          local_330 = local_2d0._24_8_;
          local_318 = local_258;
          local_308 = local_258;
          goto LAB_0017dcb5;
        }
        lVar41 = *local_220 * lVar30 + local_258;
        piVar1 = (int *)(lVar41 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar30 = lVar30 * *(long *)local_2d0._80_8_ + local_2d0._24_8_;
        uVar15 = *(uint *)(lVar30 + 8 + lVar42 * 4);
        piVar1 = (int *)(lVar41 + 0x10 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar30 + 0x10 + lVar42 * 4));
        piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar17 = *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + lVar42 * 4);
      }
      else {
        piVar1 = (int *)(lVar39 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar26 + lVar42) != '\0') {
LAB_001816a5:
          uVar40 = uVar56 & 0xffffffff;
          uVar56 = (ulong)(int)uVar56;
          piVar1 = (int *)(lVar41 + local_180 + -4 + uVar56 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)((uVar56 - 1) + lVar38 + local_1f8._24_8_) == '\0') {
            lVar30 = *local_220;
            piVar1 = (int *)(lVar30 * (uVar21 - 2) + local_258 + 8 + uVar56 * 4);
            *piVar1 = *piVar1 + 1;
            lVar41 = *(long *)local_2d0._80_8_;
            uVar15 = *(uint *)((uVar21 - 2) * lVar41 + local_2d0._24_8_ + 8 + uVar56 * 4);
            piVar1 = (int *)(lVar30 * uVar21 + local_258 + -8 + uVar56 * 4);
            *piVar1 = *piVar1 + 1;
            uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar41 * uVar21 + local_2d0._24_8_ + -8 +
                                                   uVar56 * 4));
            local_358 = *local_220;
            piVar1 = (int *)(local_358 * uVar21 + local_258 + uVar56 * 4);
            *piVar1 = *piVar1 + 1;
            plVar32 = *(long **)local_2d0._80_8_;
            uVar49 = uVar40;
            local_320 = (long)plVar32;
            local_300 = (long *)local_2d0._80_8_;
            lVar30 = local_258;
            lVar41 = local_2d0._24_8_;
            local_3a0 = local_258;
            local_398 = local_2d0._24_8_;
            local_390 = local_2d0._24_8_;
            local_378 = local_2d0._24_8_;
            local_360 = local_258;
            local_350 = local_220;
            local_348 = local_258;
            local_340 = local_2d0._24_8_;
            local_338 = local_2d0._24_8_;
            local_330 = local_2d0._24_8_;
            local_318 = local_258;
            local_308 = local_258;
          }
          else {
LAB_00180139:
            uVar56 = (ulong)(int)uVar40;
            piVar1 = (int *)(local_3c0 * (uVar21 - 1) + local_180 + uVar56 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = uVar21 - 2;
            local_338 = local_2d0._24_8_;
            uVar49 = uVar40;
            local_200 = uVar40;
            local_378 = local_2d0._24_8_;
            local_390 = local_2d0._24_8_;
            local_340 = local_2d0._24_8_;
            local_348 = local_258;
            local_3a0 = local_258;
            local_360 = local_258;
            local_300 = (long *)local_2d0._80_8_;
            lVar30 = local_258;
            lVar41 = local_2d0._24_8_;
            local_398 = local_2d0._24_8_;
            local_350 = local_220;
            local_330 = local_2d0._24_8_;
            local_318 = local_258;
            local_308 = local_258;
            if (*(char *)(uVar56 + (uVar21 - 1) * (long)local_3b0 + local_1f8._24_8_) == '\0') {
              piVar1 = (int *)(local_180 + local_3c0 * lVar42 + uVar56 * 4);
              *piVar1 = *piVar1 + 1;
              cVar3 = *(char *)(uVar56 + local_1f8._24_8_ + (long)local_3b0 * lVar42);
              local_358 = *local_220;
              piVar1 = (int *)(local_358 * lVar42 + local_258 + 8 + uVar56 * 4);
              *piVar1 = *piVar1 + 1;
              plVar32 = *(long **)local_2d0._80_8_;
              uVar15 = *(uint *)(lVar42 * (long)plVar32 + local_2d0._24_8_ + 8 + uVar56 * 4);
              if (cVar3 == '\0') {
                piVar1 = (int *)(local_258 + local_358 * uVar21 + -8 + uVar56 * 4);
                *piVar1 = *piVar1 + 1;
                uVar15 = TTA::MemMerge(uVar15,*(uint *)(local_2d0._24_8_ + (long)plVar32 * uVar21 +
                                                        -8 + uVar56 * 4));
                local_358 = *local_220;
                piVar1 = (int *)(local_358 * uVar21 + local_258 + uVar56 * 4);
                *piVar1 = *piVar1 + 1;
                plVar32 = *(long **)local_2d0._80_8_;
                uVar49 = local_200;
                local_320 = (long)plVar32;
                local_300 = (long *)local_2d0._80_8_;
                lVar30 = local_258;
                lVar41 = local_2d0._24_8_;
                local_3a0 = local_258;
                local_398 = local_2d0._24_8_;
                local_390 = local_2d0._24_8_;
                local_378 = local_2d0._24_8_;
                local_360 = local_258;
                local_350 = local_220;
                local_348 = local_258;
                local_340 = local_2d0._24_8_;
                local_338 = local_2d0._24_8_;
                local_330 = local_2d0._24_8_;
                local_318 = local_258;
                local_308 = local_258;
              }
              else {
                piVar1 = (int *)(local_358 * uVar21 + local_258 + uVar56 * 4);
                *piVar1 = *piVar1 + 1;
                local_320 = (long)plVar32;
              }
            }
            else {
              local_358 = *local_220;
              piVar1 = (int *)(local_358 * lVar42 + local_258 + 8 + uVar56 * 4);
              *piVar1 = *piVar1 + 1;
              plVar32 = *(long **)local_2d0._80_8_;
              uVar15 = *(uint *)(lVar42 * (long)plVar32 + local_2d0._24_8_ + 8 + uVar56 * 4);
              piVar1 = (int *)(local_358 * uVar21 + local_258 + uVar56 * 4);
              *piVar1 = *piVar1 + 1;
              local_320 = (long)plVar32;
            }
          }
          goto LAB_0017dcb5;
        }
LAB_00182853:
        lVar41 = *local_220;
        piVar1 = (int *)(lVar41 * lVar30 + local_258 + 0x10 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar38 = *(long *)local_2d0._80_8_;
        uVar15 = *(uint *)(lVar30 * lVar38 + local_2d0._24_8_ + 0x10 + lVar42 * 4);
        piVar1 = (int *)(lVar41 * uVar21 + local_258 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar17 = *(uint *)(lVar38 * uVar21 + local_2d0._24_8_ + lVar42 * 4);
      }
LAB_001828a7:
      uVar15 = TTA::MemMerge(uVar15,uVar17);
      local_358 = *local_220;
      piVar1 = (int *)(local_358 * uVar21 + local_258 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      plVar32 = *(long **)local_2d0._80_8_;
      uVar49 = uVar40 & 0xffffffff;
      local_320 = (long)plVar32;
      local_300 = (long *)local_2d0._80_8_;
      lVar30 = local_258;
      lVar41 = local_2d0._24_8_;
      uVar56 = uVar40;
      local_3a0 = local_258;
      local_398 = local_2d0._24_8_;
      local_390 = local_2d0._24_8_;
      local_378 = local_2d0._24_8_;
      local_360 = local_258;
      local_350 = local_220;
      local_348 = local_258;
      local_340 = local_2d0._24_8_;
      local_338 = local_2d0._24_8_;
      local_330 = local_2d0._24_8_;
      local_318 = local_258;
      local_308 = local_258;
      goto LAB_0017dcb5;
    }
    piVar1 = (int *)(lVar39 + 8 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar26 + 2 + lVar42) == '\0') {
      local_358 = *local_220;
      lVar30 = local_358 * uVar21 + local_258;
      piVar1 = (int *)(lVar30 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      local_320 = *(long *)local_2d0._80_8_;
      lVar41 = local_320 * uVar21 + local_2d0._24_8_;
      uVar16 = *(undefined4 *)(lVar41 + lVar42 * 4);
      piVar1 = (int *)(lVar30 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar41 + 8 + lVar42 * 4) = uVar16;
      uVar49 = uVar40 & 0xffffffff;
      local_300 = (long *)local_2d0._80_8_;
      lVar41 = local_2d0._24_8_;
      local_3a0 = local_258;
      local_398 = local_2d0._24_8_;
      local_390 = local_2d0._24_8_;
      local_378 = local_2d0._24_8_;
      local_360 = local_258;
      local_350 = local_220;
      local_348 = local_258;
      local_340 = local_2d0._24_8_;
      local_338 = local_2d0._24_8_;
      local_330 = local_2d0._24_8_;
      local_318 = local_258;
      local_308 = local_258;
      local_2f8 = local_358;
      local_2e8 = local_258;
      local_2e0 = local_320;
      local_2d8 = local_258;
      goto LAB_0017d0c9;
    }
    piVar1 = (int *)(lVar39 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar26 + lVar42) == '\0') {
      lVar30 = *local_220;
      piVar1 = (int *)(lVar30 * (uVar21 - 2) + local_258 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar41 = *(long *)local_2d0._80_8_;
      uVar15 = *(uint *)((uVar21 - 2) * lVar41 + local_2d0._24_8_ + 8 + lVar42 * 4);
      piVar1 = (int *)(lVar30 * uVar21 + local_258 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar41 * uVar21 + local_2d0._24_8_ + lVar42 * 4));
      piVar1 = (int *)(*local_220 * uVar21 + local_258 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      plVar32 = *(long **)local_2d0._80_8_;
      uVar49 = uVar40 & 0xffffffff;
      goto LAB_0017b45d;
    }
LAB_0018243f:
    uVar49 = uVar40 & 0xffffffff;
    lVar30 = uVar21 - 2;
    uVar56 = (ulong)(int)uVar40;
    piVar1 = (int *)(local_3c0 * lVar30 + local_180 + -4 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    cVar3 = *(char *)((uVar56 - 1) + (long)local_3b0 * lVar30 + local_1f8._24_8_);
    lVar41 = *local_220;
    piVar1 = (int *)(lVar41 * lVar30 + local_258 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    plVar32 = *(long **)local_2d0._80_8_;
    uVar15 = *(uint *)(lVar30 * (long)plVar32 + local_2d0._24_8_ + uVar56 * 4);
    if (cVar3 == '\0') {
      piVar1 = (int *)(local_258 + lVar41 * uVar21 + -8 + uVar56 * 4);
      *piVar1 = *piVar1 + 1;
      uVar15 = TTA::MemMerge(uVar15,*(uint *)(local_2d0._24_8_ + (long)plVar32 * uVar21 + -8 +
                                             uVar56 * 4));
      piVar1 = (int *)(*local_220 * uVar21 + local_258 + uVar56 * 4);
      *piVar1 = *piVar1 + 1;
      plVar32 = *(long **)local_2d0._80_8_;
      lVar41 = local_2d0._24_8_;
      local_3a0 = local_258;
      local_398 = local_2d0._24_8_;
      local_390 = local_2d0._24_8_;
      local_378 = local_2d0._24_8_;
      local_360 = local_258;
      local_350 = local_220;
      local_348 = local_258;
      local_340 = local_2d0._24_8_;
      local_338 = local_2d0._24_8_;
      local_330 = local_2d0._24_8_;
      local_318 = local_258;
      local_308 = local_258;
      local_300 = (long *)local_2d0._80_8_;
      local_2d8 = local_258;
    }
    else {
      piVar1 = (int *)(lVar41 * uVar21 + local_258 + uVar56 * 4);
      *piVar1 = *piVar1 + 1;
      lVar41 = local_2d0._24_8_;
      local_3a0 = local_258;
      local_398 = local_2d0._24_8_;
      local_390 = local_2d0._24_8_;
      local_378 = local_2d0._24_8_;
      local_360 = local_258;
      local_350 = local_220;
      local_348 = local_258;
      local_340 = local_2d0._24_8_;
      local_338 = local_2d0._24_8_;
      local_330 = local_2d0._24_8_;
      local_318 = local_258;
      local_308 = local_258;
      local_300 = (long *)local_2d0._80_8_;
      local_2d8 = local_258;
    }
LAB_0017b471:
    *(uint *)((long)plVar32 * uVar21 + lVar41 + uVar56 * 4) = uVar15;
    lVar42 = (long)(int)uVar49;
    uVar40 = lVar42 + 2;
    if (iVar43 <= (int)uVar40) {
      if (iVar43 < (int)uVar40) {
LAB_0017d222:
        uVar15 = (uint)uVar40;
        goto LAB_0017eb12;
      }
      local_3c0 = *local_148;
      lVar30 = local_3c0 * uVar21;
      piVar1 = (int *)(local_180 + lVar30 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      local_3b0 = *(long **)local_1f8._80_8_;
      lVar38 = (long)local_3b0 * uVar21;
      if (*(char *)(lVar42 + 2 + local_1f8._24_8_ + lVar38) == '\0') {
        piVar1 = (int *)(local_3c0 * (uVar21 | 1) + local_180 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar56 = local_200;
        if (*(char *)(lVar42 + 2 + (uVar21 | 1) * (long)local_3b0 + local_1f8._24_8_) == '\0')
        goto LAB_0017f38c;
        piVar1 = (int *)(local_180 + lVar30 + 0xc + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(local_1f8._24_8_ + lVar38 + 3 + lVar42) == '\0') {
          local_318 = local_318 + *local_350 * uVar21;
          piVar1 = (int *)(local_318 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          local_338 = local_338 + *local_300 * uVar21;
          uVar16 = *(undefined4 *)(local_338 + lVar42 * 4);
          piVar1 = (int *)(local_318 + 8 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_338 + 8 + lVar42 * 4) = uVar16;
          goto LAB_0017eda8;
        }
        lVar30 = lVar42 + 3;
      }
      else {
        lVar30 = (long)((int)uVar49 + 3);
      }
      piVar1 = (int *)(local_3c0 * (uVar21 - 1) + local_180 + lVar30 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar30 + (uVar21 - 1) * (long)local_3b0 + local_1f8._24_8_) == '\0') {
        local_318 = local_318 + *local_350 * uVar21;
        piVar1 = (int *)(local_318 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        local_338 = local_338 + *local_300 * uVar21;
        uVar16 = *(undefined4 *)(local_338 + lVar42 * 4);
        piVar1 = (int *)(local_318 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_338 + 8 + lVar42 * 4) = uVar16;
      }
      else {
        lVar30 = uVar21 - 2;
        piVar1 = (int *)(local_3c0 * lVar30 + local_180 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar42 + 2 + (long)local_3b0 * lVar30 + local_1f8._24_8_) != '\0')
        goto LAB_00180f2c;
        lVar41 = *local_350;
        piVar1 = (int *)(lVar41 * lVar30 + local_318 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar38 = *local_300;
        uVar15 = *(uint *)(lVar30 * lVar38 + local_338 + 8 + lVar42 * 4);
        piVar1 = (int *)(lVar41 * uVar21 + local_318 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar38 * uVar21 + local_338 + lVar42 * 4));
        piVar1 = (int *)(*local_220 * uVar21 + local_258 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + 8 + lVar42 * 4) = uVar15;
      }
      goto LAB_0017eda8;
    }
    local_3c0 = *local_148;
    lVar30 = local_3c0 * uVar21 + local_180;
    piVar1 = (int *)(lVar30 + 8 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    local_3b0 = *(long **)local_1f8._80_8_;
    lVar41 = (long)local_3b0 * uVar21 + local_1f8._24_8_;
    uVar49 = uVar40;
    if (*(char *)(lVar42 + 2 + lVar41) != '\0') {
      lVar58 = local_3c0 * (uVar21 - 1);
      piVar1 = (int *)(local_180 + lVar58 + 0xc + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar38 = (uVar21 - 1) * (long)local_3b0;
      if (*(char *)(lVar42 + 3 + local_1f8._24_8_ + lVar38) != '\0') {
        lVar41 = uVar21 - 2;
        local_3c0 = local_3c0 * lVar41;
        piVar1 = (int *)(local_180 + local_3c0 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar30 = (long)local_3b0 * lVar41;
        if (*(char *)(lVar42 + 2 + local_1f8._24_8_ + lVar30) != '\0') goto LAB_0017b555;
        lVar30 = *local_350;
        piVar1 = (int *)(lVar30 * lVar41 + local_318 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar38 = *local_300;
        uVar15 = *(uint *)(lVar41 * lVar38 + local_338 + 8 + lVar42 * 4);
        piVar1 = (int *)(lVar30 * uVar21 + local_318 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar38 * uVar21 + local_338 + lVar42 * 4));
        piVar1 = (int *)(*local_220 * uVar21 + local_258 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        plVar32 = *(long **)local_2d0._80_8_;
        uVar49 = uVar40 & 0xffffffff;
        local_340 = local_2d0._24_8_;
        goto LAB_0017fd0e;
      }
      piVar1 = (int *)(lVar30 + 0xc + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar41 + 3 + lVar42) == '\0') {
        piVar1 = (int *)(local_318 + *local_350 * uVar21 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar16 = *(undefined4 *)(local_338 + *local_300 * uVar21 + lVar42 * 4);
        local_358 = *local_350;
        piVar1 = (int *)(local_358 * uVar21 + local_348 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        local_320 = *local_300;
        *(undefined4 *)(local_320 * uVar21 + local_378 + 8 + lVar42 * 4) = uVar16;
        local_318 = local_348;
        local_330 = local_378;
        local_308 = local_348;
        local_390 = local_378;
        local_3a0 = local_348;
        local_398 = local_378;
        local_360 = local_348;
        local_340 = local_378;
        local_2d8 = local_348;
        uVar49 = uVar40 & 0xffffffff;
        local_2e8 = local_348;
        local_338 = local_378;
        lVar41 = local_378;
        local_2f8 = local_358;
        local_2e0 = local_320;
        goto LAB_001803c9;
      }
      goto LAB_0017b7e4;
    }
    piVar1 = (int *)(local_3c0 * (uVar21 | 1) + local_180 + 8 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar42 + 2 + (uVar21 | 1) * (long)local_3b0 + local_1f8._24_8_) == '\0')
    goto LAB_0017d43c;
    piVar1 = (int *)(lVar30 + 0xc + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar41 + 3 + lVar42) == '\0') {
      local_2f8 = *local_220;
      lVar30 = local_2f8 * uVar21 + local_258;
      piVar1 = (int *)(lVar30 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      plVar32 = *(long **)local_2d0._80_8_;
      lVar41 = (long)plVar32 * uVar21 + local_2d0._24_8_;
      uVar16 = *(undefined4 *)(lVar41 + lVar42 * 4);
      piVar1 = (int *)(lVar30 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar41 + 8 + lVar42 * 4) = uVar16;
      uVar40 = uVar40 & 0xffffffff;
      goto LAB_001793d0;
    }
    lVar58 = local_3c0 * (uVar21 - 1);
    piVar1 = (int *)(local_180 + lVar58 + 0xc + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    lVar38 = (uVar21 - 1) * (long)local_3b0;
    if (*(char *)(lVar42 + 3 + local_1f8._24_8_ + lVar38) == '\0') {
LAB_0017b7e4:
      piVar1 = (int *)(lVar58 + local_180 + 0x10 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar42 + 4 + lVar38 + local_1f8._24_8_) == '\0') {
        local_348 = local_348 + *local_350 * uVar21;
        piVar1 = (int *)(local_348 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        local_378 = local_378 + *local_300 * uVar21;
        uVar16 = *(undefined4 *)(local_378 + lVar42 * 4);
        piVar1 = (int *)(local_348 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_378 + 8 + lVar42 * 4) = uVar16;
        local_200 = uVar40 & 0xffffffff;
        goto LAB_0017e88d;
      }
      lVar30 = uVar21 - 2;
      lVar41 = local_3c0 * lVar30;
      piVar1 = (int *)(lVar41 + local_180 + 0xc + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar58 = (long)local_3b0 * lVar30;
      if ((*(char *)(lVar42 + 3 + local_1f8._24_8_ + lVar58) != '\0') &&
         (piVar1 = (int *)(lVar41 + local_180 + 8 + lVar42 * 4), *piVar1 = *piVar1 + 1,
         *(char *)(local_1f8._24_8_ + lVar58 + 2 + lVar42) != '\0')) goto LAB_0017ef18;
      lVar41 = *local_350;
      piVar1 = (int *)(lVar41 * lVar30 + local_348 + 0x10 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar38 = *local_300;
      uVar15 = *(uint *)(lVar30 * lVar38 + local_378 + 0x10 + lVar42 * 4);
      piVar1 = (int *)(lVar41 * uVar21 + local_348 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar38 * uVar21 + local_378 + lVar42 * 4));
      local_358 = *local_220;
      piVar1 = (int *)(local_358 * uVar21 + local_258 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      plVar32 = *(long **)local_2d0._80_8_;
      uVar49 = uVar40 & 0xffffffff;
      local_320 = (long)plVar32;
      local_300 = (long *)local_2d0._80_8_;
      lVar30 = local_258;
      lVar41 = local_2d0._24_8_;
      uVar56 = uVar40;
      local_3a0 = local_258;
      local_398 = local_2d0._24_8_;
      local_390 = local_2d0._24_8_;
      local_378 = local_2d0._24_8_;
      local_360 = local_258;
      local_350 = local_220;
      local_348 = local_258;
      local_340 = local_2d0._24_8_;
      local_338 = local_2d0._24_8_;
      local_330 = local_2d0._24_8_;
      local_318 = local_258;
      local_308 = local_258;
      goto LAB_0017dcb5;
    }
    lVar41 = uVar21 - 2;
    local_3c0 = local_3c0 * lVar41;
    piVar1 = (int *)(local_3c0 + local_180 + 8 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    lVar30 = (long)local_3b0 * lVar41;
    if (*(char *)(lVar42 + 2 + local_1f8._24_8_ + lVar30) == '\0') {
      lVar30 = *local_350;
      piVar1 = (int *)(lVar30 * lVar41 + local_348 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar38 = *local_300;
      uVar15 = *(uint *)(lVar41 * lVar38 + local_378 + 8 + lVar42 * 4);
      piVar1 = (int *)(lVar30 * uVar21 + local_348 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      uVar17 = *(uint *)(lVar38 * uVar21 + local_378 + lVar42 * 4);
      goto LAB_0017d3f3;
    }
LAB_0017f564:
    uVar40 = uVar49 & 0xffffffff;
    uVar56 = (ulong)(int)uVar49;
    piVar1 = (int *)(local_3c0 + local_180 + -4 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    cVar3 = *(char *)((uVar56 - 1) + lVar30 + local_1f8._24_8_);
    local_2d8 = *local_220;
    piVar1 = (int *)(local_2d8 * (uVar21 - 2) + local_258 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    lVar30 = *(long *)local_2d0._80_8_;
    uVar15 = *(uint *)((uVar21 - 2) * lVar30 + local_2d0._24_8_ + uVar56 * 4);
    uVar49 = uVar40;
    if (cVar3 == '\0') goto LAB_001814d4;
LAB_0017f5c7:
    local_2d8 = local_2d8 * uVar21;
    lVar41 = local_258;
    local_340 = local_2d0._24_8_;
LAB_0017d847:
    piVar1 = (int *)(lVar41 + local_2d8 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    uVar40 = uVar56;
LAB_0017d84e:
    *(uint *)(lVar30 * uVar21 + local_340 + uVar40 * 4) = uVar15;
    lVar41 = (long)(int)uVar49;
    uVar15 = (int)uVar49 + 2;
    uVar40 = (ulong)uVar15;
    local_380 = (long *)local_1f8._24_8_;
    if (iVar43 <= (int)uVar15) {
      if (iVar43 < (int)uVar15) goto LAB_0017eb12;
      local_3c0 = *local_148;
      lVar30 = local_3c0 * uVar21 + local_180;
      piVar1 = (int *)(lVar30 + 8 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      local_3b0 = *(long **)local_1f8._80_8_;
      lVar42 = (long)local_3b0 * uVar21 + local_1f8._24_8_;
      if (*(char *)(lVar41 + 2 + lVar42) != '\0') goto LAB_00180c81;
      piVar1 = (int *)(local_3c0 * (uVar21 | 1) + local_180 + 8 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar41 + 2 + (uVar21 | 1) * (long)local_3b0 + local_1f8._24_8_) == '\0') {
        plVar35 = (long *)local_180;
        uVar49 = (ulong)uVar15;
        goto LAB_00179058;
      }
      piVar1 = (int *)(lVar30 + 0xc + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar42 + 3 + lVar41) != '\0') goto LAB_00180c81;
      lVar30 = *local_220 * uVar21 + local_258;
      piVar1 = (int *)(lVar30 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      lVar42 = *(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_;
      uVar16 = *(undefined4 *)(lVar42 + lVar41 * 4);
      piVar1 = (int *)(lVar30 + 8 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar42 + 8 + lVar41 * 4) = uVar16;
      goto LAB_0017eda8;
    }
    local_3c0 = *local_148;
    lVar42 = local_3c0 * uVar21 + local_180;
    piVar1 = (int *)(lVar42 + 8 + lVar41 * 4);
    *piVar1 = *piVar1 + 1;
    local_3b0 = *(long **)local_1f8._80_8_;
    lVar38 = (long)local_3b0 * uVar21 + local_1f8._24_8_;
    uVar49 = uVar40;
    if (*(char *)(lVar41 + 2 + lVar38) == '\0') {
      piVar1 = (int *)(local_3c0 * (uVar21 | 1) + local_180 + 8 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      lVar30 = local_180;
      if (*(char *)(lVar41 + 2 + (uVar21 | 1) * (long)local_3b0 + local_1f8._24_8_) == '\0')
      goto LAB_001793e5;
      piVar1 = (int *)(lVar42 + 0xc + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar38 + 3 + lVar41) == '\0') goto LAB_0017dba4;
LAB_001808f0:
      lVar54 = local_3c0 * (uVar21 - 1);
      piVar1 = (int *)(local_180 + lVar54 + 4 + (long)(int)uVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar45 = (uVar21 - 1) * (long)local_3b0;
      if (*(char *)((long)(int)uVar40 + 1 + local_1f8._24_8_ + lVar45) != '\0') goto LAB_00180c18;
      break;
    }
LAB_0017fc70:
    lVar30 = (long)(int)uVar49;
    lVar54 = local_3c0 * (uVar21 - 1);
    piVar1 = (int *)(local_180 + lVar54 + 4 + lVar30 * 4);
    *piVar1 = *piVar1 + 1;
    lVar45 = (uVar21 - 1) * (long)local_3b0;
    if (*(char *)(lVar30 + 1 + local_1f8._24_8_ + lVar45) != '\0') goto LAB_0017fc99;
    piVar1 = (int *)(local_3c0 * uVar21 + local_180 + 4 + lVar30 * 4);
    *piVar1 = *piVar1 + 1;
    uVar40 = uVar49;
    if (*(char *)(lVar30 + 1 + (long)local_3b0 * uVar21 + local_1f8._24_8_) != '\0') break;
    local_350 = local_220;
    local_358 = *local_220;
    lVar41 = local_358 * uVar21 + local_258;
    piVar1 = (int *)(lVar41 + -8 + lVar30 * 4);
    *piVar1 = *piVar1 + 1;
    local_300 = (long *)local_2d0._80_8_;
    local_320 = *(long *)local_2d0._80_8_;
    lVar42 = local_320 * uVar21 + local_2d0._24_8_;
    uVar16 = *(undefined4 *)(lVar42 + -8 + lVar30 * 4);
    piVar1 = (int *)(lVar41 + lVar30 * 4);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar42 + lVar30 * 4) = uVar16;
    local_318 = local_258;
    local_330 = local_2d0._24_8_;
    local_308 = local_258;
    local_390 = local_2d0._24_8_;
    local_3a0 = local_258;
    local_398 = local_2d0._24_8_;
    local_360 = local_258;
    local_340 = local_2d0._24_8_;
    local_2d8 = local_258;
    local_378 = local_2d0._24_8_;
    local_348 = local_258;
    local_2e8 = local_258;
    local_338 = local_2d0._24_8_;
    lVar41 = local_2d0._24_8_;
    local_2f8 = local_358;
    local_2e0 = local_320;
  } while( true );
  lVar30 = (long)(int)uVar40;
  piVar1 = (int *)(lVar54 + local_180 + 8 + lVar30 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar30 + 2 + lVar45 + local_1f8._24_8_) != '\0') goto LAB_00180111;
  lVar41 = *local_220 * uVar21 + local_258;
  piVar1 = (int *)(lVar41 + -8 + lVar30 * 4);
  *piVar1 = *piVar1 + 1;
  lVar42 = *(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_;
  uVar16 = *(undefined4 *)(lVar42 + -8 + lVar30 * 4);
  piVar1 = (int *)(lVar41 + lVar30 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar42 + lVar30 * 4) = uVar16;
  local_200 = uVar40;
  goto LAB_0017e88d;
LAB_00180111:
  lVar30 = uVar21 - 2;
  uVar56 = (ulong)(int)uVar40;
  piVar1 = (int *)(local_3c0 * lVar30 + local_180 + 4 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(uVar56 + 1 + (long)local_3b0 * lVar30 + local_1f8._24_8_) != '\0')
  goto LAB_00180139;
  lVar41 = *local_220;
  piVar1 = (int *)(lVar41 * lVar30 + local_258 + 8 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  lVar42 = *(long *)local_2d0._80_8_;
  uVar15 = *(uint *)(lVar30 * lVar42 + local_2d0._24_8_ + 8 + uVar56 * 4);
  piVar1 = (int *)(lVar41 * uVar21 + local_258 + -8 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar42 * uVar21 + local_2d0._24_8_ + -8 + uVar56 * 4));
  local_358 = *local_220;
  piVar1 = (int *)(local_358 * uVar21 + local_258 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  plVar32 = *(long **)local_2d0._80_8_;
  uVar49 = uVar40;
  local_320 = (long)plVar32;
  local_300 = (long *)local_2d0._80_8_;
  lVar30 = local_258;
  lVar41 = local_2d0._24_8_;
  local_3a0 = local_258;
  local_398 = local_2d0._24_8_;
  local_390 = local_2d0._24_8_;
  local_378 = local_2d0._24_8_;
  local_360 = local_258;
  local_350 = local_220;
  local_348 = local_258;
  local_340 = local_2d0._24_8_;
  local_338 = local_2d0._24_8_;
  local_330 = local_2d0._24_8_;
  local_318 = local_258;
  local_308 = local_258;
  goto LAB_0017dcb5;
LAB_0017dba4:
  local_3a0 = local_258;
  local_350 = local_220;
  local_370 = *local_220;
  lVar30 = local_370 * uVar21 + local_258;
  piVar1 = (int *)(lVar30 + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  local_398 = local_2d0._24_8_;
  local_300 = (long *)local_2d0._80_8_;
  plVar32 = *(long **)local_2d0._80_8_;
  lVar42 = (long)plVar32 * uVar21 + local_2d0._24_8_;
  uVar16 = *(undefined4 *)(lVar42 + lVar41 * 4);
  piVar1 = (int *)(lVar30 + 8 + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar42 + 8 + lVar41 * 4) = uVar16;
  local_328 = local_258;
  local_320 = (long)plVar32;
  lVar41 = local_2d0._24_8_;
  local_338 = local_2d0._24_8_;
  local_390 = local_398;
  local_378 = local_398;
  local_360 = local_3a0;
  local_358 = local_370;
  local_348 = local_3a0;
  local_340 = local_398;
  local_330 = local_398;
  local_318 = local_3a0;
  local_308 = local_3a0;
  local_2f8 = local_370;
  local_2e8 = local_3a0;
  local_2e0 = (long)plVar32;
  local_2d8 = local_3a0;
  local_208 = local_398;
LAB_0017a9e7:
  lVar42 = (long)(int)uVar40;
  uVar40 = lVar42 + 2;
  uVar15 = (uint)uVar40;
  local_380 = (long *)local_1f8._24_8_;
  if (iVar43 <= (int)uVar15) {
    local_3c0 = *local_148;
    local_368 = (long *)local_180;
    piVar1 = (int *)(local_3c0 * uVar21 + local_180 + 8 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    local_3b0 = *(long **)local_1f8._80_8_;
    cVar3 = *(char *)(lVar42 + 2 + (long)local_3b0 * uVar21 + local_1f8._24_8_);
    local_320 = (long)plVar32;
    if (iVar43 < (int)uVar15) {
      if (cVar3 == '\0') {
        uVar56 = uVar40 & 0xffffffff;
        goto LAB_0018121e;
      }
      piVar1 = (int *)(local_3c0 * (uVar21 | 1) + local_180 + 4 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar42 + 1 + (uVar21 | 1) * (long)local_3b0 + local_1f8._24_8_) == '\0') {
LAB_0017bd5c:
        lVar30 = local_3c0 * (uVar21 - 1) + (long)local_368;
        piVar1 = (int *)(lVar30 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = (long)local_3b0 * (uVar21 - 1) + (long)local_380;
        if (*(char *)(uVar40 + lVar42) == '\0') {
          lVar38 = (long)(int)uVar15;
          piVar1 = (int *)(lVar30 + -4 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + -1 + lVar38) == '\0') {
            uVar15 = TTA::MemNewLabel();
            piVar1 = (int *)(*local_220 * uVar21 + local_258 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + uVar40 * 4) = uVar15;
          }
          else {
            piVar1 = (int *)(local_370 * (uVar21 - 2) + local_328 + -8 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            uVar16 = *(undefined4 *)((uVar21 - 2) * local_320 + lVar41 + -8 + lVar38 * 4);
            piVar1 = (int *)(local_370 * uVar21 + local_328 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_320 * uVar21 + lVar41 + uVar40 * 4) = uVar16;
          }
        }
        else {
          piVar1 = (int *)(local_370 * (uVar21 - 2) + local_328 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          uVar16 = *(undefined4 *)((uVar21 - 2) * local_320 + lVar41 + uVar40 * 4);
          piVar1 = (int *)(local_370 * uVar21 + local_328 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_320 * uVar21 + lVar41 + uVar40 * 4) = uVar16;
        }
        goto LAB_0017eda8;
      }
LAB_0017ad45:
      lVar38 = (long)(int)uVar40;
      local_3c0 = local_3c0 * (uVar21 - 1);
      piVar1 = (int *)(local_180 + local_3c0 + -4 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      lVar30 = (long)local_3b0 * (uVar21 - 1);
      if (*(char *)(lVar38 + -1 + local_1f8._24_8_ + lVar30) != '\0') {
        piVar1 = (int *)(local_370 * (uVar21 - 2) + local_328 + -8 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        uVar15 = *(uint *)((uVar21 - 2) * (long)plVar32 + lVar41 + -8 + lVar38 * 4);
        piVar1 = (int *)(local_370 * uVar21 + local_328 + -8 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        uVar15 = TTA::MemMerge(uVar15,*(uint *)((long)plVar32 * uVar21 + lVar41 + -8 + lVar38 * 4));
        goto LAB_0017adc6;
      }
      uVar40 = uVar40 & 0xffffffff;
      local_340 = lVar41;
LAB_0017b11e:
      iVar14 = (int)uVar40;
      local_368 = plVar32;
LAB_0017b237:
      lVar42 = (long)iVar14;
      piVar1 = (int *)(local_3c0 + local_180 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar42 + lVar30 + local_1f8._24_8_) == '\0') {
        local_328 = local_328 + local_370 * uVar21;
        piVar1 = (int *)(local_328 + -8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        local_340 = local_340 + (long)local_368 * uVar21;
        uVar16 = *(undefined4 *)(local_340 + -8 + lVar42 * 4);
        piVar1 = (int *)(local_328 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_340 + lVar42 * 4) = uVar16;
        goto LAB_0017eda8;
      }
    }
    else {
      if (cVar3 != '\0') {
        piVar1 = (int *)(local_3c0 * (uVar21 | 1) + local_180 + 4 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar42 + 1 + (uVar21 | 1) * (long)local_3b0 + local_1f8._24_8_) == '\0') {
LAB_0017af2f:
          uVar15 = (uint)uVar40;
          uVar40 = (ulong)(int)uVar15;
          lVar42 = local_3c0 * (uVar21 - 1) + (long)local_368;
          piVar1 = (int *)(lVar42 + 4 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar30 = (uVar21 - 1) * (long)local_3b0 + (long)local_380;
          if (*(char *)(uVar40 + 1 + lVar30) == '\0') goto LAB_0017bd5c;
          piVar1 = (int *)(lVar42 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          if ((*(char *)(lVar30 + uVar40) == '\0') &&
             (piVar1 = (int *)(lVar42 + -4 + (long)(int)uVar15 * 4), *piVar1 = *piVar1 + 1,
             *(char *)(lVar30 + -1 + (long)(int)uVar15) != '\0')) goto LAB_00182957;
          piVar1 = (int *)(local_370 * (uVar21 - 2) + local_328 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          uVar16 = *(undefined4 *)((uVar21 - 2) * local_320 + lVar41 + uVar40 * 4);
          piVar1 = (int *)(local_370 * uVar21 + local_328 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_320 * uVar21 + lVar41 + uVar40 * 4) = uVar16;
          goto LAB_0017eda8;
        }
LAB_0017ac75:
        lVar42 = (long)(int)uVar40;
        lVar30 = local_3c0 * (uVar21 - 1) + local_180;
        piVar1 = (int *)(lVar30 + 4 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar38 = (uVar21 - 1) * (long)local_3b0 + local_1f8._24_8_;
        if (*(char *)(lVar42 + 1 + lVar38) == '\0') goto LAB_0017ad45;
        piVar1 = (int *)(lVar30 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar38 + lVar42) == '\0') {
          piVar1 = (int *)(lVar30 + -4 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar30 = uVar21 - 2;
          if (*(char *)(lVar38 + -1 + lVar42) != '\0') {
            piVar1 = (int *)(local_180 + local_3c0 * lVar30 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar42 + local_1f8._24_8_ + (long)local_3b0 * lVar30) == '\0') {
              local_328 = local_328 + local_370 * lVar30;
              piVar1 = (int *)(local_328 + -8 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              lVar41 = lVar41 + (long)plVar32 * lVar30;
              uVar15 = *(uint *)(lVar41 + -8 + lVar42 * 4);
              piVar1 = (int *)(local_328 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar41 + lVar42 * 4));
              piVar1 = (int *)(*local_220 * uVar21 + local_258 + -8 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              uVar17 = *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + -8 +
                                lVar42 * 4);
            }
            else {
              piVar1 = (int *)(local_370 * lVar30 + local_328 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              uVar15 = *(uint *)(lVar30 * (long)plVar32 + lVar41 + lVar42 * 4);
              piVar1 = (int *)(local_370 * uVar21 + local_328 + -8 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              uVar17 = *(uint *)((long)plVar32 * uVar21 + lVar41 + -8 + lVar42 * 4);
            }
            goto LAB_001811c3;
          }
        }
        piVar1 = (int *)(local_370 * (uVar21 - 2) + local_328 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar15 = *(uint *)((uVar21 - 2) * (long)plVar32 + lVar41 + lVar42 * 4);
        piVar1 = (int *)(local_370 * uVar21 + local_328 + -8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar15 = TTA::MemMerge(uVar15,*(uint *)((long)plVar32 * uVar21 + lVar41 + -8 + lVar42 * 4));
        piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + lVar42 * 4) = uVar15;
        goto LAB_0017eda8;
      }
      uVar49 = uVar40 & 0xffffffff;
LAB_0017b150:
      iVar14 = (int)uVar49;
      lVar38 = local_3c0 * (uVar21 | 1);
      piVar1 = (int *)(local_180 + lVar38 + uVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar58 = (uVar21 | 1) * (long)local_3b0;
      plVar35 = (long *)local_180;
      local_380 = (long *)local_1f8._24_8_;
      if (*(char *)(uVar40 + local_1f8._24_8_ + lVar58) == '\0') goto LAB_00179058;
      piVar1 = (int *)(local_3c0 * uVar21 + local_180 + 4 + (long)iVar14 * 4);
      *piVar1 = *piVar1 + 1;
      local_368 = plVar32;
      uVar40 = uVar49;
      if (*(char *)((long)iVar14 + 1 + (long)local_3b0 * uVar21 + local_1f8._24_8_) == '\0')
      goto LAB_0018124c;
LAB_0017b1c4:
      uVar15 = (uint)uVar40;
      piVar1 = (int *)(lVar38 + local_180 + -4 + (long)(int)uVar15 * 4);
      *piVar1 = *piVar1 + 1;
      local_380 = (long *)local_1f8._24_8_;
      plVar35 = (long *)local_180;
      if (*(char *)((long)(int)uVar15 + -1 + lVar58 + local_1f8._24_8_) == '\0') goto LAB_00178dbd;
LAB_0017b1f5:
      iVar14 = (int)uVar40;
      lVar42 = (long)iVar14;
      local_3c0 = local_3c0 * (uVar21 - 1);
      piVar1 = (int *)(local_180 + local_3c0 + 4 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar30 = (long)local_3b0 * (uVar21 - 1);
      local_340 = lVar41;
      if (*(char *)(lVar42 + 1 + local_1f8._24_8_ + lVar30) == '\0') goto LAB_0017b237;
    }
    piVar1 = (int *)(local_370 * (uVar21 - 2) + local_328 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    uVar15 = *(uint *)((uVar21 - 2) * (long)local_368 + local_340 + lVar42 * 4);
    piVar1 = (int *)(local_370 * uVar21 + local_328 + -8 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    uVar15 = TTA::MemMerge(uVar15,*(uint *)((long)local_368 * uVar21 + local_340 + -8 + lVar42 * 4))
    ;
    goto LAB_00178f47;
  }
  local_3c0 = *local_148;
  piVar1 = (int *)(local_3c0 * uVar21 + local_180 + 8 + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  local_3b0 = *(long **)local_1f8._80_8_;
  local_368 = plVar32;
  if (*(char *)(lVar42 + 2 + (long)local_3b0 * uVar21 + local_1f8._24_8_) == '\0')
  goto LAB_0017a6f1;
  piVar1 = (int *)(local_3c0 * (uVar21 | 1) + local_180 + 4 + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  uVar49 = uVar40;
  lVar30 = local_180;
  if (*(char *)(lVar42 + 1 + (uVar21 | 1) * (long)local_3b0 + local_1f8._24_8_) == '\0')
  goto LAB_00179f04;
LAB_0017aa95:
  iVar14 = (int)uVar49;
  uVar40 = (ulong)iVar14;
  lVar38 = local_3c0 * (uVar21 - 1);
  lVar30 = local_180 + lVar38;
  piVar1 = (int *)(lVar30 + 4 + uVar40 * 4);
  *piVar1 = *piVar1 + 1;
  lVar58 = (uVar21 - 1) * (long)local_3b0;
  lVar42 = local_1f8._24_8_ + lVar58;
  if (*(char *)(uVar40 + 1 + lVar42) != '\0') {
    piVar1 = (int *)(lVar30 + uVar40 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar42 + uVar40) == '\0') {
      lVar38 = (long)iVar14;
      piVar1 = (int *)(lVar30 + -4 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      lVar30 = uVar21 - 2;
      if (*(char *)(lVar42 + -1 + lVar38) != '\0') {
        piVar1 = (int *)(local_180 + local_3c0 * lVar30 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(uVar40 + local_1f8._24_8_ + (long)local_3b0 * lVar30) == '\0') {
          local_328 = local_328 + local_370 * lVar30;
          piVar1 = (int *)(local_328 + -8 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          lVar41 = lVar41 + (long)local_368 * lVar30;
          uVar15 = *(uint *)(lVar41 + -8 + lVar38 * 4);
          piVar1 = (int *)(local_328 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar41 + uVar40 * 4));
          piVar1 = (int *)(*local_220 * uVar21 + local_258 + -8 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          uVar17 = *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + -8 + lVar38 * 4
                            );
        }
        else {
          piVar1 = (int *)(local_370 * lVar30 + local_328 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          uVar15 = *(uint *)(lVar30 * (long)local_368 + lVar41 + uVar40 * 4);
          piVar1 = (int *)(local_370 * uVar21 + local_328 + -8 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          uVar17 = *(uint *)((long)local_368 * uVar21 + lVar41 + -8 + lVar38 * 4);
        }
        uVar15 = TTA::MemMerge(uVar15,uVar17);
        piVar1 = (int *)(*local_220 * uVar21 + local_258 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        plVar32 = *(long **)local_2d0._80_8_;
        uVar49 = uVar49 & 0xffffffff;
        local_340 = local_2d0._24_8_;
        goto LAB_0017fd0e;
      }
      piVar1 = (int *)(local_370 * lVar30 + local_328 + uVar40 * 4);
      *piVar1 = *piVar1 + 1;
      uVar15 = *(uint *)(lVar30 * (long)local_368 + lVar41 + uVar40 * 4);
      piVar1 = (int *)(local_370 * uVar21 + local_328 + -8 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      uVar15 = TTA::MemMerge(uVar15,*(uint *)((long)local_368 * uVar21 + lVar41 + -8 + lVar38 * 4));
      piVar1 = (int *)(*local_220 * uVar21 + local_258 + uVar40 * 4);
      *piVar1 = *piVar1 + 1;
      plVar32 = *(long **)local_2d0._80_8_;
    }
    else {
      piVar1 = (int *)(local_370 * (uVar21 - 2) + local_328 + uVar40 * 4);
      *piVar1 = *piVar1 + 1;
      uVar15 = *(uint *)((uVar21 - 2) * (long)local_368 + lVar41 + uVar40 * 4);
      piVar1 = (int *)(local_370 * uVar21 + local_328 + -8 + uVar40 * 4);
      *piVar1 = *piVar1 + 1;
      uVar15 = TTA::MemMerge(uVar15,*(uint *)((long)local_368 * uVar21 + lVar41 + -8 + uVar40 * 4));
      piVar1 = (int *)(*local_220 * uVar21 + local_258 + uVar40 * 4);
      *piVar1 = *piVar1 + 1;
      plVar32 = *(long **)local_2d0._80_8_;
    }
LAB_0017ab64:
    uVar49 = uVar49 & 0xffffffff;
    local_340 = local_2d0._24_8_;
    goto LAB_0017fd0e;
  }
  piVar1 = (int *)(local_3c0 * uVar21 + local_180 + 4 + uVar40 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(uVar40 + 1 + (long)local_3b0 * uVar21 + local_1f8._24_8_) == '\0') {
    uVar40 = (ulong)iVar14;
    piVar1 = (int *)(lVar30 + -4 + uVar40 * 4);
    *piVar1 = *piVar1 + 1;
    plVar32 = local_368;
    if (*(char *)(lVar42 + -1 + uVar40) == '\0') goto LAB_0017c39e;
    piVar1 = (int *)(local_370 * (uVar21 - 2) + local_328 + -8 + uVar40 * 4);
    *piVar1 = *piVar1 + 1;
    uVar15 = *(uint *)((uVar21 - 2) * (long)local_368 + lVar41 + -8 + uVar40 * 4);
    piVar1 = (int *)(local_370 * uVar21 + local_328 + -8 + uVar40 * 4);
    *piVar1 = *piVar1 + 1;
    uVar15 = TTA::MemMerge(uVar15,*(uint *)((long)local_368 * uVar21 + lVar41 + -8 + uVar40 * 4));
    local_350 = local_220;
    local_358 = *local_220;
    piVar1 = (int *)(local_358 * uVar21 + local_258 + uVar40 * 4);
    *piVar1 = *piVar1 + 1;
    local_300 = (long *)local_2d0._80_8_;
    local_320 = *(long *)local_2d0._80_8_;
    *(uint *)(local_320 * uVar21 + local_2d0._24_8_ + uVar40 * 4) = uVar15;
    local_318 = local_258;
    local_330 = local_2d0._24_8_;
    local_308 = local_258;
    local_390 = local_2d0._24_8_;
    local_3a0 = local_258;
    local_398 = local_2d0._24_8_;
    local_360 = local_258;
    local_340 = local_2d0._24_8_;
    local_2d8 = local_258;
    local_378 = local_2d0._24_8_;
    local_348 = local_258;
    local_2e8 = local_258;
    local_338 = local_2d0._24_8_;
    lVar41 = local_2d0._24_8_;
    local_2f8 = local_358;
    local_2e0 = local_320;
    goto LAB_001803c9;
  }
  uVar56 = (ulong)iVar14;
  piVar1 = (int *)(lVar30 + 8 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar42 + 2 + uVar56) != '\0') {
    piVar1 = (int *)(lVar30 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar42 + uVar56) != '\0') {
      lVar30 = uVar21 - 2;
      piVar1 = (int *)(local_180 + local_3c0 * lVar30 + 4 + uVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar38 = local_370 * lVar30 + local_328;
      lVar42 = lVar30 * (long)local_368 + lVar41;
      if (*(char *)(uVar40 + 1 + local_1f8._24_8_ + (long)local_3b0 * lVar30) == '\0') {
        piVar1 = (int *)(lVar38 + uVar56 * 4);
        *piVar1 = *piVar1 + 1;
        uVar15 = *(uint *)(lVar42 + uVar56 * 4);
        piVar1 = (int *)(lVar38 + 8 + uVar56 * 4);
        *piVar1 = *piVar1 + 1;
        uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar42 + 8 + uVar56 * 4));
        piVar1 = (int *)(*local_220 * uVar21 + local_258 + -8 + uVar56 * 4);
        *piVar1 = *piVar1 + 1;
        uVar17 = *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + -8 + uVar56 * 4);
      }
      else {
        piVar1 = (int *)(lVar38 + 8 + uVar56 * 4);
        *piVar1 = *piVar1 + 1;
        uVar15 = *(uint *)(lVar42 + 8 + uVar56 * 4);
        piVar1 = (int *)(local_328 + local_370 * uVar21 + -8 + uVar56 * 4);
        *piVar1 = *piVar1 + 1;
        uVar17 = *(uint *)(lVar41 + (long)local_368 * uVar21 + -8 + uVar56 * 4);
      }
      uVar15 = TTA::MemMerge(uVar15,uVar17);
      local_358 = *local_220;
      piVar1 = (int *)(local_358 * uVar21 + local_258 + uVar56 * 4);
      *piVar1 = *piVar1 + 1;
      plVar32 = *(long **)local_2d0._80_8_;
      local_320 = (long)plVar32;
      local_300 = (long *)local_2d0._80_8_;
      lVar30 = local_258;
      lVar41 = local_2d0._24_8_;
      local_3a0 = local_258;
      local_398 = local_2d0._24_8_;
      local_390 = local_2d0._24_8_;
      local_378 = local_2d0._24_8_;
      local_360 = local_258;
      local_350 = local_220;
      local_348 = local_258;
      local_340 = local_2d0._24_8_;
      local_338 = local_2d0._24_8_;
      local_330 = local_2d0._24_8_;
      local_318 = local_258;
      local_308 = local_258;
      goto LAB_0017dcb5;
    }
    lVar38 = (long)iVar14;
    piVar1 = (int *)(lVar30 + -4 + lVar38 * 4);
    *piVar1 = *piVar1 + 1;
    lVar30 = uVar21 - 2;
    if (*(char *)(lVar42 + -1 + lVar38) == '\0') {
      piVar1 = (int *)(local_370 * lVar30 + local_328 + 8 + uVar56 * 4);
      *piVar1 = *piVar1 + 1;
      uVar15 = *(uint *)(lVar30 * (long)local_368 + lVar41 + 8 + uVar56 * 4);
      piVar1 = (int *)(local_370 * uVar21 + local_328 + -8 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      uVar17 = *(uint *)((long)local_368 * uVar21 + lVar41 + -8 + lVar38 * 4);
    }
    else {
      lVar58 = local_180 + local_3c0 * lVar30;
      piVar1 = (int *)(lVar58 + 4 + uVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar42 = local_1f8._24_8_ + (long)local_3b0 * lVar30;
      if (*(char *)(uVar40 + 1 + lVar42) != '\0') {
        piVar1 = (int *)(lVar58 + uVar56 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar42 + uVar56) == '\0') {
          local_328 = local_328 + local_370 * lVar30;
          piVar1 = (int *)(local_328 + -8 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          lVar41 = lVar41 + (long)local_368 * lVar30;
          uVar15 = *(uint *)(lVar41 + -8 + lVar38 * 4);
          piVar1 = (int *)(local_328 + 8 + uVar56 * 4);
          *piVar1 = *piVar1 + 1;
          uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar41 + 8 + uVar56 * 4));
          piVar1 = (int *)(*local_220 * uVar21 + local_258 + -8 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          uVar17 = *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + -8 + lVar38 * 4
                            );
        }
        else {
          piVar1 = (int *)(local_370 * lVar30 + local_328 + 8 + uVar56 * 4);
          *piVar1 = *piVar1 + 1;
          uVar15 = *(uint *)(lVar30 * (long)local_368 + lVar41 + 8 + uVar56 * 4);
          piVar1 = (int *)(local_370 * uVar21 + local_328 + -8 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          uVar17 = *(uint *)((long)local_368 * uVar21 + lVar41 + -8 + lVar38 * 4);
        }
        uVar15 = TTA::MemMerge(uVar15,uVar17);
        local_358 = *local_220;
        piVar1 = (int *)(local_358 * uVar21 + local_258 + uVar56 * 4);
        *piVar1 = *piVar1 + 1;
        plVar32 = *(long **)local_2d0._80_8_;
        local_320 = (long)plVar32;
        local_300 = (long *)local_2d0._80_8_;
        lVar30 = local_258;
        lVar41 = local_2d0._24_8_;
        local_3a0 = local_258;
        local_398 = local_2d0._24_8_;
        local_390 = local_2d0._24_8_;
        local_378 = local_2d0._24_8_;
        local_360 = local_258;
        local_350 = local_220;
        local_348 = local_258;
        local_340 = local_2d0._24_8_;
        local_338 = local_2d0._24_8_;
        local_330 = local_2d0._24_8_;
        local_318 = local_258;
        local_308 = local_258;
        goto LAB_0017dcb5;
      }
      local_328 = local_328 + local_370 * lVar30;
      piVar1 = (int *)(local_328 + -8 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      lVar41 = lVar41 + (long)local_368 * lVar30;
      uVar15 = *(uint *)(lVar41 + -8 + lVar38 * 4);
      piVar1 = (int *)(local_328 + 8 + uVar56 * 4);
      *piVar1 = *piVar1 + 1;
      uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar41 + 8 + uVar56 * 4));
      piVar1 = (int *)(*local_220 * uVar21 + local_258 + -8 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      uVar17 = *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + -8 + lVar38 * 4);
    }
    uVar15 = TTA::MemMerge(uVar15,uVar17);
    local_358 = *local_220;
    piVar1 = (int *)(local_358 * uVar21 + local_258 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    plVar32 = *(long **)local_2d0._80_8_;
    local_320 = (long)plVar32;
    local_300 = (long *)local_2d0._80_8_;
    lVar30 = local_258;
    lVar41 = local_2d0._24_8_;
    local_3a0 = local_258;
    local_398 = local_2d0._24_8_;
    local_390 = local_2d0._24_8_;
    local_378 = local_2d0._24_8_;
    local_360 = local_258;
    local_350 = local_220;
    local_348 = local_258;
    local_340 = local_2d0._24_8_;
    local_338 = local_2d0._24_8_;
    local_330 = local_2d0._24_8_;
    local_318 = local_258;
    local_308 = local_258;
    goto LAB_0017dcb5;
  }
  lVar26 = (long)iVar14;
  piVar1 = (int *)(lVar30 + -4 + lVar26 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar42 + -1 + lVar26) != '\0') {
    piVar1 = (int *)(local_370 * (uVar21 - 2) + local_328 + -8 + lVar26 * 4);
    *piVar1 = *piVar1 + 1;
    uVar15 = *(uint *)((uVar21 - 2) * (long)local_368 + lVar41 + -8 + lVar26 * 4);
    piVar1 = (int *)(local_370 * uVar21 + local_328 + -8 + lVar26 * 4);
    *piVar1 = *piVar1 + 1;
    uVar15 = TTA::MemMerge(uVar15,*(uint *)((long)local_368 * uVar21 + lVar41 + -8 + lVar26 * 4));
    piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar26 * 4);
    *piVar1 = *piVar1 + 1;
    *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + lVar26 * 4) = uVar15;
    local_200 = uVar49;
    goto LAB_0017e88d;
  }
LAB_0017b36a:
  uVar56 = (ulong)(int)uVar49;
  piVar1 = (int *)(lVar38 + local_180 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(uVar56 + lVar58 + local_1f8._24_8_) == '\0') {
    local_328 = local_328 + local_370 * uVar21;
    piVar1 = (int *)(local_328 + -8 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    lVar41 = lVar41 + (long)local_368 * uVar21;
    uVar16 = *(undefined4 *)(lVar41 + -8 + uVar56 * 4);
    piVar1 = (int *)(local_328 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar41 + uVar56 * 4) = uVar16;
    local_300 = local_300;
    lVar41 = local_208;
LAB_0017d0c9:
    lVar42 = (long)(int)uVar49;
    uVar40 = lVar42 + 2;
    local_208 = lVar41;
    if (iVar43 <= (int)uVar40) {
      if (iVar43 < (int)uVar40) goto LAB_0017d222;
      local_3c0 = *local_148;
      lVar30 = local_3c0 * uVar21;
      piVar1 = (int *)(local_180 + lVar30 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      local_3b0 = *(long **)local_1f8._80_8_;
      lVar38 = (long)local_3b0 * uVar21;
      if (*(char *)(lVar42 + 2 + local_1f8._24_8_ + lVar38) == '\0') {
        piVar1 = (int *)(local_3c0 * (uVar21 | 1) + local_180 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar56 = local_200;
        if (*(char *)(lVar42 + 2 + (uVar21 | 1) * (long)local_3b0 + local_1f8._24_8_) == '\0')
        goto LAB_0017f38c;
        piVar1 = (int *)(local_180 + lVar30 + 0xc + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(local_1f8._24_8_ + lVar38 + 3 + lVar42) == '\0') {
          local_2e8 = local_2e8 + local_2f8 * uVar21;
          piVar1 = (int *)(local_2e8 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar41 = lVar41 + local_2e0 * uVar21;
          uVar16 = *(undefined4 *)(lVar41 + lVar42 * 4);
          piVar1 = (int *)(local_2e8 + 8 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar41 + 8 + lVar42 * 4) = uVar16;
          goto LAB_0017eda8;
        }
        lVar30 = lVar42 + 3;
      }
      else {
        lVar30 = (long)((int)uVar49 + 3);
      }
      piVar1 = (int *)(local_180 + local_3c0 * (uVar21 - 1) + lVar30 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar30 + local_1f8._24_8_ + (long)local_3b0 * (uVar21 - 1)) == '\0') {
        local_2e8 = local_2e8 + local_2f8 * uVar21;
        piVar1 = (int *)(local_2e8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar41 = lVar41 + local_2e0 * uVar21;
        uVar15 = *(uint *)(lVar41 + lVar42 * 4);
        piVar1 = (int *)(local_2e8 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
      }
      else {
        piVar1 = (int *)(local_2f8 * (uVar21 - 2) + local_2e8 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar15 = *(uint *)((uVar21 - 2) * local_2e0 + lVar41 + 8 + lVar42 * 4);
        piVar1 = (int *)(local_2f8 * uVar21 + local_2e8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar15 = TTA::MemMerge(uVar15,*(uint *)(local_2e0 * uVar21 + lVar41 + lVar42 * 4));
        piVar1 = (int *)(*local_220 * uVar21 + local_258 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar41 = *(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_;
      }
      *(uint *)(lVar41 + 8 + lVar42 * 4) = uVar15;
      goto LAB_0017eda8;
    }
    local_3c0 = *local_148;
    lVar30 = local_3c0 * uVar21 + local_180;
    piVar1 = (int *)(lVar30 + 8 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    local_3b0 = *(long **)local_1f8._80_8_;
    lVar38 = (long)local_3b0 * uVar21 + local_1f8._24_8_;
    if (*(char *)(lVar42 + 2 + lVar38) != '\0') {
      local_3c0 = local_3c0 * (uVar21 - 1);
      piVar1 = (int *)(local_3c0 + local_180 + 0xc + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar58 = (long)local_3b0 * (uVar21 - 1);
      if (*(char *)(lVar42 + 3 + local_1f8._24_8_ + lVar58) != '\0') {
        piVar1 = (int *)(local_2f8 * (uVar21 - 2) + local_2e8 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar15 = *(uint *)((uVar21 - 2) * local_2e0 + lVar41 + 8 + lVar42 * 4);
        piVar1 = (int *)(local_2f8 * uVar21 + local_2e8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar15 = TTA::MemMerge(uVar15,*(uint *)(local_2e0 * uVar21 + lVar41 + lVar42 * 4));
        piVar1 = (int *)(*local_220 * uVar21 + local_258 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        plVar32 = *(long **)local_2d0._80_8_;
        uVar49 = uVar40 & 0xffffffff;
        local_340 = local_2d0._24_8_;
        goto LAB_0017fd0e;
      }
      piVar1 = (int *)(lVar30 + 0xc + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar38 + 3 + lVar42) == '\0') {
        piVar1 = (int *)(local_2e8 + local_2f8 * uVar21 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar16 = *(undefined4 *)(lVar41 + local_2e0 * uVar21 + lVar42 * 4);
        piVar1 = (int *)(local_2f8 * uVar21 + local_2e8 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2e0 * uVar21 + lVar41 + 8 + lVar42 * 4) = uVar16;
        uVar49 = uVar40 & 0xffffffff;
        goto LAB_001803c9;
      }
LAB_0017d47a:
      piVar1 = (int *)(local_3c0 + local_180 + 0x10 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar42 + 4 + lVar58 + local_1f8._24_8_) == '\0') {
        local_2e8 = local_2e8 + local_2f8 * uVar21;
        piVar1 = (int *)(local_2e8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar41 = lVar41 + local_2e0 * uVar21;
        uVar16 = *(undefined4 *)(lVar41 + lVar42 * 4);
        piVar1 = (int *)(local_2e8 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar41 + 8 + lVar42 * 4) = uVar16;
        local_200 = uVar40 & 0xffffffff;
        goto LAB_0017e88d;
      }
      piVar1 = (int *)(local_2f8 * (uVar21 - 2) + local_2e8 + 0x10 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      uVar15 = *(uint *)((uVar21 - 2) * local_2e0 + lVar41 + 0x10 + lVar42 * 4);
      piVar1 = (int *)(local_2f8 * uVar21 + local_2e8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      uVar15 = TTA::MemMerge(uVar15,*(uint *)(local_2e0 * uVar21 + lVar41 + lVar42 * 4));
      local_358 = *local_220;
      piVar1 = (int *)(local_358 * uVar21 + local_258 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      plVar32 = *(long **)local_2d0._80_8_;
      uVar49 = uVar40 & 0xffffffff;
      local_320 = (long)plVar32;
      local_300 = (long *)local_2d0._80_8_;
      lVar30 = local_258;
      lVar41 = local_2d0._24_8_;
      uVar56 = uVar40;
      local_3a0 = local_258;
      local_398 = local_2d0._24_8_;
      local_390 = local_2d0._24_8_;
      local_378 = local_2d0._24_8_;
      local_360 = local_258;
      local_350 = local_220;
      local_348 = local_258;
      local_340 = local_2d0._24_8_;
      local_338 = local_2d0._24_8_;
      local_330 = local_2d0._24_8_;
      local_318 = local_258;
      local_308 = local_258;
      goto LAB_0017dcb5;
    }
    piVar1 = (int *)(local_3c0 * (uVar21 | 1) + local_180 + 8 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar42 + 2 + (uVar21 | 1) * (long)local_3b0 + local_1f8._24_8_) == '\0') {
LAB_0017d43c:
      uVar49 = uVar40 & 0xffffffff;
LAB_0017d7bb:
      iVar14 = (int)uVar49;
      uVar56 = (ulong)iVar14;
      piVar1 = (int *)(local_3c0 * uVar21 + local_180 + 4 + uVar56 * 4);
      *piVar1 = *piVar1 + 1;
      lVar30 = local_180;
      local_380 = (long *)local_1f8._24_8_;
      if (*(char *)(uVar56 + 1 + (long)local_3b0 * uVar21 + local_1f8._24_8_) != '\0') {
        lVar41 = local_180 + local_3c0 * (uVar21 - 1);
        piVar1 = (int *)(lVar41 + 4 + uVar56 * 4);
        *piVar1 = *piVar1 + 1;
        lVar30 = local_1f8._24_8_ + (long)local_3b0 * (uVar21 - 1);
        if (*(char *)(uVar56 + 1 + lVar30) != '\0') {
          lVar41 = *local_350;
          piVar1 = (int *)(lVar41 * (uVar21 - 2) + local_2d8 + uVar56 * 4);
          *piVar1 = *piVar1 + 1;
          lVar30 = *local_300;
          uVar15 = *(uint *)((uVar21 - 2) * lVar30 + local_340 + uVar56 * 4);
          lVar41 = lVar41 * uVar21;
          goto LAB_0017d847;
        }
        uVar56 = (ulong)iVar14;
        piVar1 = (int *)(lVar41 + 8 + uVar56 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar30 + 2 + uVar56) != '\0') {
          local_358 = *local_350;
          piVar1 = (int *)(local_358 * (uVar21 - 2) + local_2d8 + 8 + uVar56 * 4);
          *piVar1 = *piVar1 + 1;
          plVar32 = (long *)*local_300;
          uVar15 = *(uint *)((uVar21 - 2) * (long)plVar32 + local_340 + 8 + uVar56 * 4);
          piVar1 = (int *)(local_358 * uVar21 + local_2d8 + uVar56 * 4);
          *piVar1 = *piVar1 + 1;
          local_320 = (long)plVar32;
          lVar30 = local_2d8;
          lVar41 = local_340;
          goto LAB_0017dcb5;
        }
        uVar15 = TTA::MemNewLabel();
        local_3a0 = local_258;
        local_350 = local_220;
        local_358 = *local_220;
        piVar1 = (int *)(local_358 * uVar21 + local_258 + (long)iVar14 * 4);
        *piVar1 = *piVar1 + 1;
        local_398 = local_2d0._24_8_;
        local_320 = *(long *)local_2d0._80_8_;
        *(uint *)(local_320 * uVar21 + local_2d0._24_8_ + (long)iVar14 * 4) = uVar15;
        local_300 = (long *)local_2d0._80_8_;
        lVar41 = local_2d0._24_8_;
        local_390 = local_398;
        local_378 = local_398;
        local_360 = local_3a0;
        local_348 = local_3a0;
        local_340 = local_398;
        local_338 = local_398;
        local_330 = local_398;
        local_318 = local_3a0;
        local_308 = local_3a0;
        local_2f8 = local_358;
        local_2e8 = local_3a0;
        local_2e0 = local_320;
        local_2d8 = local_3a0;
        goto LAB_0017d0c9;
      }
LAB_001798b6:
      uVar56 = uVar21 | 1;
      local_320._0_4_ = (int)uVar49;
      lVar38 = (long)(int)local_320;
      lVar58 = local_3c0 * uVar56;
      piVar1 = (int *)(lVar30 + lVar58 + 4 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      lVar42 = (long)local_3b0 * uVar56;
      if (*(char *)(lVar38 + 1 + (long)local_380 + lVar42) != '\0') {
        uVar15 = TTA::MemNewLabel();
        local_350 = local_220;
        local_358 = *local_220;
        lVar42 = local_358 * uVar21 + local_258;
        piVar1 = (int *)(lVar42 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        local_300 = (long *)local_2d0._80_8_;
        local_368 = *(long **)local_2d0._80_8_;
        lVar58 = (long)local_368 * uVar21 + local_2d0._24_8_;
        *(uint *)(lVar58 + lVar38 * 4) = uVar15;
        uVar40 = lVar38 + 2;
        local_380 = (long *)local_1f8._24_8_;
        local_328 = local_258;
        local_370 = local_358;
        plVar32 = local_368;
        lVar41 = local_2d0._24_8_;
        if (iVar43 <= (int)uVar40) {
          local_3c0 = *local_148;
          lVar30 = local_3c0 * uVar21 + local_180;
          piVar1 = (int *)(lVar30 + 8 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          local_3b0 = *(long **)local_1f8._80_8_;
          lVar26 = (long)local_3b0 * uVar21 + local_1f8._24_8_;
          cVar3 = *(char *)(lVar38 + 2 + lVar26);
          if (iVar43 < (int)uVar40) {
            if (cVar3 == '\0') goto LAB_0017eba1;
            goto LAB_0017ad45;
          }
          if (cVar3 != '\0') goto LAB_0017ac75;
          piVar1 = (int *)(local_3c0 * uVar56 + local_180 + 8 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          plVar35 = (long *)local_180;
          uVar49 = uVar40;
          if (*(char *)(lVar38 + 2 + uVar56 * (long)local_3b0 + local_1f8._24_8_) == '\0')
          goto LAB_00179058;
          piVar1 = (int *)(lVar30 + 0xc + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar26 + 3 + lVar38) != '\0') goto LAB_0017b1f5;
          piVar1 = (int *)(lVar42 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          uVar16 = *(undefined4 *)(lVar58 + lVar38 * 4);
          piVar1 = (int *)(lVar42 + 8 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar58 + 8 + lVar38 * 4) = uVar16;
          goto LAB_0017eda8;
        }
        local_3c0 = *local_148;
        lVar26 = local_3c0 * uVar21 + local_180;
        piVar1 = (int *)(lVar26 + 8 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        local_3b0 = *(long **)local_1f8._80_8_;
        lVar39 = (long)local_3b0 * uVar21 + local_1f8._24_8_;
        local_200 = uVar40;
        local_320 = (long)local_368;
        local_2f8 = local_358;
        local_2e0 = (long)local_368;
        if (*(char *)(lVar38 + 2 + lVar39) != '\0') {
          local_378 = local_2d0._24_8_;
          local_348 = local_258;
          local_338 = local_2d0._24_8_;
          local_318 = local_258;
          local_330 = local_2d0._24_8_;
          local_308 = local_258;
          local_390 = local_2d0._24_8_;
          local_3a0 = local_258;
          local_398 = local_2d0._24_8_;
          local_360 = local_258;
          local_340 = local_2d0._24_8_;
          local_2d8 = local_258;
          local_208 = local_2d0._24_8_;
          local_2e8 = local_258;
          uVar49 = uVar40;
          goto LAB_0017aa95;
        }
        piVar1 = (int *)(local_3c0 * uVar56 + local_180 + 8 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        lVar30 = local_180;
        if (*(char *)(lVar38 + 2 + uVar56 * (long)local_3b0 + local_1f8._24_8_) != '\0') {
          piVar1 = (int *)(lVar26 + 0xc + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar39 + 3 + lVar38) == '\0') {
            piVar1 = (int *)(lVar42 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            uVar16 = *(undefined4 *)(lVar58 + lVar38 * 4);
            piVar1 = (int *)(lVar42 + 8 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar58 + 8 + lVar38 * 4) = uVar16;
            local_378 = local_2d0._24_8_;
            local_348 = local_258;
            local_318 = local_258;
            local_330 = local_2d0._24_8_;
            local_308 = local_258;
            local_390 = local_2d0._24_8_;
            local_3a0 = local_258;
            local_398 = local_2d0._24_8_;
            local_360 = local_258;
            local_340 = local_2d0._24_8_;
            local_2d8 = local_258;
            local_208 = local_2d0._24_8_;
            local_2e8 = local_258;
            local_338 = local_2d0._24_8_;
            local_2e0 = (long)local_368;
            goto LAB_0017a9e7;
          }
          lVar26 = (long)((int)local_320 + 3);
          local_338 = local_2d0._24_8_;
          local_318 = local_258;
          local_330 = local_2d0._24_8_;
          local_308 = local_258;
          local_390 = local_2d0._24_8_;
          local_398 = local_2d0._24_8_;
          local_360 = local_258;
          local_340 = local_2d0._24_8_;
          local_2d8 = local_258;
          local_208 = local_2d0._24_8_;
          local_2e8 = local_258;
          local_130 = local_2d0._24_8_;
          local_378 = local_2d0._24_8_;
          local_3a0 = local_258;
          lVar42 = local_258;
LAB_0017a792:
          lVar38 = local_3c0 * (uVar21 - 1);
          piVar1 = (int *)(local_180 + lVar38 + lVar26 * 4);
          *piVar1 = *piVar1 + 1;
          lVar58 = (uVar21 - 1) * (long)local_3b0;
          if (*(char *)(lVar26 + local_1f8._24_8_ + lVar58) != '\0') {
            uVar56 = (ulong)(int)uVar40;
            piVar1 = (int *)(local_370 * (uVar21 - 2) + lVar42 + uVar56 * 4);
            *piVar1 = *piVar1 + 1;
            uVar15 = *(uint *)((uVar21 - 2) * (long)local_368 + local_130 + uVar56 * 4);
            piVar1 = (int *)(local_370 * uVar21 + lVar42 + -8 + uVar56 * 4);
            *piVar1 = *piVar1 + 1;
            uVar15 = TTA::MemMerge(uVar15,*(uint *)((long)local_368 * uVar21 + local_130 + -8 +
                                                   uVar56 * 4));
            piVar1 = (int *)(*local_220 * uVar21 + local_258 + uVar56 * 4);
            *piVar1 = *piVar1 + 1;
            lVar30 = *(long *)local_2d0._80_8_;
            local_340 = local_2d0._24_8_;
            uVar49 = uVar40;
            uVar40 = uVar56;
            goto LAB_0017d84e;
          }
          local_348 = local_328;
          uVar40 = uVar40 & 0xffffffff;
          local_328 = lVar42;
          plVar32 = local_368;
          lVar41 = local_130;
LAB_0017aff3:
          iVar14 = (int)uVar40;
          lVar30 = (long)iVar14;
          piVar1 = (int *)(local_180 + lVar38 + 8 + lVar30 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar30 + 2 + local_1f8._24_8_ + lVar58) == '\0') {
            uVar49 = uVar40 & 0xffffffff;
            local_368 = plVar32;
            goto LAB_0017b36a;
          }
          lVar42 = uVar21 - 2;
          piVar1 = (int *)(local_180 + local_3c0 * lVar42 + 4 + lVar30 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar30 + 1 + local_1f8._24_8_ + (long)local_3b0 * lVar42) == '\0') {
            lVar26 = (long)iVar14;
            piVar1 = (int *)(local_180 + lVar38 + lVar26 * 4);
            *piVar1 = *piVar1 + 1;
            lVar38 = local_370 * lVar42 + local_328;
            lVar42 = lVar42 * (long)plVar32 + lVar41;
            if (*(char *)(local_1f8._24_8_ + lVar58 + lVar26) == '\0') {
              piVar1 = (int *)(lVar38 + 8 + lVar30 * 4);
              *piVar1 = *piVar1 + 1;
              uVar17 = *(uint *)(lVar42 + 8 + lVar30 * 4);
              piVar1 = (int *)(local_328 + local_370 * uVar21 + -8 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              uVar15 = *(uint *)(lVar41 + (long)plVar32 * uVar21 + -8 + lVar26 * 4);
            }
            else {
              piVar1 = (int *)(lVar38 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              uVar15 = *(uint *)(lVar42 + lVar26 * 4);
              piVar1 = (int *)(lVar38 + 8 + lVar30 * 4);
              *piVar1 = *piVar1 + 1;
              uVar17 = TTA::MemMerge(uVar15,*(uint *)(lVar42 + 8 + lVar30 * 4));
              piVar1 = (int *)(*local_220 * uVar21 + local_258 + -8 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              uVar15 = *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + -8 +
                                lVar26 * 4);
            }
            uVar15 = TTA::MemMerge(uVar17,uVar15);
            local_358 = *local_220;
            piVar1 = (int *)(local_358 * uVar21 + local_258 + lVar26 * 4);
            *piVar1 = *piVar1 + 1;
            plVar32 = *(long **)local_2d0._80_8_;
          }
          else {
            piVar1 = (int *)(local_370 * lVar42 + local_328 + 8 + lVar30 * 4);
            *piVar1 = *piVar1 + 1;
            uVar15 = *(uint *)(lVar42 * (long)plVar32 + lVar41 + 8 + lVar30 * 4);
            piVar1 = (int *)(local_370 * uVar21 + local_328 + -8 + lVar30 * 4);
            *piVar1 = *piVar1 + 1;
            uVar15 = TTA::MemMerge(uVar15,*(uint *)((long)plVar32 * uVar21 + lVar41 + -8 +
                                                   lVar30 * 4));
            local_358 = *local_220;
            piVar1 = (int *)(local_358 * uVar21 + local_258 + lVar30 * 4);
            *piVar1 = *piVar1 + 1;
            plVar32 = *(long **)local_2d0._80_8_;
          }
          local_398 = local_2d0._24_8_;
          local_360 = local_258;
          local_340 = local_2d0._24_8_;
          local_348 = local_258;
          uVar49 = uVar40 & 0xffffffff;
          local_320 = (long)plVar32;
          local_300 = (long *)local_2d0._80_8_;
          lVar30 = local_258;
          lVar41 = local_2d0._24_8_;
          uVar56 = (long)iVar14;
          local_3a0 = local_258;
          local_390 = local_2d0._24_8_;
          local_378 = local_2d0._24_8_;
          local_350 = local_220;
          local_338 = local_2d0._24_8_;
          local_330 = local_2d0._24_8_;
          local_318 = local_258;
          local_308 = local_258;
          goto LAB_0017dcb5;
        }
LAB_001793e5:
        piVar1 = (int *)(local_3c0 * uVar21 + lVar30 + 4 + (long)(int)uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        uVar49 = uVar40 & 0xffffffff;
        if (*(char *)((long)(int)uVar40 + 1 + (long)local_3b0 * uVar21 + (long)local_380) != '\0')
        goto LAB_0017940d;
        goto LAB_001798b6;
      }
      local_350 = local_220;
      local_370 = *local_220;
      piVar1 = (int *)(local_370 * uVar21 + local_258 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      plVar32 = *(long **)local_2d0._80_8_;
      *(undefined4 *)((long)plVar32 * uVar21 + local_2d0._24_8_ + lVar38 * 4) = 0;
      uVar40 = lVar38 + 2;
      uVar15 = (uint)uVar40;
      local_320 = (long)plVar32;
      lVar41 = local_2d0._24_8_;
      if (iVar43 <= (int)uVar15) {
        piVar1 = (int *)(local_3c0 * uVar21 + lVar30 + 8 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        cVar3 = *(char *)(lVar38 + 2 + (long)local_3b0 * uVar21 + (long)local_380);
        local_328 = local_258;
        local_368 = (long *)lVar30;
        if ((int)uVar15 <= iVar43) {
          if (cVar3 == '\0') goto LAB_00178fac;
          goto LAB_0017af2f;
        }
        if (cVar3 == '\0') goto LAB_00179023;
        goto LAB_0017bd5c;
      }
      local_300 = (long *)local_2d0._80_8_;
      piVar1 = (int *)(local_3c0 * uVar21 + lVar30 + 8 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      local_338 = local_2d0._24_8_;
      local_318 = local_258;
      local_330 = local_2d0._24_8_;
      local_308 = local_258;
      local_390 = local_2d0._24_8_;
      local_3a0 = local_258;
      local_398 = local_2d0._24_8_;
      local_360 = local_258;
      local_340 = local_2d0._24_8_;
      local_2d8 = local_258;
      local_208 = local_2d0._24_8_;
      local_2e8 = local_258;
      local_378 = local_2d0._24_8_;
      local_348 = local_258;
      local_328 = local_258;
      uVar49 = uVar40;
      local_358 = local_370;
      local_2f8 = local_370;
      local_2e0 = (long)plVar32;
      if (*(char *)(lVar38 + 2 + (long)local_3b0 * uVar21 + (long)local_380) != '\0') {
LAB_00179f04:
        iVar14 = (int)uVar49;
        uVar40 = (ulong)iVar14;
        lVar42 = local_3c0 * (uVar21 - 1) + lVar30;
        piVar1 = (int *)(lVar42 + 4 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        lVar38 = (uVar21 - 1) * (long)local_3b0 + (long)local_380;
        if (*(char *)(uVar40 + 1 + lVar38) != '\0') {
          piVar1 = (int *)(lVar42 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          local_340 = lVar41;
          if (*(char *)(lVar38 + uVar40) != '\0') {
            piVar1 = (int *)(local_370 * (uVar21 - 2) + local_328 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            uVar15 = *(uint *)((uVar21 - 2) * (long)plVar32 + lVar41 + uVar40 * 4);
            piVar1 = (int *)(local_370 * uVar21 + local_328 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            uVar49 = uVar49 & 0xffffffff;
            goto LAB_0017fd0e;
          }
          piVar1 = (int *)(lVar42 + -4 + (long)iVar14 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar38 + -1 + (long)iVar14) == '\0') {
            piVar1 = (int *)(local_370 * (uVar21 - 2) + local_328 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            uVar15 = *(uint *)((uVar21 - 2) * (long)plVar32 + lVar41 + uVar40 * 4);
            piVar1 = (int *)(local_370 * uVar21 + local_328 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            uVar49 = uVar49 & 0xffffffff;
            goto LAB_0017fd0e;
          }
          uVar49 = uVar49 & 0xffffffff;
          goto LAB_00180a21;
        }
        piVar1 = (int *)(local_3c0 * uVar21 + lVar30 + 4 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(uVar40 + 1 + (long)local_3b0 * uVar21 + (long)local_380) != '\0') {
          uVar56 = (ulong)iVar14;
          piVar1 = (int *)(lVar42 + 8 + uVar56 * 4);
          *piVar1 = *piVar1 + 1;
          cVar3 = *(char *)(lVar38 + 2 + uVar56);
          piVar1 = (int *)(lVar42 + uVar56 * 4);
          *piVar1 = *piVar1 + 1;
          if (cVar3 != '\0') {
            if (*(char *)(lVar38 + uVar56) != '\0') goto LAB_001794d1;
            piVar1 = (int *)(lVar42 + -4 + (long)iVar14 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = uVar40 + 1;
            if (*(char *)(lVar38 + -1 + (long)iVar14) != '\0') goto LAB_00181e7e;
            piVar1 = (int *)(local_370 * (uVar21 - 2) + local_328 + 8 + uVar56 * 4);
            *piVar1 = *piVar1 + 1;
            uVar15 = *(uint *)((uVar21 - 2) * (long)plVar32 + lVar41 + 8 + uVar56 * 4);
            piVar1 = (int *)(local_370 * uVar21 + local_328 + uVar56 * 4);
            *piVar1 = *piVar1 + 1;
            local_300 = local_300;
            lVar30 = local_2d8;
            goto LAB_0017dcb5;
          }
          if (*(char *)(lVar38 + uVar56) != '\0') {
            piVar1 = (int *)(local_370 * (uVar21 - 2) + local_328 + uVar56 * 4);
            *piVar1 = *piVar1 + 1;
            uVar15 = *(uint *)((uVar21 - 2) * (long)plVar32 + lVar41 + uVar56 * 4);
            piVar1 = (int *)(local_370 * uVar21 + local_328 + uVar56 * 4);
            *piVar1 = *piVar1 + 1;
            goto LAB_0017b471;
          }
          lVar30 = (long)iVar14;
          piVar1 = (int *)(lVar42 + -4 + lVar30 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar38 + -1 + lVar30) == '\0') {
            uVar15 = TTA::MemNewLabel();
            local_350 = local_220;
            local_358 = *local_220;
            piVar1 = (int *)(local_358 * uVar21 + local_258 + uVar56 * 4);
            *piVar1 = *piVar1 + 1;
            local_320 = *(long *)local_2d0._80_8_;
            *(uint *)(local_320 * uVar21 + local_2d0._24_8_ + uVar56 * 4) = uVar15;
            local_338 = local_2d0._24_8_;
            local_318 = local_258;
            local_330 = local_2d0._24_8_;
            local_308 = local_258;
            local_390 = local_2d0._24_8_;
            local_3a0 = local_258;
            local_398 = local_2d0._24_8_;
            local_360 = local_258;
            local_340 = local_2d0._24_8_;
            local_2d8 = local_258;
            local_378 = local_2d0._24_8_;
            local_348 = local_258;
            local_2e8 = local_258;
            local_300 = (long *)local_2d0._80_8_;
            lVar41 = local_2d0._24_8_;
            local_2f8 = local_358;
            local_2e0 = local_320;
          }
          else {
            piVar1 = (int *)(local_370 * (uVar21 - 2) + local_328 + -8 + lVar30 * 4);
            *piVar1 = *piVar1 + 1;
            uVar16 = *(undefined4 *)((uVar21 - 2) * (long)plVar32 + lVar41 + -8 + lVar30 * 4);
            piVar1 = (int *)(local_370 * uVar21 + local_328 + uVar56 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)((long)plVar32 * uVar21 + lVar41 + uVar56 * 4) = uVar16;
            local_300 = local_300;
            lVar41 = local_208;
          }
          goto LAB_0017d0c9;
        }
        uVar40 = (ulong)iVar14;
        piVar1 = (int *)(lVar42 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar38 + uVar40) == '\0') {
          lVar30 = (long)iVar14;
          piVar1 = (int *)(lVar42 + -4 + lVar30 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar38 + -1 + lVar30) != '\0') {
            piVar1 = (int *)(local_370 * (uVar21 - 2) + local_328 + -8 + lVar30 * 4);
            *piVar1 = *piVar1 + 1;
            uVar16 = *(undefined4 *)((uVar21 - 2) * (long)plVar32 + lVar41 + -8 + lVar30 * 4);
            piVar1 = (int *)(local_370 * uVar21 + local_328 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)((long)plVar32 * uVar21 + lVar41 + uVar40 * 4) = uVar16;
            uVar56 = uVar49 & 0xffffffff;
            goto LAB_0017a31c;
          }
          uVar15 = TTA::MemNewLabel();
          local_370 = *local_220;
          piVar1 = (int *)(local_370 * uVar21 + local_258 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          plVar32 = *(long **)local_2d0._80_8_;
          *(uint *)((long)plVar32 * uVar21 + local_2d0._24_8_ + uVar40 * 4) = uVar15;
          uVar56 = uVar49 & 0xffffffff;
          goto LAB_0017a2c3;
        }
        piVar1 = (int *)(local_370 * (uVar21 - 2) + local_328 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        uVar15 = *(uint *)((uVar21 - 2) * (long)plVar32 + lVar41 + uVar40 * 4);
        piVar1 = (int *)(local_370 * uVar21 + local_328 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        uVar56 = uVar49 & 0xffffffff;
LAB_0017cadd:
        while( true ) {
          lVar30 = (long)plVar32 * uVar21 + lVar41;
          *(uint *)(lVar30 + uVar40 * 4) = uVar15;
          lVar42 = (long)(int)uVar56;
          uVar40 = lVar42 + 2;
          uVar15 = (uint)uVar40;
          local_380 = (long *)local_1f8._24_8_;
          if (iVar43 <= (int)uVar15) {
            local_3c0 = *local_148;
            lVar41 = local_3c0 * uVar21 + local_180;
            piVar1 = (int *)(lVar41 + 8 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            local_3b0 = *(long **)local_1f8._80_8_;
            lVar26 = (long)local_3b0 * uVar21 + local_1f8._24_8_;
            cVar3 = *(char *)(lVar42 + 2 + lVar26);
            if (iVar43 < (int)uVar15) {
              uVar56 = uVar40;
              if (cVar3 == '\0') goto LAB_0018121e;
              piVar1 = (int *)(local_3c0 * (uVar21 | 1) + local_180 + 4 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar42 + 1 + (uVar21 | 1) * (long)local_3b0 + local_1f8._24_8_) == '\0')
              goto LAB_00181808;
              lVar38 = local_3c0 * (uVar21 - 1);
              lVar41 = (uVar21 - 1) * (long)local_3b0;
            }
            else {
              local_368 = (long *)local_180;
              uVar56 = uVar21 | 1;
              lVar38 = local_3c0 * uVar56;
              if (cVar3 == '\0') {
                piVar1 = (int *)(local_180 + lVar38 + 8 + lVar42 * 4);
                *piVar1 = *piVar1 + 1;
                lVar58 = uVar56 * (long)local_3b0;
                plVar35 = (long *)local_180;
                uVar49 = uVar40;
                if (*(char *)(lVar42 + 2 + local_1f8._24_8_ + lVar58) == '\0') goto LAB_00179058;
                piVar1 = (int *)(lVar41 + 0xc + lVar42 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar26 + 3 + lVar42) == '\0') goto LAB_0018135e;
              }
              piVar1 = (int *)(lVar38 + local_180 + 4 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              plVar35 = local_368;
              if (*(char *)(lVar42 + 1 + uVar56 * (long)local_3b0 + local_1f8._24_8_) == '\0')
              goto LAB_00178dbd;
              lVar38 = local_3c0 * (uVar21 - 1);
              piVar1 = (int *)(local_180 + lVar38 + 0xc + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              lVar41 = (uVar21 - 1) * (long)local_3b0;
              if (*(char *)(lVar42 + 3 + local_1f8._24_8_ + lVar41) != '\0') goto LAB_001806ff;
            }
            piVar1 = (int *)(lVar38 + local_180 + 8 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar42 + 2 + lVar41 + local_1f8._24_8_) != '\0') goto LAB_00180f2c;
            local_328 = local_328 + local_370 * uVar21;
            piVar1 = (int *)(local_328 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            uVar16 = *(undefined4 *)(lVar30 + lVar42 * 4);
            piVar1 = (int *)(local_328 + 8 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar30 + 8 + lVar42 * 4) = uVar16;
            goto LAB_0017eda8;
          }
          local_3c0 = *local_148;
          lVar38 = local_3c0 * uVar21 + local_180;
          piVar1 = (int *)(lVar38 + 8 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          local_3b0 = *(long **)local_1f8._80_8_;
          lVar58 = (long)local_3b0 * uVar21 + local_1f8._24_8_;
          uVar18 = uVar21 | 1;
          uVar49 = uVar40;
          if (*(char *)(lVar42 + 2 + lVar58) == '\0') break;
          piVar1 = (int *)(local_3c0 * uVar18 + local_180 + 4 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          uVar56 = uVar40;
          if (*(char *)(lVar42 + 1 + uVar18 * (long)local_3b0 + local_1f8._24_8_) == '\0')
          goto LAB_00178e76;
          lVar39 = local_3c0 * (uVar21 - 1);
          piVar1 = (int *)(local_180 + lVar39 + 0xc + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar26 = (uVar21 - 1) * (long)local_3b0;
          if (*(char *)(lVar42 + 3 + local_1f8._24_8_ + lVar26) != '\0') goto LAB_001804b2;
          piVar1 = (int *)(lVar38 + 0xc + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar58 + 3 + lVar42) != '\0') goto LAB_0017ce3a;
          piVar1 = (int *)(local_180 + lVar39 + 8 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_1f8._24_8_ + lVar26 + 2 + lVar42) == '\0') {
            piVar1 = (int *)(local_328 + local_370 * uVar21 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            uVar16 = *(undefined4 *)(lVar30 + lVar42 * 4);
            local_370 = local_2f8;
            piVar1 = (int *)(local_2f8 * uVar21 + local_2e8 + 8 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2e0 * uVar21 + local_208 + 8 + lVar42 * 4) = uVar16;
            uVar56 = uVar40 & 0xffffffff;
            local_328 = local_2e8;
            plVar32 = (long *)local_2e0;
            lVar41 = local_208;
LAB_0017a31c:
            lVar30 = (long)(int)uVar56;
            uVar40 = lVar30 + 2;
            uVar15 = (uint)uVar40;
            local_368 = plVar32;
            if (iVar43 <= (int)uVar15) {
              local_3c0 = *local_148;
              piVar1 = (int *)(local_3c0 * uVar21 + local_180 + 8 + lVar30 * 4);
              *piVar1 = *piVar1 + 1;
              local_3b0 = *(long **)local_1f8._80_8_;
              cVar3 = *(char *)(lVar30 + 2 + (long)local_3b0 * uVar21 + local_1f8._24_8_);
              if ((int)uVar15 <= iVar43) {
                uVar49 = uVar40;
                if (cVar3 == '\0') goto LAB_0017b150;
                lVar38 = local_3c0 * (uVar21 | 1);
                lVar58 = (uVar21 | 1) * (long)local_3b0;
                goto LAB_0017b1c4;
              }
              uVar56 = uVar40;
              if (cVar3 == '\0') goto LAB_0018121e;
              piVar1 = (int *)(local_3c0 * (uVar21 | 1) + local_180 + 4 + lVar30 * 4);
              *piVar1 = *piVar1 + 1;
              local_368 = (long *)local_180;
              local_380 = (long *)local_1f8._24_8_;
              if (*(char *)(lVar30 + 1 + (uVar21 | 1) * (long)local_3b0 + local_1f8._24_8_) == '\0')
              goto LAB_00178ec3;
              local_3c0 = local_3c0 * (uVar21 - 1);
              lVar30 = (long)local_3b0 * (uVar21 - 1);
              local_340 = lVar41;
              goto LAB_0017b11e;
            }
            local_3c0 = *local_148;
            lVar42 = local_3c0 * uVar21 + local_180;
            piVar1 = (int *)(lVar42 + 8 + lVar30 * 4);
            *piVar1 = *piVar1 + 1;
            local_3b0 = *(long **)local_1f8._80_8_;
            lVar26 = (long)local_3b0 * uVar21 + local_1f8._24_8_;
            if (*(char *)(lVar30 + 2 + lVar26) == '\0') {
              uVar40 = uVar40 & 0xffffffff;
LAB_0017a6f1:
              local_130 = lVar41;
              lVar42 = local_328;
              lVar58 = local_3c0 * (uVar21 | 1) + local_180;
              lVar26 = (long)(int)uVar40;
              piVar1 = (int *)(lVar58 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              lVar38 = (uVar21 | 1) * (long)local_3b0 + local_1f8._24_8_;
              lVar30 = local_180;
              local_380 = (long *)local_1f8._24_8_;
              if (*(char *)(lVar26 + lVar38) == '\0') goto LAB_001793e5;
              piVar1 = (int *)(local_3c0 * uVar21 + local_180 + 4 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              plVar32 = local_368;
              lVar41 = local_130;
              if (*(char *)(lVar26 + 1 + (long)local_3b0 * uVar21 + local_1f8._24_8_) == '\0')
              goto LAB_0017a89b;
              piVar1 = (int *)(lVar58 + -4 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar38 + -1 + lVar26) == '\0') goto LAB_0017940d;
              lVar26 = lVar26 + 1;
              local_328 = local_348;
              goto LAB_0017a792;
            }
            piVar1 = (int *)(local_3c0 * (uVar21 | 1) + local_180 + 4 + lVar30 * 4);
            *piVar1 = *piVar1 + 1;
            uVar56 = uVar40;
            if (*(char *)(lVar30 + 1 + (uVar21 | 1) * (long)local_3b0 + local_1f8._24_8_) == '\0')
            goto LAB_00178e76;
            lVar38 = local_3c0 * (uVar21 - 1);
            piVar1 = (int *)(local_180 + lVar38 + 0xc + lVar30 * 4);
            *piVar1 = *piVar1 + 1;
            lVar58 = (uVar21 - 1) * (long)local_3b0;
            if (*(char *)(lVar30 + 3 + local_1f8._24_8_ + lVar58) != '\0') {
              piVar1 = (int *)(local_370 * (uVar21 - 2) + local_328 + 8 + lVar30 * 4);
              *piVar1 = *piVar1 + 1;
              uVar15 = *(uint *)((uVar21 - 2) * (long)plVar32 + lVar41 + 8 + lVar30 * 4);
              piVar1 = (int *)(local_370 * uVar21 + local_328 + lVar30 * 4);
              *piVar1 = *piVar1 + 1;
              uVar15 = TTA::MemMerge(uVar15,*(uint *)((long)plVar32 * uVar21 + lVar41 + lVar30 * 4))
              ;
              piVar1 = (int *)(*local_220 * uVar21 + local_258 + 8 + lVar30 * 4);
              *piVar1 = *piVar1 + 1;
              plVar32 = *(long **)local_2d0._80_8_;
              uVar49 = uVar40;
              goto LAB_0017ab64;
            }
            piVar1 = (int *)(lVar42 + 0xc + lVar30 * 4);
            *piVar1 = *piVar1 + 1;
            uVar49 = uVar40 & 0xffffffff;
            if (*(char *)(lVar26 + 3 + lVar30) != '\0') goto LAB_0017aff3;
LAB_0017c39e:
            piVar1 = (int *)(lVar38 + local_180 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            iVar14 = (int)uVar49;
            if (*(char *)(uVar40 + lVar58 + local_1f8._24_8_) == '\0') goto LAB_0017c4db;
            piVar1 = (int *)(local_370 * (uVar21 - 2) + local_328 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            uVar15 = *(uint *)((uVar21 - 2) * (long)plVar32 + lVar41 + uVar40 * 4);
            piVar1 = (int *)(local_370 * uVar21 + local_328 + -8 + (long)iVar14 * 4);
            *piVar1 = *piVar1 + 1;
            uVar15 = TTA::MemMerge(uVar15,*(uint *)((long)plVar32 * uVar21 + lVar41 + -8 +
                                                   (long)iVar14 * 4));
            local_350 = local_220;
            local_370 = *local_220;
            piVar1 = (int *)(local_370 * uVar21 + local_258 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            local_300 = (long *)local_2d0._80_8_;
            plVar32 = *(long **)local_2d0._80_8_;
            local_378 = local_2d0._24_8_;
            local_338 = local_2d0._24_8_;
            local_318 = local_258;
            local_330 = local_2d0._24_8_;
            local_308 = local_258;
            local_390 = local_2d0._24_8_;
            local_3a0 = local_258;
            local_398 = local_2d0._24_8_;
            local_360 = local_258;
            local_340 = local_2d0._24_8_;
            local_2d8 = local_258;
            local_208 = local_2d0._24_8_;
            local_2e8 = local_258;
            local_348 = local_258;
            local_328 = local_258;
            uVar56 = uVar49;
            lVar41 = local_2d0._24_8_;
            local_358 = local_370;
            local_320 = (long)plVar32;
            local_2f8 = local_370;
            local_2e0 = (long)plVar32;
          }
          else {
LAB_001822ba:
            lVar30 = uVar21 - 2;
            uVar49 = (ulong)(int)uVar40;
            piVar1 = (int *)(local_3c0 * lVar30 + local_180 + -4 + uVar49 * 4);
            *piVar1 = *piVar1 + 1;
            cVar3 = *(char *)((uVar49 - 1) + (long)local_3b0 * lVar30 + local_1f8._24_8_);
            local_3a0 = local_258;
            local_350 = local_220;
            local_370 = *local_220;
            piVar1 = (int *)(local_370 * lVar30 + local_258 + uVar49 * 4);
            *piVar1 = *piVar1 + 1;
            local_398 = local_2d0._24_8_;
            local_300 = (long *)local_2d0._80_8_;
            plVar32 = *(long **)local_2d0._80_8_;
            uVar15 = *(uint *)(lVar30 * (long)plVar32 + local_2d0._24_8_ + uVar49 * 4);
            uVar56 = uVar40;
            if (cVar3 == '\0') {
              piVar1 = (int *)(local_258 + local_370 * uVar21 + -8 + uVar49 * 4);
              *piVar1 = *piVar1 + 1;
              uVar15 = TTA::MemMerge(uVar15,*(uint *)(local_2d0._24_8_ + (long)plVar32 * uVar21 + -8
                                                     + uVar49 * 4));
              local_350 = local_220;
              local_370 = *local_220;
              piVar1 = (int *)(local_370 * uVar21 + local_258 + uVar49 * 4);
              *piVar1 = *piVar1 + 1;
              local_300 = (long *)local_2d0._80_8_;
              plVar32 = *(long **)local_2d0._80_8_;
              local_338 = local_2d0._24_8_;
              local_318 = local_258;
              local_330 = local_2d0._24_8_;
              local_308 = local_258;
              local_390 = local_2d0._24_8_;
              local_3a0 = local_258;
              local_398 = local_2d0._24_8_;
              local_360 = local_258;
              local_340 = local_2d0._24_8_;
              local_2d8 = local_258;
              local_378 = local_2d0._24_8_;
              local_208 = local_2d0._24_8_;
              local_2e8 = local_258;
              local_348 = local_258;
              local_328 = local_258;
              lVar41 = local_2d0._24_8_;
              uVar40 = uVar49;
              local_358 = local_370;
              local_320 = (long)plVar32;
              local_2f8 = local_370;
              local_2e0 = (long)plVar32;
            }
            else {
              piVar1 = (int *)(local_370 * uVar21 + local_258 + uVar49 * 4);
              *piVar1 = *piVar1 + 1;
              lVar41 = local_2d0._24_8_;
              uVar40 = uVar49;
              local_390 = local_398;
              local_378 = local_398;
              local_360 = local_3a0;
              local_358 = local_370;
              local_348 = local_3a0;
              local_340 = local_398;
              local_338 = local_398;
              local_330 = local_398;
              local_328 = local_3a0;
              local_320 = (long)plVar32;
              local_318 = local_3a0;
              local_308 = local_3a0;
              local_2f8 = local_370;
              local_2e8 = local_3a0;
              local_2e0 = (long)plVar32;
              local_2d8 = local_3a0;
              local_208 = local_398;
            }
          }
        }
        lVar39 = local_3c0 * uVar18 + local_180;
        piVar1 = (int *)(lVar39 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar26 = uVar18 * (long)local_3b0 + local_1f8._24_8_;
        lVar30 = local_180;
        if (*(char *)(lVar42 + 2 + lVar26) == '\0') {
          uVar40 = uVar40 & 0xffffffff;
          goto LAB_001793e5;
        }
        piVar1 = (int *)(lVar38 + 0xc + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar58 + 3 + lVar42) == '\0') goto LAB_0017ceee;
        piVar1 = (int *)(lVar39 + 4 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar26 + 1 + lVar42) == '\0') {
          uVar40 = uVar40 & 0xffffffff;
          goto LAB_0017940d;
        }
        lVar39 = local_3c0 * (uVar21 - 1);
        piVar1 = (int *)(local_180 + lVar39 + 0xc + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar26 = (uVar21 - 1) * (long)local_3b0;
        uVar56 = uVar40;
        if (*(char *)(lVar42 + 3 + local_1f8._24_8_ + lVar26) != '\0') goto LAB_00180bd3;
LAB_0017ce3a:
        lVar39 = lVar39 + local_180;
        piVar1 = (int *)(lVar39 + 0x10 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar26 = lVar26 + local_1f8._24_8_;
        if (*(char *)(lVar42 + 4 + lVar26) == '\0') {
          piVar1 = (int *)(lVar39 + 8 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar26 + 2 + lVar42) != '\0') goto LAB_0018243f;
          lVar30 = local_2f8 * uVar21 + local_2e8;
          piVar1 = (int *)(lVar30 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar41 = local_2e0 * uVar21 + local_208;
          uVar16 = *(undefined4 *)(lVar41 + lVar42 * 4);
          piVar1 = (int *)(lVar30 + 8 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar41 + 8 + lVar42 * 4) = uVar16;
          uVar49 = uVar40 & 0xffffffff;
          lVar41 = local_208;
          goto LAB_0017d0c9;
        }
        lVar30 = uVar21 - 2;
        lVar41 = local_3c0 * lVar30;
        piVar1 = (int *)(local_180 + lVar41 + 0xc + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar38 = (long)local_3b0 * lVar30;
        uVar56 = uVar40;
        if (*(char *)(lVar42 + 3 + local_1f8._24_8_ + lVar38) != '\0') goto LAB_001816a5;
        piVar1 = (int *)(lVar39 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar26 + 2 + lVar42) != '\0') goto LAB_001827d6;
        piVar1 = (int *)(local_2f8 * lVar30 + local_2e8 + 0x10 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar15 = *(uint *)(lVar30 * local_2e0 + local_208 + 0x10 + lVar42 * 4);
        piVar1 = (int *)(local_2f8 * uVar21 + local_2e8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar17 = *(uint *)(local_2e0 * uVar21 + local_208 + lVar42 * 4);
        goto LAB_001828a7;
      }
LAB_0017929c:
      lVar41 = (long)(int)uVar40;
      piVar1 = (int *)(local_3c0 * (uVar21 | 1) + lVar30 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      local_380 = local_380;
      if (*(char *)(lVar41 + (uVar21 | 1) * (long)local_3b0 + (long)local_380) == '\0')
      goto LAB_001793e5;
      piVar1 = (int *)(local_3c0 * uVar21 + lVar30 + 4 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar41 + 1 + (long)local_3b0 * uVar21 + (long)local_380) != '\0')
      goto LAB_0017940d;
      uVar15 = TTA::MemNewLabel();
      local_2f8 = *local_220;
      piVar1 = (int *)(local_2f8 * uVar21 + local_258 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      plVar32 = *(long **)local_2d0._80_8_;
      *(uint *)((long)plVar32 * uVar21 + local_2d0._24_8_ + lVar41 * 4) = uVar15;
LAB_001793d0:
      local_348 = local_258;
      local_328 = local_258;
      local_320 = (long)plVar32;
      lVar41 = local_2d0._24_8_;
      local_338 = local_2d0._24_8_;
      local_3a0 = local_258;
      local_398 = local_2d0._24_8_;
      local_390 = local_2d0._24_8_;
      local_378 = local_2d0._24_8_;
      local_370 = local_2f8;
      local_360 = local_258;
      local_358 = local_2f8;
      local_350 = local_220;
      local_340 = local_2d0._24_8_;
      local_330 = local_2d0._24_8_;
      local_318 = local_258;
      local_308 = local_258;
      local_300 = (long *)local_2d0._80_8_;
      local_2e8 = local_258;
      local_2e0 = (long)plVar32;
      local_2d8 = local_258;
      local_208 = local_2d0._24_8_;
      goto LAB_0017a9e7;
    }
    piVar1 = (int *)(lVar30 + 0xc + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar38 + 3 + lVar42) == '\0') {
      piVar1 = (int *)(local_2e8 + local_2f8 * uVar21 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      uVar16 = *(undefined4 *)(lVar41 + local_2e0 * uVar21 + lVar42 * 4);
      piVar1 = (int *)(local_358 * uVar21 + local_2d8 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_320 * uVar21 + local_340 + 8 + lVar42 * 4) = uVar16;
      uVar40 = uVar40 & 0xffffffff;
      local_328 = local_2d8;
      plVar32 = (long *)local_320;
      local_320 = local_320;
      lVar41 = local_340;
      local_338 = local_338;
      local_370 = local_358;
      local_2f8 = local_358;
      local_2e8 = local_2d8;
      local_2e0 = local_320;
      local_208 = local_340;
      goto LAB_0017a9e7;
    }
    local_3c0 = local_3c0 * (uVar21 - 1);
    piVar1 = (int *)(local_180 + local_3c0 + 0xc + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    lVar58 = (long)local_3b0 * (uVar21 - 1);
    if (*(char *)(lVar42 + 3 + local_1f8._24_8_ + lVar58) == '\0') goto LAB_0017d47a;
    piVar1 = (int *)(local_2f8 * (uVar21 - 2) + local_2e8 + 8 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    uVar15 = *(uint *)((uVar21 - 2) * local_2e0 + lVar41 + 8 + lVar42 * 4);
    piVar1 = (int *)(local_2f8 * uVar21 + local_2e8 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    uVar17 = *(uint *)(local_2e0 * uVar21 + lVar41 + lVar42 * 4);
LAB_0017d3f3:
    uVar15 = TTA::MemMerge(uVar15,uVar17);
    piVar1 = (int *)(*local_220 * uVar21 + local_258 + 8 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    lVar30 = *(long *)local_2d0._80_8_;
    local_340 = local_2d0._24_8_;
    uVar49 = uVar40 & 0xffffffff;
    goto LAB_0017d84e;
  }
  piVar1 = (int *)(local_370 * (uVar21 - 2) + local_328 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  uVar15 = *(uint *)((uVar21 - 2) * (long)local_368 + lVar41 + uVar56 * 4);
  piVar1 = (int *)(local_370 * uVar21 + local_328 + -8 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  uVar15 = TTA::MemMerge(uVar15,*(uint *)((long)local_368 * uVar21 + lVar41 + -8 + uVar56 * 4));
  piVar1 = (int *)(*local_220 * uVar21 + local_258 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  plVar32 = *(long **)local_2d0._80_8_;
LAB_0017b45d:
  local_348 = local_258;
  local_2d8 = local_258;
  lVar41 = local_2d0._24_8_;
  local_3a0 = local_258;
  local_398 = local_2d0._24_8_;
  local_390 = local_2d0._24_8_;
  local_378 = local_2d0._24_8_;
  local_360 = local_258;
  local_350 = local_220;
  local_340 = local_2d0._24_8_;
  local_338 = local_2d0._24_8_;
  local_330 = local_2d0._24_8_;
  local_318 = local_258;
  local_308 = local_258;
  local_300 = (long *)local_2d0._80_8_;
  goto LAB_0017b471;
LAB_00181e7e:
  lVar41 = uVar21 - 2;
  lVar30 = local_3c0 * lVar41 + lVar30;
  piVar1 = (int *)(lVar30 + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  lVar38 = (long)local_3b0 * lVar41 + (long)local_380;
  if (*(char *)(lVar42 + lVar38) == '\0') {
    lVar30 = *local_220 * lVar41 + local_258;
    uVar56 = (ulong)(int)uVar49;
    piVar1 = (int *)(lVar30 + -8 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    lVar41 = lVar41 * *(long *)local_2d0._80_8_ + local_2d0._24_8_;
    uVar15 = *(uint *)(lVar41 + -8 + uVar56 * 4);
    piVar1 = (int *)(lVar30 + 8 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar41 + 8 + uVar56 * 4));
    local_3a0 = local_258;
    local_350 = local_220;
    local_358 = *local_220;
    piVar1 = (int *)(local_358 * uVar21 + local_258 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    local_398 = local_2d0._24_8_;
    plVar32 = *(long **)local_2d0._80_8_;
    local_348 = local_258;
    local_320 = (long)plVar32;
    local_300 = (long *)local_2d0._80_8_;
    lVar30 = local_258;
    lVar41 = local_2d0._24_8_;
    local_390 = local_398;
    local_378 = local_398;
    local_360 = local_3a0;
    local_340 = local_398;
    local_338 = local_398;
    local_330 = local_398;
    local_318 = local_3a0;
    local_308 = local_3a0;
    goto LAB_0017dcb5;
  }
  uVar56 = (ulong)(int)uVar49;
  piVar1 = (int *)(lVar30 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  local_358 = *local_220;
  lVar30 = local_358 * lVar41 + local_258;
  if (*(char *)(lVar38 + uVar56) != '\0') goto code_r0x00181ed4;
  piVar1 = (int *)(lVar30 + -8 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  lVar41 = lVar41 * *(long *)local_2d0._80_8_ + local_2d0._24_8_;
  uVar15 = *(uint *)(lVar41 + -8 + uVar56 * 4);
  piVar1 = (int *)(lVar30 + 8 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  uVar17 = *(uint *)(lVar41 + 8 + uVar56 * 4);
LAB_00179735:
  uVar15 = TTA::MemMerge(uVar15,uVar17);
  local_358 = *local_220;
  piVar1 = (int *)(local_358 * uVar21 + local_258 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  plVar32 = *(long **)local_2d0._80_8_;
  local_320 = (long)plVar32;
  local_300 = (long *)local_2d0._80_8_;
  lVar30 = local_258;
  lVar41 = local_2d0._24_8_;
  local_3a0 = local_258;
  local_398 = local_2d0._24_8_;
  local_390 = local_2d0._24_8_;
  local_378 = local_2d0._24_8_;
  local_360 = local_258;
  local_350 = local_220;
  local_348 = local_258;
  local_340 = local_2d0._24_8_;
  local_338 = local_2d0._24_8_;
  local_330 = local_2d0._24_8_;
  local_318 = local_258;
  local_308 = local_258;
  goto LAB_0017dcb5;
code_r0x00181ed4:
  piVar1 = (int *)(lVar30 + 8 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  plVar32 = *(long **)local_2d0._80_8_;
  uVar15 = *(uint *)(lVar41 * (long)plVar32 + local_2d0._24_8_ + 8 + uVar56 * 4);
  goto LAB_00179551;
LAB_0017c4db:
  local_370 = *local_220;
  lVar30 = local_370 * uVar21 + local_258;
  piVar1 = (int *)(lVar30 + -8 + (long)iVar14 * 4);
  *piVar1 = *piVar1 + 1;
  plVar32 = *(long **)local_2d0._80_8_;
  lVar41 = (long)plVar32 * uVar21 + local_2d0._24_8_;
  uVar16 = *(undefined4 *)(lVar41 + -8 + (long)iVar14 * 4);
  piVar1 = (int *)(lVar30 + uVar40 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar41 + uVar40 * 4) = uVar16;
  uVar40 = uVar49;
LAB_0017c5a8:
  uVar56 = uVar40 & 0xffffffff;
  local_328 = local_258;
  lVar41 = local_2d0._24_8_;
  local_338 = local_2d0._24_8_;
  local_3a0 = local_258;
  local_398 = local_2d0._24_8_;
  local_390 = local_2d0._24_8_;
  local_378 = local_2d0._24_8_;
  local_360 = local_258;
  local_358 = local_370;
  local_350 = local_220;
  local_348 = local_258;
  local_340 = local_2d0._24_8_;
  local_330 = local_2d0._24_8_;
  local_320 = (long)plVar32;
  local_318 = local_258;
  local_308 = local_258;
  local_300 = (long *)local_2d0._80_8_;
  local_2f8 = local_370;
  local_2e8 = local_258;
  local_2e0 = (long)plVar32;
  local_2d8 = local_258;
  local_208 = local_2d0._24_8_;
  goto LAB_0017a31c;
LAB_00180bd3:
  uVar40 = uVar56 & 0xffffffff;
  lVar30 = uVar21 - 2;
  uVar56 = (ulong)(int)uVar56;
  piVar1 = (int *)(local_3c0 * lVar30 + local_180 + -4 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)((uVar56 - 1) + (long)local_3b0 * lVar30 + local_1f8._24_8_) == '\0') {
    lVar41 = *local_220;
    piVar1 = (int *)(lVar41 * lVar30 + local_258 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    lVar42 = *(long *)local_2d0._80_8_;
    uVar15 = *(uint *)(lVar30 * lVar42 + local_2d0._24_8_ + uVar56 * 4);
    piVar1 = (int *)(lVar41 * uVar21 + local_258 + -8 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    uVar17 = *(uint *)(lVar42 * uVar21 + local_2d0._24_8_ + -8 + uVar56 * 4);
  }
  else {
    lVar54 = local_3c0 * (uVar21 - 1);
    lVar45 = (uVar21 - 1) * (long)local_3b0;
LAB_00180c18:
    uVar56 = (ulong)(int)uVar40;
    piVar1 = (int *)(lVar54 + local_180 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    lVar41 = uVar21 - 2;
    if (*(char *)(uVar56 + lVar45 + local_1f8._24_8_) != '\0') {
LAB_00179441:
      lVar41 = *local_220;
      piVar1 = (int *)(lVar41 * (uVar21 - 2) + local_258 + uVar56 * 4);
      *piVar1 = *piVar1 + 1;
      lVar30 = *(long *)local_2d0._80_8_;
      uVar15 = *(uint *)((uVar21 - 2) * lVar30 + local_2d0._24_8_ + uVar56 * 4);
      piVar1 = (int *)(lVar41 * uVar21 + local_258 + uVar56 * 4);
      *piVar1 = *piVar1 + 1;
      local_340 = local_2d0._24_8_;
      uVar49 = uVar40;
      uVar40 = uVar56;
      goto LAB_0017d84e;
    }
    piVar1 = (int *)(local_180 + local_3c0 * lVar41 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    cVar3 = *(char *)(uVar56 + local_1f8._24_8_ + (long)local_3b0 * lVar41);
    local_2d8 = *local_220;
    piVar1 = (int *)(local_2d8 * lVar41 + local_258 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    lVar30 = *(long *)local_2d0._80_8_;
    uVar15 = *(uint *)(lVar41 * lVar30 + local_2d0._24_8_ + uVar56 * 4);
    uVar49 = uVar40;
    if (cVar3 != '\0') goto LAB_0017f5c7;
LAB_001814d4:
    piVar1 = (int *)(local_258 + local_2d8 * uVar21 + -8 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    uVar17 = *(uint *)(local_2d0._24_8_ + lVar30 * uVar21 + -8 + uVar56 * 4);
  }
  uVar15 = TTA::MemMerge(uVar15,uVar17);
  piVar1 = (int *)(*local_220 * uVar21 + local_258 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  lVar30 = *(long *)local_2d0._80_8_;
  local_340 = local_2d0._24_8_;
  uVar49 = uVar40;
  uVar40 = uVar56;
  goto LAB_0017d84e;
LAB_0017ceee:
  uVar40 = uVar40 & 0xffffffff;
LAB_0017a89b:
  lVar30 = (long)(int)uVar40;
  piVar1 = (int *)(local_3c0 * (uVar21 | 1) + local_180 + -4 + lVar30 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar30 + -1 + (uVar21 | 1) * (long)local_3b0 + local_1f8._24_8_) == '\0') {
    uVar15 = TTA::MemNewLabel();
    local_350 = local_220;
    local_370 = *local_220;
    piVar1 = (int *)(local_370 * uVar21 + local_258 + lVar30 * 4);
    *piVar1 = *piVar1 + 1;
    local_300 = (long *)local_2d0._80_8_;
    plVar32 = *(long **)local_2d0._80_8_;
    *(uint *)((long)plVar32 * uVar21 + local_2d0._24_8_ + lVar30 * 4) = uVar15;
    local_318 = local_258;
    local_330 = local_2d0._24_8_;
    local_308 = local_258;
    local_390 = local_2d0._24_8_;
    local_3a0 = local_258;
    local_398 = local_2d0._24_8_;
    local_360 = local_258;
    local_340 = local_2d0._24_8_;
    local_2d8 = local_258;
    local_208 = local_2d0._24_8_;
    local_2e8 = local_258;
    local_378 = local_2d0._24_8_;
    local_348 = local_258;
    local_328 = local_258;
    local_320 = (long)plVar32;
    lVar41 = local_2d0._24_8_;
    local_338 = local_2d0._24_8_;
    local_358 = local_370;
    local_2f8 = local_370;
    local_2e0 = (long)plVar32;
  }
  else {
    lVar42 = local_370 * uVar21 + local_328;
    piVar1 = (int *)(lVar42 + -8 + lVar30 * 4);
    *piVar1 = *piVar1 + 1;
    lVar38 = (long)plVar32 * uVar21 + lVar41;
    uVar16 = *(undefined4 *)(lVar38 + -8 + lVar30 * 4);
    piVar1 = (int *)(lVar42 + lVar30 * 4);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar38 + lVar30 * 4) = uVar16;
    local_320 = local_320;
    local_338 = local_338;
  }
  goto LAB_0017a9e7;
LAB_0017940d:
  uVar56 = (ulong)(int)uVar40;
  piVar1 = (int *)(local_3c0 * (uVar21 - 1) + lVar30 + 4 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  uVar49 = uVar40;
  if (*(char *)(uVar56 + 1 + (uVar21 - 1) * (long)local_3b0 + (long)local_380) != '\0')
  goto LAB_00179441;
LAB_00179488:
  uVar56 = (ulong)(int)uVar49;
  lVar42 = local_3c0 * (uVar21 - 1) + lVar30;
  piVar1 = (int *)(lVar42 + 8 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  lVar41 = (uVar21 - 1) * (long)local_3b0 + (long)local_380;
  cVar3 = *(char *)(uVar56 + 2 + lVar41);
  piVar1 = (int *)(lVar42 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  cVar4 = *(char *)(uVar56 + lVar41);
  lVar41 = local_2d0._24_8_;
  if (cVar3 != '\0') {
    if (cVar4 != '\0') goto LAB_001794d1;
    local_358 = *local_220;
    piVar1 = (int *)(local_358 * (uVar21 - 2) + local_258 + 8 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    plVar32 = *(long **)local_2d0._80_8_;
    uVar15 = *(uint *)((uVar21 - 2) * (long)plVar32 + local_2d0._24_8_ + 8 + uVar56 * 4);
    piVar1 = (int *)(local_358 * uVar21 + local_258 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    local_320 = (long)plVar32;
    local_300 = (long *)local_2d0._80_8_;
    lVar30 = local_258;
    local_3a0 = local_258;
    local_398 = local_2d0._24_8_;
    local_390 = local_2d0._24_8_;
    local_378 = local_2d0._24_8_;
    local_360 = local_258;
    local_350 = local_220;
    local_348 = local_258;
    local_340 = local_2d0._24_8_;
    local_338 = local_2d0._24_8_;
    local_330 = local_2d0._24_8_;
    local_318 = local_258;
    local_308 = local_258;
    goto LAB_0017dcb5;
  }
  if (cVar4 != '\0') {
    local_350 = local_220;
    lVar30 = *local_220;
    piVar1 = (int *)(lVar30 * (uVar21 - 2) + local_258 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    local_300 = (long *)local_2d0._80_8_;
    plVar32 = *(long **)local_2d0._80_8_;
    uVar15 = *(uint *)((uVar21 - 2) * (long)plVar32 + local_2d0._24_8_ + uVar56 * 4);
    piVar1 = (int *)(lVar30 * uVar21 + local_258 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    local_378 = local_2d0._24_8_;
    local_338 = local_2d0._24_8_;
    local_318 = local_258;
    local_330 = local_2d0._24_8_;
    local_308 = local_258;
    local_390 = local_2d0._24_8_;
    local_3a0 = local_258;
    local_398 = local_2d0._24_8_;
    local_360 = local_258;
    local_340 = local_2d0._24_8_;
    local_348 = local_258;
    local_2d8 = local_258;
    goto LAB_0017b471;
  }
  uVar15 = TTA::MemNewLabel();
  local_350 = local_220;
  local_358 = *local_220;
  piVar1 = (int *)(local_358 * uVar21 + local_258 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  local_320 = *(long *)local_2d0._80_8_;
  *(uint *)(local_320 * uVar21 + local_2d0._24_8_ + uVar56 * 4) = uVar15;
  local_338 = local_2d0._24_8_;
  local_318 = local_258;
  local_330 = local_2d0._24_8_;
  local_308 = local_258;
  local_390 = local_2d0._24_8_;
  local_3a0 = local_258;
  local_398 = local_2d0._24_8_;
  local_360 = local_258;
  local_340 = local_2d0._24_8_;
  local_2d8 = local_258;
  local_378 = local_2d0._24_8_;
  local_348 = local_258;
  local_2e8 = local_258;
  local_300 = (long *)local_2d0._80_8_;
  lVar41 = local_2d0._24_8_;
  local_2f8 = local_358;
  local_2e0 = local_320;
  goto LAB_0017d0c9;
LAB_0017ef18:
  uVar56 = (ulong)(int)uVar49;
  piVar1 = (int *)(lVar41 + local_180 + -4 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  cVar3 = *(char *)((uVar56 - 1) + lVar58 + local_1f8._24_8_);
  local_358 = *local_220;
  piVar1 = (int *)(local_358 * (uVar21 - 2) + local_258 + 8 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  plVar32 = *(long **)local_2d0._80_8_;
  uVar15 = *(uint *)((uVar21 - 2) * (long)plVar32 + local_2d0._24_8_ + 8 + uVar56 * 4);
  if (cVar3 != '\0') {
    piVar1 = (int *)(local_358 * uVar21 + local_258 + uVar56 * 4);
    *piVar1 = *piVar1 + 1;
    local_320 = (long)plVar32;
    local_300 = (long *)local_2d0._80_8_;
    lVar30 = local_258;
    lVar41 = local_2d0._24_8_;
    local_3a0 = local_258;
    local_398 = local_2d0._24_8_;
    local_390 = local_2d0._24_8_;
    local_378 = local_2d0._24_8_;
    local_360 = local_258;
    local_350 = local_220;
    local_348 = local_258;
    local_340 = local_2d0._24_8_;
    local_338 = local_2d0._24_8_;
    local_330 = local_2d0._24_8_;
    local_318 = local_258;
    local_308 = local_258;
    goto LAB_0017dcb5;
  }
  uVar56 = (ulong)(int)uVar49;
  piVar1 = (int *)(local_258 + local_358 * uVar21 + -8 + uVar56 * 4);
  *piVar1 = *piVar1 + 1;
  uVar17 = *(uint *)(local_2d0._24_8_ + (long)plVar32 * uVar21 + -8 + uVar56 * 4);
  goto LAB_00179735;
LAB_001809e7:
  uVar40 = lVar47 + 0x200000000 >> 0x20;
  uVar49 = (ulong)(uint)(iVar14 + (int)lVar27);
LAB_00180a21:
  lVar41 = uVar21 - 2;
  piVar1 = (int *)(local_3c0 * lVar41 + lVar30 + uVar40 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(uVar40 + (long)local_3b0 * lVar41 + (long)local_380) == '\0') {
    lVar30 = *local_220 * lVar41 + local_258;
    piVar1 = (int *)(lVar30 + -8 + (long)(int)uVar49 * 4);
    *piVar1 = *piVar1 + 1;
    lVar41 = lVar41 * *(long *)local_2d0._80_8_ + local_2d0._24_8_;
    uVar15 = *(uint *)(lVar41 + -8 + (long)(int)uVar49 * 4);
    piVar1 = (int *)(lVar30 + uVar40 * 4);
    *piVar1 = *piVar1 + 1;
    uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar41 + uVar40 * 4));
    piVar1 = (int *)(*local_220 * uVar21 + local_258 + uVar40 * 4);
    *piVar1 = *piVar1 + 1;
    plVar32 = *(long **)local_2d0._80_8_;
    local_340 = local_2d0._24_8_;
  }
  else {
    lVar30 = *local_220;
    piVar1 = (int *)(lVar30 * lVar41 + local_258 + uVar40 * 4);
    *piVar1 = *piVar1 + 1;
    plVar32 = *(long **)local_2d0._80_8_;
    uVar15 = *(uint *)(lVar41 * (long)plVar32 + local_2d0._24_8_ + uVar40 * 4);
    piVar1 = (int *)(lVar30 * uVar21 + local_258 + uVar40 * 4);
    *piVar1 = *piVar1 + 1;
    local_340 = local_2d0._24_8_;
  }
  goto LAB_0017fd0e;
LAB_00184bc8:
  local_320 = local_320 + local_310 * lVar44;
  piVar1 = (int *)(lVar38 + local_320);
  *piVar1 = *piVar1 + 1;
  lVar42 = (long)local_300 + lVar58 * lVar44;
  uVar16 = *(undefined4 *)(lVar38 + lVar42);
  piVar1 = (int *)(local_320 + lVar26 * 4 + 8 + lVar39 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar42 + lVar26 * 4 + 8 + lVar39 * 4) = uVar16;
  local_2f0 = local_348;
  lVar42 = local_180;
  uVar21 = (ulong)(uint)(iVar31 + iVar51);
LAB_00184d33:
  do {
    iVar14 = (int)uVar21;
    uVar13 = iVar14 + 2;
    local_348 = local_2f0;
    local_398 = local_370;
    if (iVar43 <= (int)uVar13) {
LAB_00186532:
      if (iVar43 < (int)uVar13) {
        uVar21 = (ulong)uVar13;
        local_370 = local_398;
        local_2f0 = local_348;
        goto LAB_00186555;
      }
      lVar38 = (long)(int)uVar13;
      piVar1 = (int *)(*local_148 * lVar44 + local_180 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      lVar42 = lVar41 * lVar44;
      if (*(char *)(lVar38 + local_358 + lVar42) == '\0') {
        uVar21 = (ulong)uVar13;
        goto LAB_001869e5;
      }
      lVar42 = (long)iVar14;
      piVar1 = (int *)(*local_148 * lVar30 + local_180 + 0xc + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar58 = lVar41 * lVar30 + local_358;
      if (*(char *)(lVar42 + 3 + lVar58) == '\0') {
        local_348 = local_348 + *local_3b0 * lVar44;
        piVar1 = (int *)(local_348 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        local_398 = local_398 + lVar44 * *local_380;
        uVar13 = *(uint *)(local_398 + lVar42 * 4);
        piVar1 = (int *)(local_348 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        goto LAB_00178bde;
      }
      piVar1 = (int *)(*local_148 * lVar53 + local_180 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      lVar41 = lVar41 * lVar53;
      if ((*(char *)(lVar38 + local_358 + lVar41) != '\0') &&
         (piVar1 = (int *)(lVar30 * *local_148 + local_180 + lVar42 * 4), *piVar1 = *piVar1 + 1,
         *(char *)(lVar58 + lVar42) != '\0')) {
        uVar21 = (ulong)uVar13;
        goto LAB_00186748;
      }
      lVar30 = *local_3b0;
      piVar1 = (int *)(lVar30 * lVar53 + local_348 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      lVar41 = *local_380;
      uVar13 = *(uint *)(lVar53 * lVar41 + local_398 + lVar38 * 4);
      piVar1 = (int *)(lVar30 * lVar44 + local_348 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      uVar13 = TTA::MemMerge(uVar13,*(uint *)(lVar41 * lVar44 + local_398 + lVar42 * 4));
      piVar1 = (int *)(*local_220 * lVar44 + local_258 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      local_328 = lVar44 * *(long *)local_2d0._80_8_ + local_2d0._24_8_;
LAB_00186fe3:
      *(uint *)(local_328 + lVar38 * 4) = uVar13;
      goto LAB_00186fec;
    }
    lVar25 = local_3b8 * lVar44;
    local_368 = (long *)local_1f8._80_8_;
    local_3b0 = local_220;
    local_398 = local_2d0._24_8_;
    local_380 = (long *)local_2d0._80_8_;
    lVar29 = (long)iVar14;
    lVar38 = lVar29 + 2;
    local_3b8 = *local_148;
    lVar22 = local_358 + lVar41 * lVar44 + lVar29;
    lVar39 = lVar29 << 0x20;
    lVar58 = local_180 + local_3b8 * lVar30 + lVar29 * 4;
    local_358 = local_1f8._24_8_;
    lVar33 = local_1f8._24_8_ + lVar29;
    lVar26 = local_2d0._24_8_ + lVar29 * 4;
    local_360 = local_258;
    lVar28 = local_258 + lVar29 * 4;
    lVar34 = 0;
    while( true ) {
      piVar1 = (int *)(lVar42 + lVar25 + lVar29 * 4 + 8 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      local_348 = local_258;
      if (*(char *)(lVar22 + 2 + lVar34) == '\0') {
        local_3a0 = (ulong)(uint)((int)lVar38 + (int)lVar34);
        lVar41 = *(long *)local_1f8._80_8_;
        local_378 = local_2d0._24_8_;
        local_390 = local_180;
        local_328 = local_2d0._24_8_;
        local_370 = local_378;
        local_338 = local_348;
        local_320 = local_348;
        goto LAB_0018455f;
      }
      piVar1 = (int *)(lVar58 + 0xc + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      lVar41 = *(long *)local_1f8._80_8_;
      lVar50 = lVar33 + lVar41 * lVar30;
      lVar20 = lVar39 >> 0x1e;
      lVar57 = lVar39 >> 0x20;
      if (*(char *)(lVar34 + 3 + lVar50) != '\0') break;
      piVar1 = (int *)(local_180 + 0xc + local_3b8 * lVar44 + lVar29 * 4 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar34 + 3 + lVar41 * lVar44 + lVar33) == '\0') {
        lVar41 = local_258 + *local_220 * lVar44;
        piVar1 = (int *)(lVar20 + lVar41);
        *piVar1 = *piVar1 + 1;
        lVar42 = local_2d0._24_8_ + *(long *)local_2d0._80_8_ * lVar44;
        uVar16 = *(undefined4 *)(lVar20 + lVar42);
        piVar1 = (int *)(lVar41 + lVar29 * 4 + 8 + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar42 + lVar29 * 4 + 8 + lVar34 * 4) = uVar16;
        uVar15 = (int)lVar38 + (int)lVar34;
        goto LAB_001850e3;
      }
      piVar1 = (int *)(lVar58 + 0x10 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar34 + 4 + lVar50) != '\0') {
        local_3a0 = lVar38 + lVar34;
        piVar1 = (int *)(*local_148 * lVar53 + local_180 + lVar29 * 4 + 0xc + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        lVar39 = lVar41 * lVar53;
        uVar21 = lVar29 + 2 + lVar34;
        if (*(char *)(lVar34 + 3 + lVar33 + lVar39) == '\0') {
          lVar41 = *local_220;
          piVar1 = (int *)(lVar28 + lVar41 * lVar53 + 0x10 + lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          lVar42 = *(long *)local_2d0._80_8_;
          uVar13 = *(uint *)(lVar26 + lVar42 * lVar53 + 0x10 + lVar34 * 4);
          piVar1 = (int *)(lVar20 + local_258 + lVar41 * lVar44);
          *piVar1 = *piVar1 + 1;
          uVar13 = TTA::MemMerge(uVar13,*(uint *)(lVar20 + local_2d0._24_8_ + lVar42 * lVar44));
          local_310 = *local_220;
          piVar1 = (int *)(local_310 * lVar44 + local_258 + lVar29 * 4 + 8 + lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          lVar58 = *(long *)local_2d0._80_8_;
          local_338 = local_258;
          local_348 = local_258;
          local_360 = local_258;
          local_320 = local_258;
          local_328 = local_2d0._24_8_;
          local_3b0 = local_220;
          local_398 = local_2d0._24_8_;
          local_380 = (long *)local_2d0._80_8_;
          local_378 = local_2d0._24_8_;
          local_370 = local_2d0._24_8_;
          goto LAB_001847b3;
        }
        piVar1 = (int *)(*local_148 * lVar53 + local_180 + lVar29 * 4 + 8 + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar34 + 2 + lVar33 + lVar39) == '\0') {
          lVar41 = *local_220;
          piVar1 = (int *)(lVar28 + lVar41 * lVar53 + 0x10 + lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          lVar42 = *(long *)local_2d0._80_8_;
          uVar13 = *(uint *)(lVar26 + lVar42 * lVar53 + 0x10 + lVar34 * 4);
          piVar1 = (int *)(lVar20 + local_258 + lVar41 * lVar44);
          *piVar1 = *piVar1 + 1;
          uVar15 = *(uint *)(lVar20 + local_2d0._24_8_ + lVar42 * lVar44);
        }
        else {
          piVar1 = (int *)(lVar20 + *local_148 * lVar30 + local_180);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar41 * lVar30 + local_1f8._24_8_ + lVar57) != '\0') {
            local_378 = local_2d0._24_8_;
            local_328 = local_2d0._24_8_;
            local_2f0 = local_258;
            local_338 = local_258;
            local_370 = local_2d0._24_8_;
            goto LAB_001851e8;
          }
          lVar41 = *local_220;
          piVar1 = (int *)(lVar28 + lVar41 * lVar53 + 0x10 + lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          lVar42 = *(long *)local_2d0._80_8_;
          uVar13 = *(uint *)(lVar26 + lVar42 * lVar53 + 0x10 + lVar34 * 4);
          piVar1 = (int *)(local_258 + lVar41 * lVar44 + lVar57 * 4);
          *piVar1 = *piVar1 + 1;
          uVar15 = *(uint *)(local_2d0._24_8_ + lVar42 * lVar44 + lVar57 * 4);
        }
        uVar13 = TTA::MemMerge(uVar13,uVar15);
        local_310 = *local_220;
        piVar1 = (int *)(local_310 * lVar44 + local_258 + lVar29 * 4 + 8 + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        lVar58 = *(long *)local_2d0._80_8_;
        local_338 = local_258;
        local_348 = local_258;
        local_360 = local_258;
        local_320 = local_258;
        local_328 = local_2d0._24_8_;
        local_3b0 = local_220;
        local_398 = local_2d0._24_8_;
        local_380 = (long *)local_2d0._80_8_;
        local_378 = local_2d0._24_8_;
        local_370 = local_2d0._24_8_;
        goto LAB_001847b3;
      }
      lVar50 = *local_220 * lVar44 + lVar28;
      piVar1 = (int *)(lVar50 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      lVar57 = *(long *)local_2d0._80_8_ * lVar44 + lVar26;
      uVar16 = *(undefined4 *)(lVar57 + lVar34 * 4);
      piVar1 = (int *)(lVar50 + 8 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar57 + 8 + lVar34 * 4) = uVar16;
      lVar39 = lVar39 + 0x200000000;
      lVar50 = lVar29 + lVar34;
      lVar34 = lVar34 + 2;
      if ((long)uVar46 <= lVar50 + 4) {
        uVar13 = iVar14 + (int)lVar34 + 2;
        iVar14 = iVar14 + (int)lVar34;
        goto LAB_00186532;
      }
    }
    piVar1 = (int *)(*local_148 * lVar53 + local_180 + lVar29 * 4 + 8 + lVar34 * 4);
    *piVar1 = *piVar1 + 1;
    local_3a0 = lVar38 + lVar34;
    lVar41 = *(long *)local_1f8._80_8_;
    uVar21 = lVar29 + 2 + lVar34;
    if (*(char *)(lVar29 + lVar34 + 2 + lVar41 * lVar53 + local_1f8._24_8_) == '\0') {
      lVar41 = *local_220;
      piVar1 = (int *)(lVar41 * lVar53 + local_258 + lVar29 * 4 + 8 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      lVar42 = *(long *)local_2d0._80_8_;
      uVar13 = *(uint *)(lVar42 * lVar53 + local_2d0._24_8_ + lVar29 * 4 + 8 + lVar34 * 4);
      piVar1 = (int *)(lVar20 + lVar41 * lVar44 + local_258);
      *piVar1 = *piVar1 + 1;
      uVar15 = *(uint *)(lVar20 + lVar42 * lVar44 + local_2d0._24_8_);
    }
    else {
      piVar1 = (int *)(lVar20 + *local_148 * lVar30 + local_180);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar57 + local_1f8._24_8_ + lVar41 * lVar30) != '\0') goto LAB_00185002;
      lVar41 = *local_220;
      piVar1 = (int *)(lVar41 * lVar53 + local_258 + lVar29 * 4 + 8 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      lVar42 = *(long *)local_2d0._80_8_;
      uVar13 = *(uint *)(lVar42 * lVar53 + local_2d0._24_8_ + lVar29 * 4 + 8 + lVar34 * 4);
      piVar1 = (int *)(lVar41 * lVar44 + local_258 + lVar57 * 4);
      *piVar1 = *piVar1 + 1;
      uVar15 = *(uint *)(lVar42 * lVar44 + local_2d0._24_8_ + lVar57 * 4);
    }
    uVar13 = TTA::MemMerge(uVar13,uVar15);
    local_310 = *local_220;
    piVar1 = (int *)(local_310 * lVar44 + local_258 + lVar29 * 4 + 8 + lVar34 * 4);
    *piVar1 = *piVar1 + 1;
    lVar58 = *(long *)local_2d0._80_8_;
    local_2f0 = local_258;
    local_328 = local_2d0._24_8_;
    plVar32 = (long *)local_2d0._24_8_;
LAB_00185688:
    *(uint *)(lVar58 * lVar44 + (long)plVar32 + uVar21 * 4) = uVar13;
    iVar14 = (int)local_3a0;
    local_3a0._0_4_ = iVar14 + 2;
    local_358 = local_1f8._24_8_;
    if (iVar43 <= (int)(uint)local_3a0) {
LAB_0018643c:
      local_3b8 = *local_148;
      local_390 = local_180;
      uVar21 = (ulong)(int)(uint)local_3a0;
      piVar1 = (int *)(local_3b8 * lVar44 + local_180 + uVar21 * 4);
      *piVar1 = *piVar1 + 1;
      lVar41 = *(long *)local_1f8._80_8_;
      lVar42 = lVar41 * lVar44 + local_1f8._24_8_;
      if (iVar43 < (int)(uint)local_3a0) {
        if (*(char *)(uVar21 + lVar42) == '\0') {
          piVar1 = (int *)(local_2f0 + local_310 * lVar44 + uVar21 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_328 + lVar58 * lVar44 + uVar21 * 4) = 0;
          goto LAB_00186fec;
        }
        lVar41 = (long)iVar14;
        piVar1 = (int *)(*local_148 * lVar44 + local_180 + 4 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar42 + 1 + lVar41) != '\0') {
          local_2f0 = local_2f0 + local_310 * lVar44;
          piVar1 = (int *)(local_2f0 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          local_328 = local_328 + lVar58 * lVar44;
          uVar16 = *(undefined4 *)(local_328 + lVar41 * 4);
          piVar1 = (int *)(local_2f0 + uVar21 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_328 + uVar21 * 4) = uVar16;
          goto LAB_00186fec;
        }
        lVar41 = *(long *)local_1f8._80_8_ * lVar30;
      }
      else {
        if (*(char *)(uVar21 + lVar42) == '\0') goto LAB_00186ac6;
        lVar38 = (long)iVar14;
        piVar1 = (int *)(*local_148 * lVar44 + local_180 + 4 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        uVar13 = (uint)local_3a0;
        if (*(char *)(lVar42 + 1 + lVar38) != '\0') {
LAB_001867dd:
          lVar38 = (long)(int)uVar13;
          piVar1 = (int *)(*local_148 * lVar30 + local_180 + 4 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          lVar41 = *(long *)local_1f8._80_8_ * lVar30 + local_1f8._24_8_;
          if (*(char *)(lVar38 + 1 + lVar41) == '\0') {
            local_2f0 = local_2f0 + local_310 * lVar44;
            piVar1 = (int *)(local_2f0 + -8 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            local_328 = local_328 + lVar58 * lVar44;
            uVar13 = *(uint *)(local_328 + -8 + lVar38 * 4);
            piVar1 = (int *)(local_2f0 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            goto LAB_00186fe3;
          }
          piVar1 = (int *)(lVar30 * *local_148 + local_180 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar41 + lVar38) == '\0') {
            piVar1 = (int *)(*local_148 * lVar53 + local_180 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            cVar3 = *(char *)(lVar38 + *(long *)local_1f8._80_8_ * lVar53 + local_1f8._24_8_);
            piVar1 = (int *)(local_310 * lVar53 + local_2f0 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            uVar13 = *(uint *)(lVar53 * lVar58 + local_328 + lVar38 * 4);
            if (cVar3 == '\0') {
              piVar1 = (int *)(local_2f0 + local_310 * lVar44 + -8 + lVar38 * 4);
              *piVar1 = *piVar1 + 1;
              uVar13 = TTA::MemMerge(uVar13,*(uint *)(local_328 + lVar58 * lVar44 + -8 + lVar38 * 4)
                                    );
              piVar1 = (int *)(*local_220 * lVar44 + local_258 + lVar38 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(lVar44 * *(long *)local_2d0._80_8_ + local_2d0._24_8_ + lVar38 * 4) = uVar13
              ;
            }
            else {
              piVar1 = (int *)(local_2f0 + local_310 * lVar44 + lVar38 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_328 + lVar58 * lVar44 + lVar38 * 4) = uVar13;
            }
          }
          else {
            piVar1 = (int *)(local_310 * lVar53 + local_2f0 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            uVar16 = *(undefined4 *)(lVar53 * lVar58 + local_328 + lVar38 * 4);
            piVar1 = (int *)(local_310 * lVar44 + local_2f0 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar58 * lVar44 + local_328 + lVar38 * 4) = uVar16;
          }
          goto LAB_00186fec;
        }
        piVar1 = (int *)(*local_148 * lVar30 + local_180 + 0xc + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        lVar41 = *(long *)local_1f8._80_8_ * lVar30;
        if (*(char *)(lVar38 + 3 + local_1f8._24_8_ + lVar41) != '\0') {
          piVar1 = (int *)(lVar30 * *local_148 + local_180 + uVar21 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_1f8._24_8_ + lVar41 + uVar21) == '\0') {
LAB_00187858:
            piVar1 = (int *)(*local_148 * lVar53 + local_180 + uVar21 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(uVar21 + *(long *)local_1f8._80_8_ * lVar53 + local_1f8._24_8_) == '\0') {
              local_2f0 = local_2f0 + local_310 * lVar53;
              piVar1 = (int *)(local_2f0 + -8 + (long)(int)(uint)local_3a0 * 4);
              *piVar1 = *piVar1 + 1;
              local_328 = local_328 + lVar58 * lVar53;
              uVar13 = *(uint *)(local_328 + -8 + (long)(int)(uint)local_3a0 * 4);
              piVar1 = (int *)(local_2f0 + uVar21 * 4);
              *piVar1 = *piVar1 + 1;
              uVar13 = TTA::MemMerge(uVar13,*(uint *)(local_328 + uVar21 * 4));
              piVar1 = (int *)(*local_220 * lVar44 + local_258 + uVar21 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(lVar44 * *(long *)local_2d0._80_8_ + local_2d0._24_8_ + uVar21 * 4) = uVar13
              ;
              goto LAB_00186fec;
            }
            piVar1 = (int *)(local_310 * lVar53 + local_2f0 + uVar21 * 4);
            *piVar1 = *piVar1 + 1;
            uVar16 = *(undefined4 *)(lVar53 * lVar58 + local_328 + uVar21 * 4);
          }
          else {
            piVar1 = (int *)(local_310 * lVar53 + local_2f0 + uVar21 * 4);
            *piVar1 = *piVar1 + 1;
            uVar16 = *(undefined4 *)(lVar53 * lVar58 + local_328 + uVar21 * 4);
          }
          piVar1 = (int *)(local_310 * lVar44 + local_2f0 + uVar21 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar58 * lVar44 + local_328 + uVar21 * 4) = uVar16;
          goto LAB_00186fec;
        }
      }
      piVar1 = (int *)(lVar30 * *local_148 + local_180 + uVar21 * 4);
      *piVar1 = *piVar1 + 1;
      lVar30 = local_310 * lVar53 + local_2f0;
      if (*(char *)(uVar21 + lVar41 + local_1f8._24_8_) == '\0') {
        piVar1 = (int *)(lVar30 + (long)iVar14 * 4);
        *piVar1 = *piVar1 + 1;
        uVar16 = *(undefined4 *)(lVar53 * lVar58 + local_328 + (long)iVar14 * 4);
      }
      else {
        piVar1 = (int *)(lVar30 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
        uVar16 = *(undefined4 *)(lVar53 * lVar58 + local_328 + uVar21 * 4);
      }
      piVar1 = (int *)(local_2f0 + local_310 * lVar44 + uVar21 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar58 * lVar44 + local_328 + uVar21 * 4) = uVar16;
      goto LAB_00186fec;
    }
    local_3b8 = *local_148;
    local_368 = (long *)local_1f8._80_8_;
    lVar41 = *(long *)local_1f8._80_8_;
    local_3b0 = local_220;
    lVar25 = (long)iVar14;
    lVar50 = lVar25 << 0x20;
    lVar38 = local_180 + local_3b8 * lVar44 + lVar25 * 4;
    lVar29 = lVar41 * lVar44 + lVar25;
    lVar26 = local_180 + local_3b8 * lVar30 + lVar25 * 4;
    lVar57 = lVar41 * lVar30 + lVar25;
    local_380 = (long *)local_2d0._80_8_;
    lVar42 = lVar25 + 2;
    lVar39 = local_1f8._24_8_ + 3 + lVar29;
    lVar28 = local_1f8._24_8_ + 2 + lVar57;
    lVar33 = local_2d0._24_8_ + 8 + lVar25 * 4;
    local_2f0 = local_258;
    lVar34 = local_258 + lVar25 * 4 + 8;
    lVar22 = 0;
LAB_001857a4:
    piVar1 = (int *)(lVar38 + 8 + lVar22 * 4);
    *piVar1 = *piVar1 + 1;
    iVar31 = (int)lVar22;
    iVar51 = (int)lVar42;
    if (*(char *)(lVar39 + -1 + lVar22) == '\0') {
      local_3a0 = (ulong)(uint)(iVar51 + iVar31);
      lVar42 = local_180;
      local_390 = local_180;
      lVar38 = local_1f8._24_8_;
      local_358 = local_1f8._24_8_;
      goto LAB_001835f6;
    }
    piVar1 = (int *)(lVar38 + 4 + lVar22 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar39 + -2 + lVar22) == '\0') {
      piVar1 = (int *)(lVar26 + 0xc + lVar22 * 4);
      *piVar1 = *piVar1 + 1;
      local_328 = local_2d0._24_8_;
      if (*(char *)(lVar28 + 1 + lVar22) == '\0') {
        uVar21 = lVar42 + lVar22;
        piVar1 = (int *)(*local_148 * lVar44 + local_180 + lVar25 * 4 + 0xc + lVar22 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = *local_148 * lVar30 + local_180;
        lVar38 = lVar50 >> 0x1e;
        if (*(char *)(lVar22 + 3 + lVar29 + local_1f8._24_8_) == '\0') {
          piVar1 = (int *)(lVar42 + lVar25 * 4 + 8 + lVar22 * 4);
          *piVar1 = *piVar1 + 1;
          lVar41 = *local_220;
          if (*(char *)(lVar22 + 2 + local_1f8._24_8_ + lVar57) == '\0') {
            piVar1 = (int *)(lVar41 * lVar53 + local_258 + lVar38);
            *piVar1 = *piVar1 + 1;
            lVar42 = *(long *)local_2d0._80_8_;
            uVar16 = *(undefined4 *)(lVar38 + lVar42 * lVar53 + local_2d0._24_8_);
            piVar1 = (int *)(local_258 + lVar25 * 4 + lVar41 * lVar44 + 8 + lVar22 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2d0._24_8_ + lVar25 * 4 + lVar42 * lVar44 + 8 + lVar22 * 4) =
                 uVar16;
          }
          else {
            lVar42 = local_258 + lVar25 * 4;
            piVar1 = (int *)(lVar41 * lVar53 + lVar42 + 8 + lVar22 * 4);
            *piVar1 = *piVar1 + 1;
            lVar58 = *(long *)local_2d0._80_8_;
            lVar38 = local_2d0._24_8_ + lVar25 * 4;
            uVar16 = *(undefined4 *)(lVar58 * lVar53 + lVar38 + 8 + lVar22 * 4);
            piVar1 = (int *)(lVar41 * lVar44 + lVar42 + 8 + lVar22 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar58 * lVar44 + lVar38 + 8 + lVar22 * 4) = uVar16;
          }
LAB_001861ab:
          uVar15 = (uint)uVar21;
          goto LAB_001850e3;
        }
        piVar1 = (int *)(lVar42 + (lVar50 + 0x400000000 >> 0x1e));
        *piVar1 = *piVar1 + 1;
        cVar3 = *(char *)(local_1f8._24_8_ + lVar41 * lVar30 + (lVar50 + 0x400000000 >> 0x20));
        local_3b8 = *local_148;
        piVar1 = (int *)(local_3b8 * lVar30 + local_180 + lVar25 * 4 + 8 + lVar22 * 4);
        *piVar1 = *piVar1 + 1;
        cVar4 = *(char *)(lVar22 + 2 + lVar57 + local_1f8._24_8_);
        local_398 = local_2d0._24_8_;
        local_3a0._0_4_ = (uint)uVar21;
        local_360 = local_258;
        if (cVar3 == '\0') {
          local_310 = *local_220;
          if (cVar4 == '\0') {
            piVar1 = (int *)(local_310 * lVar53 + local_258 + lVar38);
            *piVar1 = *piVar1 + 1;
            lVar58 = *(long *)local_2d0._80_8_;
            uVar13 = *(uint *)(lVar38 + lVar58 * lVar53 + local_2d0._24_8_);
            piVar1 = (int *)(local_258 + lVar25 * 4 + local_310 * lVar44 + 8 + lVar22 * 4);
            *piVar1 = *piVar1 + 1;
            local_370 = local_2d0._24_8_;
            break;
          }
          local_390 = local_180;
          piVar1 = (int *)(local_258 + lVar25 * 4 + local_310 * lVar53 + 8 + lVar22 * 4);
          *piVar1 = *piVar1 + 1;
          lVar58 = *(long *)local_2d0._80_8_;
          local_300 = (long *)local_2d0._24_8_;
          local_378 = local_398;
          local_370 = local_398;
          local_348 = local_360;
          local_338 = local_360;
          goto LAB_00183867;
        }
        if (cVar4 != '\0') {
          local_3a0 = uVar21 & 0xffffffff;
          goto LAB_00183745;
        }
        local_378 = local_2d0._24_8_;
LAB_00186090:
        local_3a0 = uVar21 & 0xffffffff;
        uVar40 = (ulong)(int)uVar21;
        piVar1 = (int *)(*local_148 * lVar53 + local_180 + 4 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        local_358 = lVar41 * lVar53 + local_358;
        if (*(char *)(uVar40 + 1 + local_358) == '\0') {
          local_2f0 = local_2f0 + *local_3b0 * lVar53;
          uVar40 = (ulong)(int)uVar21;
          piVar1 = (int *)(local_2f0 + -8 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          local_378 = local_378 + *local_380 * lVar53;
          uVar13 = *(uint *)(local_378 + -8 + uVar40 * 4);
          piVar1 = (int *)(local_2f0 + 8 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          goto LAB_00183ac6;
        }
        piVar1 = (int *)(*local_148 * lVar53 + local_180 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        local_310 = *local_3b0;
        lVar41 = local_310 * lVar53 + local_2f0;
        if (*(char *)(local_358 + uVar40) == '\0') {
          piVar1 = (int *)(lVar41 + -8 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          local_378 = local_378 + *local_380 * lVar53;
          uVar13 = *(uint *)(local_378 + -8 + uVar40 * 4);
          piVar1 = (int *)(lVar41 + 8 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          uVar15 = *(uint *)(local_378 + 8 + uVar40 * 4);
          goto LAB_00183acf;
        }
        piVar1 = (int *)(lVar41 + 8 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        lVar58 = *local_380;
        uVar13 = *(uint *)(lVar58 * lVar53 + local_378 + 8 + uVar40 * 4);
        piVar1 = (int *)(local_310 * lVar44 + local_2f0 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        local_338 = local_2f0;
        local_348 = local_2f0;
        local_320 = local_2f0;
        uVar21 = uVar40;
        local_328 = local_378;
        local_370 = local_378;
        goto LAB_001847b3;
      }
      piVar1 = (int *)(lVar26 + 8 + lVar22 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar28 + lVar22) != '\0') goto code_r0x001857e3;
      local_3a0 = (ulong)(uint)(iVar51 + iVar31);
      uVar21 = lVar50 + 0x200000000 >> 0x20;
LAB_00185bf4:
      piVar1 = (int *)(*local_148 * lVar53 + local_180 + uVar21 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(uVar21 + lVar41 * lVar53 + local_358) == '\0') {
        local_2f0 = local_2f0 + *local_3b0 * lVar53;
        piVar1 = (int *)(local_2f0 + -8 + (long)(int)local_3a0 * 4);
        *piVar1 = *piVar1 + 1;
        local_328 = local_328 + *local_380 * lVar53;
        uVar13 = *(uint *)(local_328 + -8 + (long)(int)local_3a0 * 4);
        piVar1 = (int *)(local_2f0 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
        uVar15 = *(uint *)(local_328 + uVar21 * 4);
LAB_00185d69:
        uVar13 = TTA::MemMerge(uVar13,uVar15);
        local_310 = *local_220;
LAB_00185f36:
        piVar1 = (int *)(local_310 * lVar44 + local_258 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
        lVar58 = *(long *)local_2d0._80_8_;
        local_2f0 = local_258;
        local_328 = local_2d0._24_8_;
        plVar32 = (long *)local_2d0._24_8_;
      }
      else {
        local_310 = *local_3b0;
        piVar1 = (int *)(local_310 * lVar53 + local_2f0 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
LAB_00185c58:
        lVar58 = *local_380;
        uVar13 = *(uint *)(lVar58 * lVar53 + local_328 + uVar21 * 4);
        piVar1 = (int *)(local_310 * lVar44 + local_2f0 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
        plVar32 = (long *)local_328;
      }
      goto LAB_00185688;
    }
    local_3a0 = (ulong)(uint)(iVar51 + iVar31);
LAB_001858b6:
    uVar15 = (uint)local_3a0;
    uVar21 = (ulong)(int)uVar15;
    piVar1 = (int *)(*local_148 * lVar30 + local_180 + 4 + uVar21 * 4);
    *piVar1 = *piVar1 + 1;
    lVar41 = *(long *)local_1f8._80_8_;
    lVar42 = lVar41 * lVar30 + local_1f8._24_8_;
    local_328 = local_2d0._24_8_;
    local_2f0 = local_258;
    if (*(char *)(uVar21 + 1 + lVar42) != '\0') {
      piVar1 = (int *)(local_180 + *local_148 * lVar30 + uVar21 * 4);
      *piVar1 = *piVar1 + 1;
      plVar32 = (long *)local_2d0._24_8_;
      if (*(char *)(lVar42 + uVar21) == '\0') {
        piVar1 = (int *)(*local_148 * lVar53 + local_180 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
        cVar3 = *(char *)(uVar21 + *(long *)local_1f8._80_8_ * lVar53 + local_1f8._24_8_);
        local_310 = *local_220;
        piVar1 = (int *)(local_310 * lVar53 + local_258 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
        lVar58 = *(long *)local_2d0._80_8_;
        uVar13 = *(uint *)(lVar58 * lVar53 + local_2d0._24_8_ + uVar21 * 4);
        if (cVar3 == '\0') {
          piVar1 = (int *)(local_258 + local_310 * lVar44 + -8 + uVar21 * 4);
          *piVar1 = *piVar1 + 1;
          uVar13 = TTA::MemMerge(uVar13,*(uint *)(local_2d0._24_8_ + lVar58 * lVar44 + -8 +
                                                 uVar21 * 4));
          local_310 = *local_220;
          goto LAB_00185f36;
        }
        piVar1 = (int *)(local_310 * lVar44 + local_258 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
      }
      else {
        local_310 = *local_220;
        piVar1 = (int *)(local_310 * lVar53 + local_258 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
        lVar58 = *(long *)local_2d0._80_8_;
        uVar13 = *(uint *)(lVar58 * lVar53 + local_2d0._24_8_ + uVar21 * 4);
        piVar1 = (int *)(local_310 * lVar44 + local_258 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
      }
      goto LAB_00185688;
    }
    piVar1 = (int *)(local_180 + *local_148 * lVar44 + 4 + uVar21 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(uVar21 + 1 + local_1f8._24_8_ + lVar41 * lVar44) == '\0') {
      lVar41 = *local_220 * lVar44 + local_258;
      lVar42 = (long)(int)uVar15;
      piVar1 = (int *)(lVar41 + -8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar38 = *(long *)local_2d0._80_8_ * lVar44 + local_2d0._24_8_;
      uVar16 = *(undefined4 *)(lVar38 + -8 + lVar42 * 4);
      piVar1 = (int *)(lVar41 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar38 + lVar42 * 4) = uVar16;
      goto LAB_001850e3;
    }
    uVar40 = (ulong)(int)uVar15;
    local_3b8 = *local_148;
    piVar1 = (int *)(local_3b8 * lVar30 + local_180 + 8 + uVar40 * 4);
    *piVar1 = *piVar1 + 1;
    local_368 = (long *)local_1f8._80_8_;
    lVar41 = *(long *)local_1f8._80_8_;
    local_380 = (long *)local_2d0._80_8_;
    local_370 = local_2d0._24_8_;
    local_3b0 = local_220;
    if (*(char *)(uVar40 + 2 + lVar41 * lVar30 + local_1f8._24_8_) != '\0') {
      piVar1 = (int *)(*local_148 * lVar53 + local_180 + 4 + uVar21 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(uVar21 + 1 + local_1f8._24_8_ + lVar41 * lVar53) == '\0') {
        lVar41 = *local_220;
        piVar1 = (int *)(lVar41 * lVar53 + local_258 + 8 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = *(long *)local_2d0._80_8_;
        uVar13 = *(uint *)(lVar42 * lVar53 + local_2d0._24_8_ + 8 + uVar40 * 4);
        piVar1 = (int *)(lVar41 * lVar44 + local_258 + -8 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        uVar13 = TTA::MemMerge(uVar13,*(uint *)(lVar42 * lVar44 + local_2d0._24_8_ + -8 + uVar40 * 4
                                               ));
        local_310 = *local_220;
LAB_00186058:
        piVar1 = (int *)(local_310 * lVar44 + local_258 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        lVar58 = *(long *)local_2d0._80_8_;
        local_338 = local_258;
        local_348 = local_258;
        local_360 = local_258;
        local_320 = local_258;
        uVar21 = uVar40;
        local_328 = local_2d0._24_8_;
        local_3b0 = local_220;
        local_398 = local_2d0._24_8_;
        local_380 = (long *)local_2d0._80_8_;
        local_378 = local_2d0._24_8_;
        local_370 = local_2d0._24_8_;
      }
      else {
        piVar1 = (int *)(*local_148 * lVar30 + local_180 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        lVar41 = *(long *)local_1f8._80_8_;
        if (*(char *)(uVar40 + lVar41 * lVar30 + local_1f8._24_8_) == '\0') {
          piVar1 = (int *)(*local_148 * lVar53 + local_180 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          cVar3 = *(char *)(uVar40 + local_1f8._24_8_ + lVar41 * lVar53);
          local_310 = *local_220;
          piVar1 = (int *)(local_310 * lVar53 + local_258 + 8 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar58 = *(long *)local_2d0._80_8_;
          uVar13 = *(uint *)(lVar58 * lVar53 + local_2d0._24_8_ + 8 + uVar40 * 4);
          if (cVar3 == '\0') {
            piVar1 = (int *)(local_258 + local_310 * lVar44 + -8 + uVar40 * 4);
            *piVar1 = *piVar1 + 1;
            uVar13 = TTA::MemMerge(uVar13,*(uint *)(local_2d0._24_8_ + lVar58 * lVar44 + -8 +
                                                   uVar40 * 4));
            local_310 = *local_220;
            goto LAB_00186058;
          }
        }
        else {
          local_310 = *local_220;
          piVar1 = (int *)(local_310 * lVar53 + local_258 + 8 + uVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar58 = *(long *)local_2d0._80_8_;
          uVar13 = *(uint *)(lVar58 * lVar53 + local_2d0._24_8_ + 8 + uVar40 * 4);
        }
        piVar1 = (int *)(local_310 * lVar44 + local_258 + uVar40 * 4);
        *piVar1 = *piVar1 + 1;
        local_338 = local_258;
        local_348 = local_258;
        local_360 = local_258;
        local_320 = local_258;
        uVar21 = uVar40;
        local_398 = local_2d0._24_8_;
        local_378 = local_2d0._24_8_;
      }
      goto LAB_001847b3;
    }
    lVar42 = *local_220 * lVar44 + local_258;
    lVar38 = (long)(int)uVar15;
    piVar1 = (int *)(lVar42 + -8 + lVar38 * 4);
    *piVar1 = *piVar1 + 1;
    lVar58 = *(long *)local_2d0._80_8_ * lVar44 + local_2d0._24_8_;
    uVar16 = *(undefined4 *)(lVar58 + -8 + lVar38 * 4);
    piVar1 = (int *)(lVar42 + lVar38 * 4);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar58 + lVar38 * 4) = uVar16;
    lVar42 = local_180;
    local_358 = local_1f8._24_8_;
    uVar21 = local_3a0;
  } while( true );
LAB_00184289:
  lVar38 = lVar58 * lVar44 + local_370;
  *(uint *)(lVar38 + uVar21 * 4) = uVar13;
  lVar26 = (long)(int)(uint)local_3a0;
  uVar21 = lVar26 + 2;
  uVar15 = (uint)uVar21;
  local_358 = local_1f8._24_8_;
  if (iVar43 <= (int)uVar15) {
    if (iVar43 < (int)uVar15) goto LAB_001865c2;
    lVar39 = *local_148;
    piVar1 = (int *)(lVar39 * lVar44 + local_180 + 8 + lVar26 * 4);
    *piVar1 = *piVar1 + 1;
    lVar41 = *(long *)local_1f8._80_8_;
    lVar42 = lVar41 * lVar44;
    local_348 = local_2f0;
    local_398 = local_370;
    if (*(char *)(lVar26 + 2 + local_1f8._24_8_ + lVar42) == '\0') goto LAB_001869e5;
    piVar1 = (int *)(local_180 + lVar39 * lVar30 + 0xc + lVar26 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar26 + 3 + local_1f8._24_8_ + lVar41 * lVar30) == '\0') {
      local_2f0 = local_2f0 + local_310 * lVar44;
      piVar1 = (int *)(local_2f0 + lVar26 * 4);
      *piVar1 = *piVar1 + 1;
      uVar16 = *(undefined4 *)(lVar38 + lVar26 * 4);
      piVar1 = (int *)(local_2f0 + 8 + lVar26 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar38 + 8 + lVar26 * 4) = uVar16;
    }
    else {
      piVar1 = (int *)(local_310 * lVar53 + local_2f0 + 8 + lVar26 * 4);
      *piVar1 = *piVar1 + 1;
      uVar13 = *(uint *)(local_370 + lVar58 * lVar53 + 8 + lVar26 * 4);
      piVar1 = (int *)(local_310 * lVar44 + local_2f0 + lVar26 * 4);
      *piVar1 = *piVar1 + 1;
      uVar13 = TTA::MemMerge(uVar13,*(uint *)(lVar38 + lVar26 * 4));
      piVar1 = (int *)(*local_220 * lVar44 + local_258 + 8 + lVar26 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(lVar44 * *(long *)local_2d0._80_8_ + local_2d0._24_8_ + 8 + lVar26 * 4) = uVar13;
    }
    goto LAB_00186fec;
  }
  local_3b8 = *local_148;
  lVar42 = local_3b8 * lVar44 + local_180;
  piVar1 = (int *)(lVar42 + 8 + lVar26 * 4);
  *piVar1 = *piVar1 + 1;
  local_368 = (long *)local_1f8._80_8_;
  lVar41 = *(long *)local_1f8._80_8_;
  lVar39 = lVar41 * lVar44 + local_1f8._24_8_;
  if (*(char *)(lVar26 + 2 + lVar39) != '\0') goto code_r0x0018430c;
  local_338 = local_2f0;
  local_348 = local_2f0;
  local_320 = local_2f0;
  local_3a0 = uVar21 & 0xffffffff;
  local_390 = local_180;
  local_328 = local_370;
  local_378 = local_370;
LAB_0018455f:
  uVar21 = (ulong)(int)(uint)local_3a0;
  piVar1 = (int *)(local_3b8 * lVar44 + local_390 + 4 + uVar21 * 4);
  *piVar1 = *piVar1 + 1;
  lVar42 = local_390;
  lVar38 = local_358;
  if (*(char *)(uVar21 + 1 + lVar41 * lVar44 + local_358) == '\0') {
    local_310 = *local_3b0;
    uVar21 = (ulong)(int)(uint)local_3a0;
    piVar1 = (int *)(local_310 * lVar44 + local_360 + uVar21 * 4);
    *piVar1 = *piVar1 + 1;
    local_328 = local_398;
    local_2f0 = local_360;
    goto LAB_00183dd5;
  }
  lVar58 = local_3b8 * lVar30 + local_390;
  piVar1 = (int *)(lVar58 + 4 + uVar21 * 4);
  *piVar1 = *piVar1 + 1;
  lVar26 = lVar41 * lVar30 + local_358;
  if (*(char *)(uVar21 + 1 + lVar26) != '\0') {
    local_310 = *local_3b0;
    piVar1 = (int *)(local_310 * lVar53 + local_320 + uVar21 * 4);
    *piVar1 = *piVar1 + 1;
    lVar58 = *local_380;
    local_2f0 = local_320;
    local_300 = (long *)local_328;
    lVar26 = local_358;
LAB_0018460a:
    while( true ) {
      uVar16 = *(undefined4 *)(lVar58 * lVar53 + (long)local_300 + uVar21 * 4);
      piVar1 = (int *)(local_310 * lVar44 + local_320 + uVar21 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar58 * lVar44 + (long)local_300 + uVar21 * 4) = uVar16;
      lVar39 = (long)(int)(uint)local_3a0;
      uVar13 = (uint)local_3a0 + 2;
      local_3a0 = (ulong)uVar13;
      local_358 = lVar38;
      if (iVar43 <= (int)uVar13) break;
      piVar1 = (int *)(local_3b8 * lVar44 + local_390 + 8 + lVar39 * 4);
      *piVar1 = *piVar1 + 1;
      lVar42 = local_390;
      if (*(char *)(lVar39 + 2 + lVar41 * lVar44 + lVar38) != '\0') goto LAB_001858b6;
LAB_001835f6:
      while( true ) {
        uVar21 = (ulong)(int)(uint)local_3a0;
        piVar1 = (int *)(local_3b8 * lVar44 + lVar42 + 4 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(uVar21 + 1 + lVar41 * lVar44 + lVar38) != '\0') break;
        local_3b0 = local_220;
        local_310 = *local_220;
        uVar21 = (ulong)(int)(uint)local_3a0;
        piVar1 = (int *)(local_310 * lVar44 + local_258 + uVar21 * 4);
        *piVar1 = *piVar1 + 1;
        local_398 = local_2d0._24_8_;
        local_2f0 = local_258;
        local_380 = (long *)local_2d0._80_8_;
        local_360 = local_258;
        local_328 = local_2d0._24_8_;
LAB_00183dd5:
        lVar58 = *local_380;
        lVar26 = lVar58 * lVar44 + local_328;
        *(undefined4 *)(lVar26 + uVar21 * 4) = 0;
        lVar39 = (long)(int)(uint)local_3a0;
        uVar21 = lVar39 + 2;
        local_3a0._0_4_ = (uint)uVar21;
        if (iVar43 <= (int)(uint)local_3a0) {
          piVar1 = (int *)(local_3b8 * lVar44 + lVar42 + 8 + lVar39 * 4);
          *piVar1 = *piVar1 + 1;
          cVar3 = *(char *)(lVar39 + 2 + lVar41 * lVar44 + lVar38);
          if (iVar43 < (int)(uint)local_3a0) {
            if (cVar3 == '\0') {
              piVar1 = (int *)(local_2f0 + local_310 * lVar44 + 8 + lVar39 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar26 + 8 + lVar39 * 4) = 0;
              goto LAB_00186fec;
            }
LAB_001876ba:
            lVar42 = lVar42 + local_3b8 * lVar30;
            piVar1 = (int *)(lVar42 + 8 + lVar39 * 4);
            *piVar1 = *piVar1 + 1;
            lVar38 = lVar38 + lVar41 * lVar30;
            if (*(char *)(lVar39 + 2 + lVar38) != '\0') {
LAB_001876d1:
              piVar1 = (int *)(local_310 * lVar53 + local_2f0 + 8 + lVar39 * 4);
              *piVar1 = *piVar1 + 1;
              goto LAB_001876fc;
            }
            piVar1 = (int *)(lVar42 + 4 + lVar39 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar38 + 1 + lVar39) == '\0') {
              uVar13 = TTA::MemNewLabel();
              piVar1 = (int *)(*local_220 * lVar44 + local_258 + 8 + lVar39 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(lVar44 * *(long *)local_2d0._80_8_ + local_2d0._24_8_ + 8 + lVar39 * 4) =
                   uVar13;
              goto LAB_00186fec;
            }
            piVar1 = (int *)(local_310 * lVar53 + local_2f0 + lVar39 * 4);
            *piVar1 = *piVar1 + 1;
            uVar16 = *(undefined4 *)(local_328 + lVar58 * lVar53 + lVar39 * 4);
          }
          else {
            if (cVar3 == '\0') goto LAB_00186ac6;
            lVar28 = lVar42 + local_3b8 * lVar30;
            piVar1 = (int *)(lVar28 + 0xc + lVar39 * 4);
            *piVar1 = *piVar1 + 1;
            lVar33 = lVar38 + lVar41 * lVar30;
            if (*(char *)(lVar39 + 3 + lVar33) == '\0') goto LAB_001876ba;
            piVar1 = (int *)(lVar28 + 8 + lVar39 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar33 + 2 + lVar39) != '\0') goto LAB_001876d1;
            piVar1 = (int *)(lVar28 + 4 + lVar39 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar33 + 1 + lVar39) != '\0') goto LAB_00187858;
            piVar1 = (int *)(local_310 * lVar53 + local_2f0 + 8 + lVar39 * 4);
            *piVar1 = *piVar1 + 1;
LAB_001876fc:
            uVar16 = *(undefined4 *)(local_328 + lVar58 * lVar53 + 8 + lVar39 * 4);
          }
          piVar1 = (int *)(lVar44 * local_310 + local_2f0 + 8 + lVar39 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar26 + 8 + lVar39 * 4) = uVar16;
          goto LAB_00186fec;
        }
        lVar26 = local_3b8 * lVar44 + lVar42;
        piVar1 = (int *)(lVar26 + 8 + lVar39 * 4);
        *piVar1 = *piVar1 + 1;
        lVar28 = lVar41 * lVar44 + lVar38;
        if (*(char *)(lVar39 + 2 + lVar28) != '\0') {
          lVar42 = lVar42 + local_3b8 * lVar30;
          piVar1 = (int *)(lVar42 + 0xc + lVar39 * 4);
          *piVar1 = *piVar1 + 1;
          lVar38 = lVar38 + lVar41 * lVar30;
          if (*(char *)(lVar39 + 3 + lVar38) != '\0') {
            piVar1 = (int *)(lVar42 + 8 + lVar39 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar38 + 2 + lVar39) != '\0') {
              piVar1 = (int *)(local_310 * lVar53 + local_2f0 + 8 + lVar39 * 4);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)(lVar58 * lVar53 + local_328 + 8 + lVar39 * 4);
              piVar1 = (int *)(local_310 * lVar44 + local_2f0 + 8 + lVar39 * 4);
              *piVar1 = *piVar1 + 1;
              goto LAB_001843c9;
            }
            piVar1 = (int *)(lVar42 + 4 + lVar39 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar38 + 1 + lVar39) == '\0') {
              piVar1 = (int *)(local_310 * lVar53 + local_2f0 + 8 + lVar39 * 4);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)(lVar58 * lVar53 + local_328 + 8 + lVar39 * 4);
              piVar1 = (int *)(local_310 * lVar44 + local_2f0 + 8 + lVar39 * 4);
              *piVar1 = *piVar1 + 1;
              goto LAB_001843c9;
            }
            local_3a0 = uVar21 & 0xffffffff;
            goto LAB_00185bf4;
          }
          piVar1 = (int *)(lVar26 + 0xc + lVar39 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar28 + 3 + lVar39) != '\0') {
            piVar1 = (int *)(lVar42 + 0x10 + lVar39 * 4);
            *piVar1 = *piVar1 + 1;
            cVar3 = *(char *)(lVar38 + 4 + lVar39);
            piVar1 = (int *)(lVar42 + 8 + lVar39 * 4);
            *piVar1 = *piVar1 + 1;
            cVar4 = *(char *)(lVar38 + 2 + lVar39);
            local_378 = local_328;
            local_348 = local_2f0;
            local_370 = local_328;
            if (cVar3 != '\0') {
              if (cVar4 != '\0') {
                local_3a0 = uVar21 & 0xffffffff;
                local_358 = local_358;
                goto LAB_00183745;
              }
              piVar1 = (int *)(lVar42 + 4 + lVar39 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar38 + 1 + lVar39) != '\0') goto LAB_00186090;
              piVar1 = (int *)(local_310 * lVar53 + local_2f0 + 0x10 + lVar39 * 4);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)(lVar58 * lVar53 + local_328 + 0x10 + lVar39 * 4);
              piVar1 = (int *)(local_310 * lVar44 + local_2f0 + 8 + lVar39 * 4);
              *piVar1 = *piVar1 + 1;
              goto LAB_001844e9;
            }
            if (cVar4 != '\0') {
              piVar1 = (int *)(local_310 * lVar53 + local_2f0 + 8 + lVar39 * 4);
              *piVar1 = *piVar1 + 1;
              local_300 = (long *)local_328;
              local_338 = local_2f0;
              goto LAB_00183867;
            }
            piVar1 = (int *)(lVar42 + 4 + lVar39 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar38 + 1 + lVar39) == '\0') {
              uVar13 = TTA::MemNewLabel();
              local_3b0 = local_220;
              local_310 = *local_220;
              piVar1 = (int *)(local_310 * lVar44 + local_258 + 8 + lVar39 * 4);
              *piVar1 = *piVar1 + 1;
              local_380 = (long *)local_2d0._80_8_;
              lVar58 = *(long *)local_2d0._80_8_;
              local_398 = local_2d0._24_8_;
              local_2f0 = local_258;
              local_360 = local_258;
              local_370 = local_2d0._24_8_;
            }
            else {
              piVar1 = (int *)(local_310 * lVar53 + local_2f0 + lVar39 * 4);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)(lVar58 * lVar53 + local_328 + lVar39 * 4);
              piVar1 = (int *)(local_310 * lVar44 + local_2f0 + 8 + lVar39 * 4);
              *piVar1 = *piVar1 + 1;
            }
            goto LAB_00184289;
          }
          piVar1 = (int *)(*local_148 * lVar30 + local_180 + 8 + lVar39 * 4);
          *piVar1 = *piVar1 + 1;
          local_358 = local_358 + lVar41 * lVar30;
          if (*(char *)(lVar39 + 2 + local_358) != '\0') {
            lVar41 = *local_3b0;
            piVar1 = (int *)(lVar41 * lVar53 + local_360 + 8 + lVar39 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = *local_380;
            uVar16 = *(undefined4 *)(lVar42 * lVar53 + local_398 + 8 + lVar39 * 4);
            piVar1 = (int *)(lVar41 * lVar44 + local_360 + 8 + lVar39 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar42 * lVar44 + local_398 + 8 + lVar39 * 4) = uVar16;
            uVar15 = (uint)local_3a0;
            goto LAB_001850e3;
          }
          piVar1 = (int *)(*local_148 * lVar30 + local_180 + 4 + lVar39 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_358 + 1 + lVar39) == '\0') {
            uVar13 = TTA::MemNewLabel();
            piVar1 = (int *)(*local_220 * lVar44 + local_258 + 8 + lVar39 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_2d0._80_8_ * lVar44 + local_2d0._24_8_ + 8 + lVar39 * 4) =
                 uVar13;
          }
          else {
            lVar41 = *local_3b0;
            piVar1 = (int *)(lVar41 * lVar53 + local_360 + lVar39 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = *local_380;
            uVar16 = *(undefined4 *)(lVar42 * lVar53 + local_398 + lVar39 * 4);
            piVar1 = (int *)(lVar41 * lVar44 + local_360 + 8 + lVar39 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar42 * lVar44 + local_398 + 8 + lVar39 * 4) = uVar16;
          }
          uVar21 = uVar21 & 0xffffffff;
          goto LAB_001861ab;
        }
        local_3a0 = uVar21 & 0xffffffff;
      }
      lVar33 = local_3b8 * lVar30;
      piVar1 = (int *)(lVar42 + lVar33 + 4 + uVar21 * 4);
      *piVar1 = *piVar1 + 1;
      lVar28 = lVar41 * lVar30;
      if (*(char *)(uVar21 + 1 + lVar38 + lVar28) == '\0') goto LAB_00183711;
      local_3b0 = local_220;
      local_310 = *local_220;
      piVar1 = (int *)(local_310 * lVar53 + local_258 + uVar21 * 4);
      *piVar1 = *piVar1 + 1;
      local_380 = (long *)local_2d0._80_8_;
      lVar58 = *(long *)local_2d0._80_8_;
      local_370 = local_2d0._24_8_;
      local_348 = local_258;
      local_328 = local_2d0._24_8_;
      local_2f0 = local_258;
      local_300 = (long *)local_2d0._24_8_;
      lVar26 = lVar38;
      local_320 = local_258;
      lVar38 = local_358;
    }
    if ((int)uVar13 <= iVar43) {
      piVar1 = (int *)(lVar42 + local_3b8 * lVar44 + 8 + lVar39 * 4);
      *piVar1 = *piVar1 + 1;
      local_3a0._0_4_ = uVar13;
      if (*(char *)(lVar39 + 2 + lVar26 + lVar41 * lVar44) == '\0') goto LAB_00186ac6;
      goto LAB_001867dd;
    }
    local_2f0 = local_348;
    goto LAB_001865c5;
  }
  uVar21 = (ulong)(int)(uint)local_3a0;
  piVar1 = (int *)(lVar58 + 8 + uVar21 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar26 + 2 + uVar21) != '\0') {
    local_310 = *local_3b0;
    piVar1 = (int *)(local_310 * lVar53 + local_320 + 8 + uVar21 * 4);
    *piVar1 = *piVar1 + 1;
    lVar58 = *local_380;
    uVar13 = *(uint *)(lVar58 * lVar53 + local_328 + 8 + uVar21 * 4);
    piVar1 = (int *)(local_310 * lVar44 + local_320 + uVar21 * 4);
    *piVar1 = *piVar1 + 1;
    local_338 = local_338;
    local_320 = local_320;
    goto LAB_001847b3;
  }
  uVar13 = TTA::MemNewLabel();
  local_2f0 = local_258;
  local_3b0 = local_220;
  local_310 = *local_220;
  uVar21 = (ulong)(int)(uint)local_3a0;
  piVar1 = (int *)(local_310 * lVar44 + local_258 + uVar21 * 4);
  *piVar1 = *piVar1 + 1;
  local_398 = local_2d0._24_8_;
  local_380 = (long *)local_2d0._80_8_;
  lVar58 = *(long *)local_2d0._80_8_;
  local_360 = local_258;
  local_370 = local_2d0._24_8_;
  goto LAB_00184289;
code_r0x0018430c:
  lVar28 = local_3b8 * lVar30 + local_180;
  piVar1 = (int *)(lVar28 + 0xc + lVar26 * 4);
  *piVar1 = *piVar1 + 1;
  lVar33 = lVar41 * lVar30 + local_1f8._24_8_;
  if (*(char *)(lVar26 + 3 + lVar33) != '\0') {
    piVar1 = (int *)(local_310 * lVar53 + local_2f0 + 8 + lVar26 * 4);
    *piVar1 = *piVar1 + 1;
    uVar13 = *(uint *)(local_370 + lVar58 * lVar53 + 8 + lVar26 * 4);
    piVar1 = (int *)(local_310 * lVar44 + local_2f0 + lVar26 * 4);
    *piVar1 = *piVar1 + 1;
    uVar13 = TTA::MemMerge(uVar13,*(uint *)(lVar38 + lVar26 * 4));
    local_310 = *local_220;
    piVar1 = (int *)(local_310 * lVar44 + local_258 + 8 + lVar26 * 4);
    *piVar1 = *piVar1 + 1;
    lVar58 = *(long *)local_2d0._80_8_;
    local_2f0 = local_258;
    local_328 = local_2d0._24_8_;
LAB_001843c9:
    local_3a0 = uVar21 & 0xffffffff;
    plVar32 = (long *)local_328;
    goto LAB_00185688;
  }
  piVar1 = (int *)(lVar42 + 0xc + lVar26 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar39 + 3 + lVar26) == '\0') {
    local_2f0 = local_2f0 + local_310 * lVar44;
    piVar1 = (int *)(local_2f0 + lVar26 * 4);
    *piVar1 = *piVar1 + 1;
    uVar16 = *(undefined4 *)(lVar38 + lVar26 * 4);
    piVar1 = (int *)(local_2f0 + 8 + lVar26 * 4);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar38 + 8 + lVar26 * 4) = uVar16;
    goto LAB_001850e3;
  }
  piVar1 = (int *)(lVar28 + 0x10 + lVar26 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar33 + 4 + lVar26) == '\0') {
    lVar42 = local_310 * lVar44 + local_2f0;
    piVar1 = (int *)(lVar42 + lVar26 * 4);
    *piVar1 = *piVar1 + 1;
    uVar16 = *(undefined4 *)(lVar38 + lVar26 * 4);
    piVar1 = (int *)(lVar42 + 8 + lVar26 * 4);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar38 + 8 + lVar26 * 4) = uVar16;
    lVar42 = local_180;
    goto LAB_00184d33;
  }
  piVar1 = (int *)(local_310 * lVar53 + local_2f0 + 0x10 + lVar26 * 4);
  *piVar1 = *piVar1 + 1;
  uVar13 = *(uint *)(local_370 + lVar58 * lVar53 + 0x10 + lVar26 * 4);
  piVar1 = (int *)(local_310 * lVar44 + local_2f0 + lVar26 * 4);
  *piVar1 = *piVar1 + 1;
  uVar13 = TTA::MemMerge(uVar13,*(uint *)(lVar38 + lVar26 * 4));
  local_310 = *local_220;
  piVar1 = (int *)(local_310 * lVar44 + local_258 + 8 + lVar26 * 4);
  *piVar1 = *piVar1 + 1;
  lVar58 = *(long *)local_2d0._80_8_;
  local_360 = local_258;
  local_348 = local_258;
  local_3b0 = local_220;
  local_398 = local_2d0._24_8_;
  local_380 = (long *)local_2d0._80_8_;
  local_370 = local_2d0._24_8_;
LAB_001844e9:
  local_3a0 = uVar21 & 0xffffffff;
  local_338 = local_348;
  local_320 = local_348;
  local_328 = local_370;
  local_378 = local_370;
  goto LAB_001847b3;
LAB_00183a86:
  lVar41 = *local_220 * lVar53 + local_258;
  uVar40 = (ulong)(int)local_3a0;
  piVar1 = (int *)(lVar41 + uVar40 * 4);
  *piVar1 = *piVar1 + 1;
  local_378 = *(long *)local_2d0._80_8_ * lVar53 + local_2d0._24_8_;
  uVar13 = *(uint *)(local_378 + uVar40 * 4);
  piVar1 = (int *)(lVar41 + 8 + uVar40 * 4);
  *piVar1 = *piVar1 + 1;
LAB_00183ac6:
  uVar15 = *(uint *)(local_378 + 8 + uVar40 * 4);
LAB_00183acf:
  uVar13 = TTA::MemMerge(uVar13,uVar15);
  local_310 = *local_220;
  goto LAB_00183b01;
code_r0x001857e3:
  local_310 = *local_220;
  piVar1 = (int *)(local_310 * lVar53 + lVar34 + lVar22 * 4);
  *piVar1 = *piVar1 + 1;
  lVar58 = *(long *)local_2d0._80_8_;
  uVar16 = *(undefined4 *)(lVar58 * lVar53 + lVar33 + lVar22 * 4);
  piVar1 = (int *)(local_310 * lVar44 + lVar34 + lVar22 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar58 * lVar44 + lVar33 + lVar22 * 4) = uVar16;
  lVar50 = lVar50 + 0x200000000;
  lVar20 = lVar42 + lVar22;
  lVar22 = lVar22 + 2;
  if ((long)uVar46 <= lVar20 + 2) {
    local_3a0._0_4_ = iVar14 + (int)lVar22 + 2;
    iVar14 = iVar14 + (int)lVar22;
    goto LAB_0018643c;
  }
  goto LAB_001857a4;
LAB_001784c9:
  piVar1 = (int *)(local_258 + lVar44 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(local_2d0._24_8_ + lVar44 * 4) = 0;
LAB_00178523:
  iVar14 = iVar31 + 2;
  if (iVar43 <= iVar14) goto code_r0x0017852f;
  goto LAB_00178390;
code_r0x0017852f:
  lVar44 = (long)(iVar31 + 3);
LAB_00178989:
  lVar53 = (long)iVar14;
  piVar1 = (int *)(local_180 + lVar53 * 4);
  *piVar1 = *piVar1 + 1;
  if (iVar43 < iVar14) {
    if (*(char *)(local_1f8._24_8_ + lVar53) == '\0') {
      piVar1 = (int *)(local_258 + lVar53 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2d0._24_8_ + lVar53 * 4) = 0;
    }
    else {
      uVar13 = TTA::MemNewLabel();
      piVar1 = (int *)(local_258 + lVar53 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_2d0._24_8_ + lVar53 * 4) = uVar13;
    }
  }
  else if (*(char *)(local_1f8._24_8_ + lVar53) == '\0') {
LAB_00178bb8:
    lVar38 = (long)iVar14;
    piVar1 = (int *)(local_180 + 4 + lVar38 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(local_1f8._24_8_ + 1 + lVar38) == '\0') {
      piVar1 = (int *)(local_258 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2d0._24_8_ + lVar38 * 4) = 0;
    }
    else {
      uVar13 = TTA::MemNewLabel();
      piVar1 = (int *)(local_258 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      local_398 = local_2d0._24_8_;
LAB_00178bde:
      *(uint *)(local_398 + lVar38 * 4) = uVar13;
    }
  }
  else {
    piVar1 = (int *)(local_180 + lVar44 * 4);
    *piVar1 = *piVar1 + 1;
    uVar13 = TTA::MemNewLabel();
    piVar1 = (int *)(local_258 + lVar53 * 4);
    *piVar1 = *piVar1 + 1;
    *(uint *)(local_2d0._24_8_ + lVar53 * 4) = uVar13;
  }
LAB_00186fec:
  uVar13 = TTA::MemFlatten();
  (local_120->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar13;
  if (0 < iVar5) {
    local_368 = (long *)0x1;
    uVar46 = 0;
    do {
      piVar11 = TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar10 = TTA::mem_rtable_.vec_.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < iVar6) {
        uVar21 = uVar46 | 1;
        lVar53 = *local_220 * (long)local_368 + local_258;
        lVar30 = *(long *)local_2d0._80_8_ * (long)local_368 + local_2d0._24_8_;
        lVar42 = *(long *)local_2d0._80_8_ * uVar46 + local_2d0._24_8_;
        lVar41 = *local_220 * uVar46 + local_258;
        lVar44 = 1;
        do {
          iVar5 = *(int *)(lVar41 + -4 + lVar44 * 4);
          *(int *)(lVar41 + -4 + lVar44 * 4) = iVar5 + 1;
          lVar38 = (long)*(int *)(lVar42 + -4 + lVar44 * 4);
          if (lVar38 < 1) {
            *(int *)(lVar41 + -4 + lVar44 * 4) = iVar5 + 2;
            *(undefined4 *)(lVar42 + -4 + lVar44 * 4) = 0;
            if (lVar44 < lVar52) {
              piVar1 = (int *)(lVar41 + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar42 + lVar44 * 4) = 0;
              if (uVar21 < uVar23) {
                piVar1 = (int *)(lVar53 + -4 + lVar44 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar30 + -4 + lVar44 * 4) = 0;
                piVar1 = (int *)(lVar53 + lVar44 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar30 + lVar44 * 4) = 0;
              }
            }
            else if (uVar21 < uVar23) {
              piVar1 = (int *)(lVar53 + -4 + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar30 + -4 + lVar44 * 4) = 0;
            }
          }
          else {
            piVar11[lVar38] = piVar11[lVar38] + 1;
            uVar13 = puVar10[lVar38];
            lVar38 = *local_148;
            lVar39 = uVar46 * lVar38 + local_180;
            piVar1 = (int *)(lVar39 + -4 + lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            lVar58 = *(long *)local_1f8._80_8_;
            lVar26 = uVar46 * lVar58 + local_1f8._24_8_;
            uVar15 = uVar13;
            if (*(char *)(lVar44 + -1 + lVar26) == '\0') {
              uVar15 = 0;
            }
            piVar1 = (int *)(lVar41 + -4 + lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(lVar42 + -4 + lVar44 * 4) = uVar15;
            if (lVar44 < lVar52) {
              piVar1 = (int *)(lVar39 + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              uVar15 = uVar13;
              if (*(char *)(lVar44 + lVar26) == '\0') {
                uVar15 = 0;
              }
              piVar1 = (int *)(lVar41 + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(lVar42 + lVar44 * 4) = uVar15;
              if (uVar21 < uVar23) {
                lVar38 = lVar38 * (long)local_368 + local_180;
                piVar1 = (int *)(lVar38 + -4 + lVar44 * 4);
                *piVar1 = *piVar1 + 1;
                lVar58 = lVar58 * (long)local_368 + local_1f8._24_8_;
                uVar15 = uVar13;
                if (*(char *)(lVar44 + -1 + lVar58) == '\0') {
                  uVar15 = 0;
                }
                piVar1 = (int *)(lVar53 + -4 + lVar44 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(lVar30 + -4 + lVar44 * 4) = uVar15;
                piVar1 = (int *)(lVar38 + lVar44 * 4);
                *piVar1 = *piVar1 + 1;
                cVar3 = *(char *)(lVar44 + lVar58);
                piVar1 = (int *)(lVar53 + lVar44 * 4);
                *piVar1 = *piVar1 + 1;
                if (cVar3 == '\0') {
                  *(undefined4 *)(lVar30 + lVar44 * 4) = 0;
                }
                else {
                  *(uint *)(lVar30 + lVar44 * 4) = uVar13;
                }
              }
            }
            else if (uVar21 < uVar23) {
              piVar1 = (int *)(lVar38 * (long)local_368 + local_180 + -4 + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              cVar3 = *(char *)(lVar44 + -1 + lVar58 * (long)local_368 + local_1f8._24_8_);
              piVar1 = (int *)(lVar53 + -4 + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              if (cVar3 == '\0') {
                *(undefined4 *)(lVar30 + -4 + lVar44 * 4) = 0;
              }
              else {
                *(uint *)(lVar30 + -4 + lVar44 * 4) = uVar13;
              }
            }
          }
          lVar38 = lVar44 + 1;
          lVar44 = lVar44 + 2;
        } while (lVar38 < lVar52);
      }
      uVar46 = uVar46 + 2;
      local_368 = (long *)((long)local_368 + 2);
    } while (uVar46 < uVar23);
  }
  pauVar19 = (undefined1 (*) [16])operator_new(0x20);
  pvVar12 = local_118;
  pauVar19[1] = (undefined1  [16])0x0;
  *pauVar19 = (undefined1  [16])0x0;
  puVar8 = (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar9 = (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar19;
  (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar19 + 2);
  (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(pauVar19 + 2);
  if (puVar8 != (pointer)0x0) {
    operator_delete(puVar8,(long)puVar9 - (long)puVar8);
  }
  local_f8 = 0;
  local_108 = 0x81010004;
  local_100 = local_190;
  cv::sum((_InputArray *)&local_f0);
  *(pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_f0._0_8_ - 9.223372036854776e+18) & (long)(double)local_f0._0_8_ >> 0x3f
       | (long)(double)local_f0._0_8_;
  local_f8 = 0;
  local_108 = 0x81010004;
  local_100 = local_268;
  cv::sum((_InputArray *)&local_f0);
  (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)(double)local_f0._0_8_ >> 0x3f & (long)((double)local_f0._0_8_ - 9.223372036854776e+18)
       | (long)(double)local_f0._0_8_;
  dVar59 = TTA::MemTotalAccesses();
  (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] =
       (long)dVar59 >> 0x3f & (long)(dVar59 - 9.223372036854776e+18) | (long)dVar59;
  MemMat<int>::GetImage(&local_f0,(MemMat<int> *)local_2d0);
  cv::Mat::operator=(&((local_120->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                      super_Mat,&local_f0.super_Mat);
  cv::Mat::~Mat(&local_f0.super_Mat);
  cv::Mat::~Mat(local_268);
  cv::Mat::~Mat((Mat *)(local_2d0 + 8));
  cv::Mat::~Mat(local_190);
  cv::Mat::~Mat((Mat *)(local_1f8 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
	{
		const int h = img_.rows;
		const int w = img_.cols;

		LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
		LabelsSolver::MemSetup();

		//Data structure for memory test
		MemMat<unsigned char> img(img_);
		MemMat<int> img_labels(img_.size(), 0);

		// We work with 2x2 blocks
		// +-+-+-+
		// |P|Q|R|
		// +-+-+-+
		// |S|X|
		// +-+-+

		// The pixels are named as follows
		// +---+---+---+
		// |a b|c d|e f|
		// |g h|i j|k l|
		// +---+---+---+
		// |m n|o p|
		// |q r|s t|
		// +---+---+

		// Pixels a, f, l, q are not needed, since we need to understand the
		// the connectivity between these blocks and those pixels only metter
		// when considering the outer connectivities

		// A bunch of defines used to check if the pixels are foreground,
		// without going outside the image limits.

#define CONDITION_B img(r-2, c-1)>0
#define CONDITION_C img(r-2, c)>0
#define CONDITION_D img(r-2, c+1)>0
#define CONDITION_E img(r-2, c+2)>0

#define CONDITION_G img(r-1, c-2)>0
#define CONDITION_H img(r-1, c-1)>0
#define CONDITION_I img(r-1, c)>0
#define CONDITION_J img(r-1, c+1)>0
#define CONDITION_K img(r-1, c+2)>0

#define CONDITION_M img(r, c-2)>0
#define CONDITION_N img(r, c-1)>0
#define CONDITION_O img(r,c)>0
#define CONDITION_P img(r,c+1)>0

#define CONDITION_R img(r+1, c-1)>0
#define CONDITION_S img(r+1, c)>0
#define CONDITION_T img(r+1, c+1)>0

				// Action 1: No action
#define ACTION_1 img_labels(r, c) = 0; 
				// Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); 
				//Action 3: Assign label of block P
#define ACTION_3 img_labels(r, c) = img_labels(r - 2, c - 2);
				// Action 4: Assign label of block Q 
#define ACTION_4 img_labels(r, c) = img_labels(r - 2, c);
				// Action 5: Assign label of block R
#define ACTION_5 img_labels(r, c) = img_labels(r - 2, c + 2);
				// Action 6: Assign label of block S
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 2); 
				// Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c));
				//Action 8: Merge labels of block P and R
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2));
				// Action 9 Merge labels of block P and S
#define ACTION_9 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r, c - 2));
				// Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2));
				// Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r, c - 2));
				// Action 12: Merge labels of block R and S
#define ACTION_12 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c + 2), img_labels(r, c - 2));
				// Action 13: not used
#define ACTION_13 
				// Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)), img_labels(r, c - 2));
				//Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)), img_labels(r, c - 2));
				//Action 16: labels of block Q, R and S
#define ACTION_16 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)), img_labels(r, c - 2));


		if (h == 1) {
			// Single line
			int r = 0;
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				int r = 0;
				int c = -2;
#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < h - (h % 2); r += 2) {
				int c = -2;
				goto tree_0;
#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case that the rows are odd)
			if ((h % 2) == 1)
			{
				int r = h - 1;
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}

		n_labels_ = LabelsSolver::MemFlatten();

		// Second scan
		for (int r = 0; r < h; r += 2) {
			for (int c = 0; c < w; c += 2) {
				int iLabel = img_labels(r, c);
				if (iLabel > 0) {
					iLabel = LabelsSolver::MemGetLabel(iLabel);
					if (img(r, c) > 0)
						img_labels(r, c) = iLabel;
					else
						img_labels(r, c) = 0;
					if (c + 1 < w) {
						if (img(r, c + 1) > 0)
							img_labels(r, c + 1) = iLabel;
						else
							img_labels(r, c + 1) = 0;
						if (r + 1 < h) {
							if (img(r + 1, c) > 0)
								img_labels(r + 1, c) = iLabel;
							else
								img_labels(r + 1, c) = 0;
							if (img(r + 1, c + 1) > 0)
								img_labels(r + 1, c + 1) = iLabel;
							else
								img_labels(r + 1, c + 1) = 0;
						}
					}
					else if (r + 1 < h) {
						if (img(r + 1, c) > 0)
							img_labels(r + 1, c) = iLabel;
						else
							img_labels(r + 1, c) = 0;
					}
				}
				else {
					img_labels(r, c) = 0;
					if (c + 1 < w) {
						img_labels(r, c + 1) = 0;
						if (r + 1 < h) {
							img_labels(r + 1, c) = 0;
							img_labels(r + 1, c + 1) = 0;
						}
					}
					else if (r + 1 < h) {
						img_labels(r + 1, c) = 0;
					}
				}
			}
		}

		// Store total accesses in the output vector 'accesses'
		accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

		accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
		accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
		accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

		img_labels_ = img_labels.GetImage();

		LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
	}